

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O3

void aom_lpf_horizontal_14_quad_sse2(uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  unkuint9 Var108;
  undefined1 auVar109 [11];
  undefined1 auVar110 [15];
  unkuint9 Var111;
  undefined1 auVar112 [11];
  undefined1 auVar113 [15];
  unkuint9 Var114;
  undefined1 auVar115 [11];
  undefined1 auVar116 [15];
  unkuint9 Var117;
  undefined1 auVar118 [11];
  undefined1 auVar119 [15];
  unkuint9 Var120;
  undefined1 auVar121 [11];
  undefined1 auVar122 [15];
  unkuint9 Var123;
  undefined1 auVar124 [11];
  undefined1 auVar125 [15];
  unkuint9 Var126;
  undefined1 auVar127 [11];
  undefined1 auVar128 [15];
  unkuint9 Var129;
  undefined1 auVar130 [11];
  undefined1 auVar131 [15];
  undefined1 auVar132 [11];
  undefined1 auVar133 [15];
  undefined1 auVar134 [11];
  undefined1 auVar135 [15];
  undefined1 auVar136 [11];
  undefined1 auVar137 [15];
  undefined1 auVar138 [11];
  undefined1 auVar139 [15];
  undefined1 auVar140 [11];
  undefined1 auVar141 [15];
  undefined1 auVar142 [11];
  undefined1 auVar143 [15];
  undefined1 auVar144 [15];
  undefined1 auVar145 [15];
  undefined1 auVar146 [15];
  undefined1 auVar147 [15];
  undefined1 auVar148 [15];
  undefined1 auVar149 [15];
  undefined1 auVar150 [15];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  undefined1 auVar153 [15];
  undefined1 auVar154 [15];
  undefined1 auVar155 [15];
  undefined1 auVar156 [15];
  undefined1 auVar157 [15];
  undefined1 auVar158 [15];
  undefined1 auVar159 [15];
  undefined1 auVar160 [15];
  undefined1 auVar161 [15];
  undefined1 auVar162 [15];
  undefined1 auVar163 [15];
  undefined1 auVar164 [15];
  undefined1 auVar165 [15];
  undefined1 auVar166 [15];
  undefined1 auVar167 [15];
  undefined1 auVar168 [15];
  undefined1 auVar169 [15];
  undefined1 auVar170 [15];
  long lVar171;
  long lVar172;
  long lVar173;
  byte bVar174;
  byte bVar180;
  short sVar175;
  ushort uVar176;
  ushort uVar177;
  byte bVar181;
  byte bVar185;
  short sVar182;
  ushort uVar184;
  byte bVar186;
  byte bVar190;
  short sVar187;
  ushort uVar189;
  byte bVar191;
  byte bVar194;
  short sVar192;
  byte bVar195;
  byte bVar199;
  short sVar196;
  ushort uVar198;
  byte bVar200;
  byte bVar203;
  short sVar201;
  byte bVar204;
  byte bVar207;
  short sVar205;
  byte bVar208;
  undefined1 auVar178 [16];
  short sVar183;
  short sVar188;
  short sVar193;
  short sVar197;
  short sVar202;
  short sVar206;
  byte bVar213;
  short sVar209;
  ushort uVar210;
  undefined1 auVar179 [16];
  ushort uVar211;
  ushort uVar212;
  ushort uVar214;
  ushort uVar215;
  ushort uVar216;
  short sVar220;
  ushort uVar222;
  ushort uVar223;
  ushort uVar224;
  ushort uVar225;
  ushort uVar226;
  ushort uVar227;
  ushort uVar228;
  ushort uVar229;
  ushort uVar230;
  ushort uVar231;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  ushort uVar221;
  ushort uVar232;
  ushort uVar233;
  ushort uVar234;
  undefined1 auVar219 [16];
  ushort uVar235;
  byte bVar236;
  byte bVar238;
  byte bVar239;
  byte bVar242;
  short sVar240;
  ushort uVar241;
  byte bVar243;
  byte bVar246;
  short sVar244;
  ushort uVar245;
  byte bVar247;
  byte bVar249;
  short sVar248;
  byte bVar250;
  byte bVar252;
  short sVar251;
  byte bVar253;
  byte bVar255;
  short sVar254;
  byte bVar256;
  byte bVar258;
  short sVar257;
  byte bVar259;
  undefined1 auVar237 [16];
  byte bVar261;
  short sVar260;
  ushort uVar262;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  ushort uVar266;
  ushort uVar267;
  byte bVar268;
  ushort uVar269;
  ushort uVar270;
  ushort uVar271;
  byte bVar275;
  byte bVar276;
  short sVar277;
  ushort uVar278;
  ushort uVar279;
  byte bVar280;
  byte bVar281;
  short sVar282;
  short sVar283;
  ushort uVar284;
  ushort uVar285;
  byte bVar286;
  byte bVar287;
  short sVar288;
  short sVar289;
  ushort uVar290;
  ushort uVar291;
  byte bVar292;
  byte bVar293;
  short sVar294;
  short sVar295;
  ushort uVar296;
  ushort uVar297;
  byte bVar298;
  byte bVar299;
  short sVar300;
  short sVar301;
  ushort uVar302;
  ushort uVar303;
  byte bVar304;
  byte bVar305;
  short sVar306;
  short sVar307;
  ushort uVar308;
  ushort uVar309;
  byte bVar310;
  byte bVar311;
  byte bVar315;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  short sVar312;
  ushort uVar313;
  ushort uVar314;
  ushort uVar316;
  short sVar317;
  short sVar318;
  short sVar319;
  short sVar320;
  short sVar321;
  short sVar322;
  ushort uVar323;
  undefined1 auVar324 [16];
  ushort uVar325;
  ushort uVar326;
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  ushort uVar329;
  ushort uVar330;
  short sVar331;
  ushort uVar332;
  ushort uVar333;
  ushort uVar334;
  short sVar336;
  ushort uVar337;
  short sVar338;
  ushort uVar339;
  short sVar340;
  ushort uVar341;
  short sVar342;
  ushort uVar343;
  short sVar344;
  ushort uVar345;
  short sVar346;
  ushort uVar347;
  byte bVar350;
  short sVar348;
  ushort uVar349;
  undefined1 auVar335 [16];
  ushort uVar351;
  ushort uVar352;
  undefined1 auVar353 [16];
  byte bVar354;
  ushort uVar355;
  ushort uVar356;
  ushort uVar359;
  ushort uVar360;
  ushort uVar361;
  ushort uVar362;
  ushort uVar363;
  ushort uVar364;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  ushort uVar365;
  ushort uVar366;
  ushort uVar367;
  ushort uVar368;
  ushort uVar370;
  ushort uVar371;
  short sVar372;
  ushort uVar373;
  short sVar374;
  ushort uVar375;
  short sVar376;
  ushort uVar377;
  short sVar378;
  ushort uVar379;
  undefined1 auVar369 [16];
  ushort uVar380;
  ushort uStack_2c6;
  ushort uStack_2c4;
  ushort uStack_2c2;
  ushort uStack_2c0;
  ushort uStack_2be;
  ushort uStack_2bc;
  ushort uStack_2ba;
  ushort uStack_2b6;
  ushort uStack_2b4;
  ushort uStack_2b2;
  ushort uStack_2b0;
  ushort uStack_2ae;
  ushort uStack_2ac;
  ushort uStack_2aa;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  ushort uStack_266;
  ushort uStack_264;
  ushort uStack_262;
  ushort uStack_260;
  ushort uStack_25e;
  ushort uStack_25c;
  ushort uStack_25a;
  ushort uStack_256;
  ushort uStack_254;
  ushort uStack_252;
  ushort uStack_250;
  ushort uStack_24e;
  ushort uStack_24c;
  ushort uStack_24a;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  ushort uStack_236;
  ushort uStack_234;
  ushort uStack_232;
  ushort uStack_230;
  ushort uStack_22e;
  ushort uStack_22c;
  ushort uStack_22a;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  ushort uStack_206;
  ushort uStack_204;
  ushort uStack_202;
  ushort uStack_200;
  ushort uStack_1fe;
  ushort uStack_1fc;
  ushort uStack_1fa;
  byte local_1e8;
  byte bStack_1e7;
  byte bStack_1e6;
  byte bStack_1e5;
  byte bStack_1e4;
  byte bStack_1e3;
  byte bStack_1e2;
  byte bStack_1e1;
  byte bStack_1e0;
  byte bStack_1df;
  byte bStack_1de;
  byte bStack_1dd;
  byte bStack_1dc;
  byte bStack_1db;
  byte bStack_1da;
  byte bStack_1d9;
  ushort uStack_1d6;
  ushort uStack_1d4;
  ushort uStack_1d2;
  ushort uStack_1d0;
  ushort uStack_1ce;
  ushort uStack_1cc;
  ushort uStack_1ca;
  undefined1 local_1c8 [16];
  ushort uStack_1b6;
  ushort uStack_1b4;
  ushort uStack_1b2;
  ushort uStack_1b0;
  ushort uStack_1ae;
  ushort uStack_1ac;
  ushort uStack_1aa;
  ushort uStack_1a6;
  ushort uStack_1a4;
  ushort uStack_1a2;
  ushort uStack_1a0;
  ushort uStack_19e;
  ushort uStack_19c;
  ushort uStack_19a;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  ushort uStack_156;
  ushort uStack_154;
  ushort uStack_152;
  ushort uStack_150;
  ushort uStack_14e;
  ushort uStack_14c;
  ushort uStack_14a;
  byte local_138;
  byte local_128;
  byte local_108;
  byte local_f8;
  ushort uStack_d6;
  ushort uStack_d4;
  ushort uStack_d2;
  ushort uStack_d0;
  ushort uStack_ce;
  ushort uStack_cc;
  ushort uStack_ca;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  byte local_b8;
  byte local_a8;
  ushort uStack_66;
  ushort uStack_64;
  ushort uStack_62;
  ushort uStack_60;
  ushort uStack_5e;
  ushort uStack_5c;
  ushort uStack_5a;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  byte local_48;
  byte bStack_47;
  byte bStack_46;
  byte bStack_45;
  byte bStack_44;
  byte bStack_43;
  byte bStack_42;
  byte bStack_41;
  byte bStack_40;
  byte bStack_3f;
  byte bStack_3e;
  byte bStack_3d;
  byte bStack_3c;
  byte bStack_3b;
  byte bStack_3a;
  byte bStack_39;
  ushort uStack_26;
  ushort uStack_24;
  ushort uStack_22;
  ushort uStack_20;
  ushort uStack_1e;
  ushort uStack_1c;
  ushort uStack_1a;
  
  lVar173 = (long)p;
  auVar2 = *(undefined1 (*) [16])(s + lVar173 * -4);
  auVar179 = *(undefined1 (*) [16])(s + lVar173 * -3);
  auVar3 = *(undefined1 (*) [16])(s + lVar173 * -2);
  auVar4 = *(undefined1 (*) [16])(s + -lVar173);
  auVar5 = *(undefined1 (*) [16])s;
  auVar265 = *(undefined1 (*) [16])(s + lVar173);
  auVar328 = *(undefined1 (*) [16])(s + lVar173 * 2);
  auVar6 = *(undefined1 (*) [16])(s + lVar173 * 3);
  auVar178 = psubusb(auVar3,auVar4);
  auVar217 = psubusb(auVar4,auVar3);
  auVar217 = auVar217 | auVar178;
  auVar237 = psubusb(auVar265,auVar5);
  auVar178 = psubusb(auVar5,auVar265);
  auVar178 = auVar178 | auVar237;
  bVar315 = auVar217[0];
  bVar236 = auVar178[0];
  bVar174 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[1];
  bVar236 = auVar178[1];
  bVar180 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[2];
  bVar236 = auVar178[2];
  bVar181 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[3];
  bVar236 = auVar178[3];
  bVar185 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[4];
  bVar236 = auVar178[4];
  bVar186 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[5];
  bVar236 = auVar178[5];
  bVar190 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[6];
  bVar236 = auVar178[6];
  bVar191 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[7];
  bVar236 = auVar178[7];
  bVar194 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[8];
  bVar236 = auVar178[8];
  bVar195 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[9];
  bVar236 = auVar178[9];
  bVar199 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[10];
  bVar236 = auVar178[10];
  bVar200 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[0xb];
  bVar236 = auVar178[0xb];
  bVar203 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[0xc];
  bVar236 = auVar178[0xc];
  bVar204 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[0xd];
  bVar236 = auVar178[0xd];
  bVar207 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[0xe];
  bVar236 = auVar178[0xe];
  bVar238 = auVar178[0xf];
  bVar208 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
  bVar315 = auVar217[0xf];
  bVar213 = (bVar238 < bVar315) * bVar315 | (bVar238 >= bVar315) * bVar238;
  auVar178 = psubusb(auVar4,auVar5);
  auVar237 = psubusb(auVar5,auVar4);
  auVar217 = psubusb(auVar3,auVar265);
  auVar263 = psubusb(auVar265,auVar3);
  auVar263 = auVar263 | auVar217;
  auVar178 = paddusb(auVar237 | auVar178,auVar237 | auVar178);
  auVar217._0_2_ = auVar263._0_2_ >> 1;
  auVar217._2_2_ = auVar263._2_2_ >> 1;
  auVar217._4_2_ = auVar263._4_2_ >> 1;
  auVar217._6_2_ = auVar263._6_2_ >> 1;
  auVar217._8_2_ = auVar263._8_2_ >> 1;
  auVar217._10_2_ = auVar263._10_2_ >> 1;
  auVar217._12_2_ = auVar263._12_2_ >> 1;
  auVar217._14_2_ = auVar263._14_2_ >> 1;
  auVar178 = paddusb(auVar217 & _DAT_005140a0,auVar178);
  bVar261 = *_blimit0;
  bVar268 = _blimit0[1];
  bVar275 = _blimit0[2];
  bVar276 = _blimit0[3];
  bVar280 = _blimit0[4];
  bVar281 = _blimit0[5];
  bVar286 = _blimit0[6];
  bVar287 = _blimit0[7];
  bVar292 = _blimit0[8];
  bVar293 = _blimit0[9];
  bVar298 = _blimit0[10];
  bVar299 = _blimit0[0xb];
  bVar304 = _blimit0[0xc];
  bVar305 = _blimit0[0xd];
  bVar310 = _blimit0[0xe];
  bVar311 = _blimit0[0xf];
  bVar315 = auVar178[0];
  bVar236 = auVar178[1];
  bVar238 = auVar178[2];
  bVar239 = auVar178[3];
  bVar242 = auVar178[4];
  bVar243 = auVar178[5];
  bVar246 = auVar178[6];
  bVar247 = auVar178[7];
  bVar249 = auVar178[8];
  bVar250 = auVar178[9];
  bVar252 = auVar178[10];
  bVar253 = auVar178[0xb];
  bVar255 = auVar178[0xc];
  bVar256 = auVar178[0xd];
  bVar258 = auVar178[0xe];
  bVar259 = auVar178[0xf];
  bVar315 = -((byte)((bVar315 < bVar261) * bVar315 | (bVar315 >= bVar261) * bVar261) == bVar315) ^
            0xff;
  bVar261 = -((byte)((bVar236 < bVar268) * bVar236 | (bVar236 >= bVar268) * bVar268) == bVar236) ^
            0xff;
  bVar268 = -((byte)((bVar238 < bVar275) * bVar238 | (bVar238 >= bVar275) * bVar275) == bVar238) ^
            0xff;
  bVar275 = -((byte)((bVar239 < bVar276) * bVar239 | (bVar239 >= bVar276) * bVar276) == bVar239) ^
            0xff;
  bVar276 = -((byte)((bVar242 < bVar280) * bVar242 | (bVar242 >= bVar280) * bVar280) == bVar242) ^
            0xff;
  bVar280 = -((byte)((bVar243 < bVar281) * bVar243 | (bVar243 >= bVar281) * bVar281) == bVar243) ^
            0xff;
  bVar281 = -((byte)((bVar246 < bVar286) * bVar246 | (bVar246 >= bVar286) * bVar286) == bVar246) ^
            0xff;
  bVar286 = -((byte)((bVar247 < bVar287) * bVar247 | (bVar247 >= bVar287) * bVar287) == bVar247) ^
            0xff;
  bVar287 = -((byte)((bVar249 < bVar292) * bVar249 | (bVar249 >= bVar292) * bVar292) == bVar249) ^
            0xff;
  bVar292 = -((byte)((bVar250 < bVar293) * bVar250 | (bVar250 >= bVar293) * bVar293) == bVar250) ^
            0xff;
  bVar293 = -((byte)((bVar252 < bVar298) * bVar252 | (bVar252 >= bVar298) * bVar298) == bVar252) ^
            0xff;
  bVar298 = -((byte)((bVar253 < bVar299) * bVar253 | (bVar253 >= bVar299) * bVar299) == bVar253) ^
            0xff;
  bVar299 = -((byte)((bVar255 < bVar304) * bVar255 | (bVar255 >= bVar304) * bVar304) == bVar255) ^
            0xff;
  bVar304 = -((byte)((bVar256 < bVar305) * bVar256 | (bVar256 >= bVar305) * bVar305) == bVar256) ^
            0xff;
  bVar305 = -((byte)((bVar258 < bVar310) * bVar258 | (bVar258 >= bVar310) * bVar310) == bVar258) ^
            0xff;
  bVar310 = -((byte)((bVar259 < bVar311) * bVar259 | (bVar259 >= bVar311) * bVar311) == bVar259) ^
            0xff;
  bVar236 = (bVar315 < bVar174) * bVar174 | (bVar315 >= bVar174) * bVar315;
  bVar238 = (bVar261 < bVar180) * bVar180 | (bVar261 >= bVar180) * bVar261;
  bVar239 = (bVar268 < bVar181) * bVar181 | (bVar268 >= bVar181) * bVar268;
  bVar242 = (bVar275 < bVar185) * bVar185 | (bVar275 >= bVar185) * bVar275;
  bVar243 = (bVar276 < bVar186) * bVar186 | (bVar276 >= bVar186) * bVar276;
  bVar246 = (bVar280 < bVar190) * bVar190 | (bVar280 >= bVar190) * bVar280;
  bVar247 = (bVar281 < bVar191) * bVar191 | (bVar281 >= bVar191) * bVar281;
  bVar249 = (bVar286 < bVar194) * bVar194 | (bVar286 >= bVar194) * bVar286;
  bVar250 = (bVar287 < bVar195) * bVar195 | (bVar287 >= bVar195) * bVar287;
  bVar252 = (bVar292 < bVar199) * bVar199 | (bVar292 >= bVar199) * bVar292;
  bVar253 = (bVar293 < bVar200) * bVar200 | (bVar293 >= bVar200) * bVar293;
  bVar255 = (bVar298 < bVar203) * bVar203 | (bVar298 >= bVar203) * bVar298;
  bVar256 = (bVar299 < bVar204) * bVar204 | (bVar299 >= bVar204) * bVar299;
  bVar258 = (bVar304 < bVar207) * bVar207 | (bVar304 >= bVar207) * bVar304;
  bVar259 = (bVar305 < bVar208) * bVar208 | (bVar305 >= bVar208) * bVar305;
  bVar261 = (bVar310 < bVar213) * bVar213 | (bVar310 >= bVar213) * bVar310;
  auVar178 = psubusb(auVar179,auVar3);
  auVar217 = psubusb(auVar3,auVar179);
  auVar217 = auVar217 | auVar178;
  auVar178 = psubusb(auVar2,auVar179);
  auVar237 = psubusb(auVar179,auVar2);
  auVar237 = auVar237 | auVar178;
  bVar315 = auVar217[0];
  bVar268 = auVar237[0];
  bVar268 = (bVar268 < bVar315) * bVar315 | (bVar268 >= bVar315) * bVar268;
  bVar315 = auVar217[1];
  bVar275 = auVar237[1];
  bVar275 = (bVar275 < bVar315) * bVar315 | (bVar275 >= bVar315) * bVar275;
  bVar315 = auVar217[2];
  bVar276 = auVar237[2];
  bVar276 = (bVar276 < bVar315) * bVar315 | (bVar276 >= bVar315) * bVar276;
  bVar315 = auVar217[3];
  bVar280 = auVar237[3];
  bVar280 = (bVar280 < bVar315) * bVar315 | (bVar280 >= bVar315) * bVar280;
  bVar315 = auVar217[4];
  bVar281 = auVar237[4];
  bVar281 = (bVar281 < bVar315) * bVar315 | (bVar281 >= bVar315) * bVar281;
  bVar315 = auVar217[5];
  bVar286 = auVar237[5];
  bVar286 = (bVar286 < bVar315) * bVar315 | (bVar286 >= bVar315) * bVar286;
  bVar315 = auVar217[6];
  bVar287 = auVar237[6];
  bVar287 = (bVar287 < bVar315) * bVar315 | (bVar287 >= bVar315) * bVar287;
  bVar315 = auVar217[7];
  bVar292 = auVar237[7];
  bVar292 = (bVar292 < bVar315) * bVar315 | (bVar292 >= bVar315) * bVar292;
  bVar315 = auVar217[8];
  bVar293 = auVar237[8];
  bVar293 = (bVar293 < bVar315) * bVar315 | (bVar293 >= bVar315) * bVar293;
  bVar315 = auVar217[9];
  bVar298 = auVar237[9];
  bVar298 = (bVar298 < bVar315) * bVar315 | (bVar298 >= bVar315) * bVar298;
  bVar315 = auVar217[10];
  bVar299 = auVar237[10];
  bVar299 = (bVar299 < bVar315) * bVar315 | (bVar299 >= bVar315) * bVar299;
  bVar315 = auVar217[0xb];
  bVar304 = auVar237[0xb];
  bVar304 = (bVar304 < bVar315) * bVar315 | (bVar304 >= bVar315) * bVar304;
  bVar315 = auVar217[0xc];
  bVar305 = auVar237[0xc];
  bVar305 = (bVar305 < bVar315) * bVar315 | (bVar305 >= bVar315) * bVar305;
  bVar315 = auVar217[0xd];
  bVar310 = auVar237[0xd];
  bVar310 = (bVar310 < bVar315) * bVar315 | (bVar310 >= bVar315) * bVar310;
  bVar315 = auVar217[0xe];
  bVar311 = auVar237[0xe];
  bVar350 = auVar237[0xf];
  bVar311 = (bVar311 < bVar315) * bVar315 | (bVar311 >= bVar315) * bVar311;
  bVar315 = auVar217[0xf];
  bVar315 = (bVar350 < bVar315) * bVar315 | (bVar350 >= bVar315) * bVar350;
  bVar236 = (bVar268 < bVar236) * bVar236 | (bVar268 >= bVar236) * bVar268;
  bVar238 = (bVar275 < bVar238) * bVar238 | (bVar275 >= bVar238) * bVar275;
  bVar239 = (bVar276 < bVar239) * bVar239 | (bVar276 >= bVar239) * bVar276;
  bVar242 = (bVar280 < bVar242) * bVar242 | (bVar280 >= bVar242) * bVar280;
  bVar243 = (bVar281 < bVar243) * bVar243 | (bVar281 >= bVar243) * bVar281;
  bVar246 = (bVar286 < bVar246) * bVar246 | (bVar286 >= bVar246) * bVar286;
  bVar247 = (bVar287 < bVar247) * bVar247 | (bVar287 >= bVar247) * bVar287;
  bVar249 = (bVar292 < bVar249) * bVar249 | (bVar292 >= bVar249) * bVar292;
  bVar250 = (bVar293 < bVar250) * bVar250 | (bVar293 >= bVar250) * bVar293;
  bVar252 = (bVar298 < bVar252) * bVar252 | (bVar298 >= bVar252) * bVar298;
  bVar253 = (bVar299 < bVar253) * bVar253 | (bVar299 >= bVar253) * bVar299;
  bVar255 = (bVar304 < bVar255) * bVar255 | (bVar304 >= bVar255) * bVar304;
  bVar256 = (bVar305 < bVar256) * bVar256 | (bVar305 >= bVar256) * bVar305;
  bVar258 = (bVar310 < bVar258) * bVar258 | (bVar310 >= bVar258) * bVar310;
  bVar259 = (bVar311 < bVar259) * bVar259 | (bVar311 >= bVar259) * bVar311;
  bVar261 = (bVar315 < bVar261) * bVar261 | (bVar315 >= bVar261) * bVar315;
  auVar178 = psubusb(auVar328,auVar265);
  auVar217 = psubusb(auVar265,auVar328);
  auVar217 = auVar217 | auVar178;
  auVar178 = psubusb(auVar6,auVar328);
  auVar237 = psubusb(auVar328,auVar6);
  auVar237 = auVar237 | auVar178;
  bVar315 = auVar217[0];
  bVar268 = auVar237[0];
  bVar268 = (bVar268 < bVar315) * bVar315 | (bVar268 >= bVar315) * bVar268;
  bVar315 = auVar217[1];
  bVar275 = auVar237[1];
  bVar275 = (bVar275 < bVar315) * bVar315 | (bVar275 >= bVar315) * bVar275;
  bVar315 = auVar217[2];
  bVar276 = auVar237[2];
  bVar276 = (bVar276 < bVar315) * bVar315 | (bVar276 >= bVar315) * bVar276;
  bVar315 = auVar217[3];
  bVar280 = auVar237[3];
  bVar280 = (bVar280 < bVar315) * bVar315 | (bVar280 >= bVar315) * bVar280;
  bVar315 = auVar217[4];
  bVar281 = auVar237[4];
  bVar281 = (bVar281 < bVar315) * bVar315 | (bVar281 >= bVar315) * bVar281;
  bVar315 = auVar217[5];
  bVar286 = auVar237[5];
  bVar286 = (bVar286 < bVar315) * bVar315 | (bVar286 >= bVar315) * bVar286;
  bVar315 = auVar217[6];
  bVar287 = auVar237[6];
  bVar287 = (bVar287 < bVar315) * bVar315 | (bVar287 >= bVar315) * bVar287;
  bVar315 = auVar217[7];
  bVar292 = auVar237[7];
  bVar292 = (bVar292 < bVar315) * bVar315 | (bVar292 >= bVar315) * bVar292;
  bVar315 = auVar217[8];
  bVar293 = auVar237[8];
  bVar293 = (bVar293 < bVar315) * bVar315 | (bVar293 >= bVar315) * bVar293;
  bVar315 = auVar217[9];
  bVar298 = auVar237[9];
  bVar298 = (bVar298 < bVar315) * bVar315 | (bVar298 >= bVar315) * bVar298;
  bVar315 = auVar217[10];
  bVar299 = auVar237[10];
  bVar299 = (bVar299 < bVar315) * bVar315 | (bVar299 >= bVar315) * bVar299;
  bVar315 = auVar217[0xb];
  bVar304 = auVar237[0xb];
  bVar304 = (bVar304 < bVar315) * bVar315 | (bVar304 >= bVar315) * bVar304;
  bVar315 = auVar217[0xc];
  bVar305 = auVar237[0xc];
  bVar305 = (bVar305 < bVar315) * bVar315 | (bVar305 >= bVar315) * bVar305;
  bVar315 = auVar217[0xd];
  bVar310 = auVar237[0xd];
  bVar310 = (bVar310 < bVar315) * bVar315 | (bVar310 >= bVar315) * bVar310;
  bVar315 = auVar217[0xe];
  bVar311 = auVar237[0xe];
  bVar350 = auVar237[0xf];
  bVar311 = (bVar311 < bVar315) * bVar315 | (bVar311 >= bVar315) * bVar311;
  bVar315 = auVar217[0xf];
  bVar315 = (bVar350 < bVar315) * bVar315 | (bVar350 >= bVar315) * bVar350;
  bVar268 = (bVar268 < bVar236) * bVar236 | (bVar268 >= bVar236) * bVar268;
  bVar275 = (bVar275 < bVar238) * bVar238 | (bVar275 >= bVar238) * bVar275;
  bVar276 = (bVar276 < bVar239) * bVar239 | (bVar276 >= bVar239) * bVar276;
  bVar280 = (bVar280 < bVar242) * bVar242 | (bVar280 >= bVar242) * bVar280;
  bVar281 = (bVar281 < bVar243) * bVar243 | (bVar281 >= bVar243) * bVar281;
  bVar286 = (bVar286 < bVar246) * bVar246 | (bVar286 >= bVar246) * bVar286;
  bVar287 = (bVar287 < bVar247) * bVar247 | (bVar287 >= bVar247) * bVar287;
  bVar292 = (bVar292 < bVar249) * bVar249 | (bVar292 >= bVar249) * bVar292;
  bVar293 = (bVar293 < bVar250) * bVar250 | (bVar293 >= bVar250) * bVar293;
  bVar298 = (bVar298 < bVar252) * bVar252 | (bVar298 >= bVar252) * bVar298;
  bVar299 = (bVar299 < bVar253) * bVar253 | (bVar299 >= bVar253) * bVar299;
  bVar304 = (bVar304 < bVar255) * bVar255 | (bVar304 >= bVar255) * bVar304;
  bVar305 = (bVar305 < bVar256) * bVar256 | (bVar305 >= bVar256) * bVar305;
  bVar310 = (bVar310 < bVar258) * bVar258 | (bVar310 >= bVar258) * bVar310;
  bVar311 = (bVar311 < bVar259) * bVar259 | (bVar311 >= bVar259) * bVar311;
  bVar261 = (bVar315 < bVar261) * bVar261 | (bVar315 >= bVar261) * bVar315;
  bVar315 = *_limit0;
  bVar236 = _limit0[1];
  bVar238 = _limit0[2];
  bVar239 = _limit0[3];
  bVar242 = _limit0[4];
  bVar243 = _limit0[5];
  bVar246 = _limit0[6];
  bVar247 = _limit0[7];
  bVar249 = _limit0[8];
  bVar250 = _limit0[9];
  bVar252 = _limit0[10];
  bVar253 = _limit0[0xb];
  bVar255 = _limit0[0xc];
  bVar256 = _limit0[0xd];
  bVar258 = _limit0[0xe];
  bVar259 = _limit0[0xf];
  auVar178[0] = -((byte)((bVar268 < bVar315) * bVar268 | (bVar268 >= bVar315) * bVar315) == bVar268)
  ;
  auVar178[1] = -((byte)((bVar275 < bVar236) * bVar275 | (bVar275 >= bVar236) * bVar236) == bVar275)
  ;
  auVar178[2] = -((byte)((bVar276 < bVar238) * bVar276 | (bVar276 >= bVar238) * bVar238) == bVar276)
  ;
  auVar178[3] = -((byte)((bVar280 < bVar239) * bVar280 | (bVar280 >= bVar239) * bVar239) == bVar280)
  ;
  auVar178[4] = -((byte)((bVar281 < bVar242) * bVar281 | (bVar281 >= bVar242) * bVar242) == bVar281)
  ;
  auVar178[5] = -((byte)((bVar286 < bVar243) * bVar286 | (bVar286 >= bVar243) * bVar243) == bVar286)
  ;
  auVar178[6] = -((byte)((bVar287 < bVar246) * bVar287 | (bVar287 >= bVar246) * bVar246) == bVar287)
  ;
  auVar178[7] = -((byte)((bVar292 < bVar247) * bVar292 | (bVar292 >= bVar247) * bVar247) == bVar292)
  ;
  auVar178[8] = -((byte)((bVar293 < bVar249) * bVar293 | (bVar293 >= bVar249) * bVar249) == bVar293)
  ;
  auVar178[9] = -((byte)((bVar298 < bVar250) * bVar298 | (bVar298 >= bVar250) * bVar250) == bVar298)
  ;
  auVar178[10] = -((byte)((bVar299 < bVar252) * bVar299 | (bVar299 >= bVar252) * bVar252) == bVar299
                  );
  auVar178[0xb] =
       -((byte)((bVar304 < bVar253) * bVar304 | (bVar304 >= bVar253) * bVar253) == bVar304);
  auVar178[0xc] =
       -((byte)((bVar305 < bVar255) * bVar305 | (bVar305 >= bVar255) * bVar255) == bVar305);
  auVar178[0xd] =
       -((byte)((bVar310 < bVar256) * bVar310 | (bVar310 >= bVar256) * bVar256) == bVar310);
  auVar178[0xe] =
       -((byte)((bVar311 < bVar258) * bVar311 | (bVar311 >= bVar258) * bVar258) == bVar311);
  bVar8 = (byte)((bVar261 < bVar259) * bVar261 | (bVar261 >= bVar259) * bVar259) == bVar261;
  auVar178[0xf] = -bVar8;
  if ((((((((((((((((auVar178 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar178 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar178 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar178 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar178 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar178 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar178 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar178 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar178 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar178 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar178 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar178 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar178 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar178 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar178 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar8) {
    auVar217 = psubusb(auVar179,auVar4);
    auVar237 = psubusb(auVar4,auVar179);
    auVar237 = auVar237 | auVar217;
    auVar217 = psubusb(auVar328,auVar5);
    auVar263 = psubusb(auVar5,auVar328);
    auVar263 = auVar263 | auVar217;
    bVar315 = auVar237[0];
    bVar236 = auVar263[0];
    bVar236 = (bVar236 < bVar315) * bVar315 | (bVar236 >= bVar315) * bVar236;
    bVar315 = auVar237[1];
    bVar238 = auVar263[1];
    bVar238 = (bVar238 < bVar315) * bVar315 | (bVar238 >= bVar315) * bVar238;
    bVar315 = auVar237[2];
    bVar239 = auVar263[2];
    bVar239 = (bVar239 < bVar315) * bVar315 | (bVar239 >= bVar315) * bVar239;
    bVar315 = auVar237[3];
    bVar242 = auVar263[3];
    bVar242 = (bVar242 < bVar315) * bVar315 | (bVar242 >= bVar315) * bVar242;
    bVar315 = auVar237[4];
    bVar243 = auVar263[4];
    bVar243 = (bVar243 < bVar315) * bVar315 | (bVar243 >= bVar315) * bVar243;
    bVar315 = auVar237[5];
    bVar246 = auVar263[5];
    bVar246 = (bVar246 < bVar315) * bVar315 | (bVar246 >= bVar315) * bVar246;
    bVar315 = auVar237[6];
    bVar247 = auVar263[6];
    bVar247 = (bVar247 < bVar315) * bVar315 | (bVar247 >= bVar315) * bVar247;
    bVar315 = auVar237[7];
    bVar249 = auVar263[7];
    bVar249 = (bVar249 < bVar315) * bVar315 | (bVar249 >= bVar315) * bVar249;
    bVar315 = auVar237[8];
    bVar250 = auVar263[8];
    bVar250 = (bVar250 < bVar315) * bVar315 | (bVar250 >= bVar315) * bVar250;
    bVar315 = auVar237[9];
    bVar252 = auVar263[9];
    bVar252 = (bVar252 < bVar315) * bVar315 | (bVar252 >= bVar315) * bVar252;
    bVar315 = auVar237[10];
    bVar253 = auVar263[10];
    bVar253 = (bVar253 < bVar315) * bVar315 | (bVar253 >= bVar315) * bVar253;
    bVar315 = auVar237[0xb];
    bVar255 = auVar263[0xb];
    bVar255 = (bVar255 < bVar315) * bVar315 | (bVar255 >= bVar315) * bVar255;
    bVar315 = auVar237[0xc];
    bVar256 = auVar263[0xc];
    bVar256 = (bVar256 < bVar315) * bVar315 | (bVar256 >= bVar315) * bVar256;
    bVar315 = auVar237[0xd];
    bVar258 = auVar263[0xd];
    bVar258 = (bVar258 < bVar315) * bVar315 | (bVar258 >= bVar315) * bVar258;
    bVar315 = auVar237[0xe];
    bVar259 = auVar263[0xe];
    bVar261 = auVar263[0xf];
    bVar259 = (bVar259 < bVar315) * bVar315 | (bVar259 >= bVar315) * bVar259;
    bVar315 = auVar237[0xf];
    bVar315 = (bVar261 < bVar315) * bVar315 | (bVar261 >= bVar315) * bVar261;
    bVar236 = (bVar236 < bVar174) * bVar174 | (bVar236 >= bVar174) * bVar236;
    bVar238 = (bVar238 < bVar180) * bVar180 | (bVar238 >= bVar180) * bVar238;
    bVar239 = (bVar239 < bVar181) * bVar181 | (bVar239 >= bVar181) * bVar239;
    bVar242 = (bVar242 < bVar185) * bVar185 | (bVar242 >= bVar185) * bVar242;
    bVar243 = (bVar243 < bVar186) * bVar186 | (bVar243 >= bVar186) * bVar243;
    bVar246 = (bVar246 < bVar190) * bVar190 | (bVar246 >= bVar190) * bVar246;
    bVar247 = (bVar247 < bVar191) * bVar191 | (bVar247 >= bVar191) * bVar247;
    bVar249 = (bVar249 < bVar194) * bVar194 | (bVar249 >= bVar194) * bVar249;
    bVar250 = (bVar250 < bVar195) * bVar195 | (bVar250 >= bVar195) * bVar250;
    bVar252 = (bVar252 < bVar199) * bVar199 | (bVar252 >= bVar199) * bVar252;
    bVar253 = (bVar253 < bVar200) * bVar200 | (bVar253 >= bVar200) * bVar253;
    bVar255 = (bVar255 < bVar203) * bVar203 | (bVar255 >= bVar203) * bVar255;
    bVar256 = (bVar256 < bVar204) * bVar204 | (bVar256 >= bVar204) * bVar256;
    bVar258 = (bVar258 < bVar207) * bVar207 | (bVar258 >= bVar207) * bVar258;
    bVar259 = (bVar259 < bVar208) * bVar208 | (bVar259 >= bVar208) * bVar259;
    bVar261 = (bVar315 < bVar213) * bVar213 | (bVar315 >= bVar213) * bVar315;
    auVar217 = psubusb(auVar2,auVar4);
    auVar237 = psubusb(auVar4,auVar2);
    auVar237 = auVar237 | auVar217;
    auVar217 = psubusb(auVar6,auVar5);
    auVar263 = psubusb(auVar5,auVar6);
    auVar263 = auVar263 | auVar217;
    bVar315 = auVar237[0];
    bVar268 = auVar263[0];
    bVar268 = (bVar268 < bVar315) * bVar315 | (bVar268 >= bVar315) * bVar268;
    bVar315 = auVar237[1];
    bVar275 = auVar263[1];
    bVar275 = (bVar275 < bVar315) * bVar315 | (bVar275 >= bVar315) * bVar275;
    bVar315 = auVar237[2];
    bVar276 = auVar263[2];
    bVar276 = (bVar276 < bVar315) * bVar315 | (bVar276 >= bVar315) * bVar276;
    bVar315 = auVar237[3];
    bVar280 = auVar263[3];
    bVar280 = (bVar280 < bVar315) * bVar315 | (bVar280 >= bVar315) * bVar280;
    bVar315 = auVar237[4];
    bVar281 = auVar263[4];
    bVar281 = (bVar281 < bVar315) * bVar315 | (bVar281 >= bVar315) * bVar281;
    bVar315 = auVar237[5];
    bVar286 = auVar263[5];
    bVar286 = (bVar286 < bVar315) * bVar315 | (bVar286 >= bVar315) * bVar286;
    bVar315 = auVar237[6];
    bVar287 = auVar263[6];
    bVar287 = (bVar287 < bVar315) * bVar315 | (bVar287 >= bVar315) * bVar287;
    bVar315 = auVar237[7];
    bVar292 = auVar263[7];
    bVar292 = (bVar292 < bVar315) * bVar315 | (bVar292 >= bVar315) * bVar292;
    bVar315 = auVar237[8];
    bVar293 = auVar263[8];
    bVar293 = (bVar293 < bVar315) * bVar315 | (bVar293 >= bVar315) * bVar293;
    bVar315 = auVar237[9];
    bVar298 = auVar263[9];
    bVar298 = (bVar298 < bVar315) * bVar315 | (bVar298 >= bVar315) * bVar298;
    bVar315 = auVar237[10];
    bVar299 = auVar263[10];
    bVar299 = (bVar299 < bVar315) * bVar315 | (bVar299 >= bVar315) * bVar299;
    bVar315 = auVar237[0xb];
    bVar304 = auVar263[0xb];
    bVar304 = (bVar304 < bVar315) * bVar315 | (bVar304 >= bVar315) * bVar304;
    bVar315 = auVar237[0xc];
    bVar305 = auVar263[0xc];
    bVar305 = (bVar305 < bVar315) * bVar315 | (bVar305 >= bVar315) * bVar305;
    bVar315 = auVar237[0xd];
    bVar310 = auVar263[0xd];
    bVar310 = (bVar310 < bVar315) * bVar315 | (bVar310 >= bVar315) * bVar310;
    bVar315 = auVar237[0xe];
    bVar311 = auVar263[0xe];
    bVar350 = auVar263[0xf];
    bVar311 = (bVar311 < bVar315) * bVar315 | (bVar311 >= bVar315) * bVar311;
    bVar315 = auVar237[0xf];
    bVar315 = (bVar350 < bVar315) * bVar315 | (bVar350 >= bVar315) * bVar350;
    bVar268 = (bVar268 < bVar236) * bVar236 | (bVar268 >= bVar236) * bVar268;
    bVar275 = (bVar275 < bVar238) * bVar238 | (bVar275 >= bVar238) * bVar275;
    bVar276 = (bVar276 < bVar239) * bVar239 | (bVar276 >= bVar239) * bVar276;
    bVar280 = (bVar280 < bVar242) * bVar242 | (bVar280 >= bVar242) * bVar280;
    bVar281 = (bVar281 < bVar243) * bVar243 | (bVar281 >= bVar243) * bVar281;
    bVar286 = (bVar286 < bVar246) * bVar246 | (bVar286 >= bVar246) * bVar286;
    bVar287 = (bVar287 < bVar247) * bVar247 | (bVar287 >= bVar247) * bVar287;
    bVar292 = (bVar292 < bVar249) * bVar249 | (bVar292 >= bVar249) * bVar292;
    bVar293 = (bVar293 < bVar250) * bVar250 | (bVar293 >= bVar250) * bVar293;
    bVar298 = (bVar298 < bVar252) * bVar252 | (bVar298 >= bVar252) * bVar298;
    bVar299 = (bVar299 < bVar253) * bVar253 | (bVar299 >= bVar253) * bVar299;
    bVar304 = (bVar304 < bVar255) * bVar255 | (bVar304 >= bVar255) * bVar304;
    bVar305 = (bVar305 < bVar256) * bVar256 | (bVar305 >= bVar256) * bVar305;
    bVar310 = (bVar310 < bVar258) * bVar258 | (bVar310 >= bVar258) * bVar310;
    bVar311 = (bVar311 < bVar259) * bVar259 | (bVar311 >= bVar259) * bVar311;
    bVar261 = (bVar315 < bVar261) * bVar261 | (bVar315 >= bVar261) * bVar315;
    bVar315 = DAT_004d5770;
    bVar236 = DAT_004d5770._1_1_;
    bVar238 = DAT_004d5770._2_1_;
    bVar239 = DAT_004d5770._3_1_;
    bVar242 = DAT_004d5770._4_1_;
    bVar243 = DAT_004d5770._5_1_;
    bVar246 = DAT_004d5770._6_1_;
    bVar247 = DAT_004d5770._7_1_;
    bVar249 = DAT_004d5770._8_1_;
    bVar250 = DAT_004d5770._9_1_;
    bVar252 = DAT_004d5770._10_1_;
    bVar253 = DAT_004d5770._11_1_;
    bVar255 = DAT_004d5770._12_1_;
    bVar256 = DAT_004d5770._13_1_;
    bVar258 = DAT_004d5770._14_1_;
    bVar259 = DAT_004d5770._15_1_;
    auVar327[0] = -((byte)((bVar315 < bVar268) * bVar315 | (bVar315 >= bVar268) * bVar268) ==
                   bVar268);
    auVar327[1] = -((byte)((bVar236 < bVar275) * bVar236 | (bVar236 >= bVar275) * bVar275) ==
                   bVar275);
    auVar327[2] = -((byte)((bVar238 < bVar276) * bVar238 | (bVar238 >= bVar276) * bVar276) ==
                   bVar276);
    auVar327[3] = -((byte)((bVar239 < bVar280) * bVar239 | (bVar239 >= bVar280) * bVar280) ==
                   bVar280);
    auVar327[4] = -((byte)((bVar242 < bVar281) * bVar242 | (bVar242 >= bVar281) * bVar281) ==
                   bVar281);
    auVar327[5] = -((byte)((bVar243 < bVar286) * bVar243 | (bVar243 >= bVar286) * bVar286) ==
                   bVar286);
    auVar327[6] = -((byte)((bVar246 < bVar287) * bVar246 | (bVar246 >= bVar287) * bVar287) ==
                   bVar287);
    auVar327[7] = -((byte)((bVar247 < bVar292) * bVar247 | (bVar247 >= bVar292) * bVar292) ==
                   bVar292);
    auVar327[8] = -((byte)((bVar249 < bVar293) * bVar249 | (bVar249 >= bVar293) * bVar293) ==
                   bVar293);
    auVar327[9] = -((byte)((bVar250 < bVar298) * bVar250 | (bVar250 >= bVar298) * bVar298) ==
                   bVar298);
    auVar327[10] = -((byte)((bVar252 < bVar299) * bVar252 | (bVar252 >= bVar299) * bVar299) ==
                    bVar299);
    auVar327[0xb] =
         -((byte)((bVar253 < bVar304) * bVar253 | (bVar253 >= bVar304) * bVar304) == bVar304);
    auVar327[0xc] =
         -((byte)((bVar255 < bVar305) * bVar255 | (bVar255 >= bVar305) * bVar305) == bVar305);
    auVar327[0xd] =
         -((byte)((bVar256 < bVar310) * bVar256 | (bVar256 >= bVar310) * bVar310) == bVar310);
    auVar327[0xe] =
         -((byte)((bVar258 < bVar311) * bVar258 | (bVar258 >= bVar311) * bVar311) == bVar311);
    auVar327[0xf] =
         -((byte)((bVar259 < bVar261) * bVar259 | (bVar259 >= bVar261) * bVar261) == bVar261);
    auVar327 = auVar327 & auVar178;
    bVar261 = *_thresh0;
    bVar268 = _thresh0[1];
    bVar275 = _thresh0[2];
    bVar276 = _thresh0[3];
    bVar280 = _thresh0[4];
    bVar281 = _thresh0[5];
    bVar286 = _thresh0[6];
    bVar287 = _thresh0[7];
    bVar292 = _thresh0[8];
    bVar293 = _thresh0[9];
    bVar298 = _thresh0[10];
    bVar299 = _thresh0[0xb];
    bVar304 = _thresh0[0xc];
    bVar305 = _thresh0[0xd];
    bVar310 = _thresh0[0xe];
    bVar311 = _thresh0[0xf];
    auVar272[0] = -((byte)((bVar174 < bVar261) * bVar174 | (bVar174 >= bVar261) * bVar261) ==
                   bVar174);
    auVar272[1] = -((byte)((bVar180 < bVar268) * bVar180 | (bVar180 >= bVar268) * bVar268) ==
                   bVar180);
    auVar272[2] = -((byte)((bVar181 < bVar275) * bVar181 | (bVar181 >= bVar275) * bVar275) ==
                   bVar181);
    auVar272[3] = -((byte)((bVar185 < bVar276) * bVar185 | (bVar185 >= bVar276) * bVar276) ==
                   bVar185);
    auVar272[4] = -((byte)((bVar186 < bVar280) * bVar186 | (bVar186 >= bVar280) * bVar280) ==
                   bVar186);
    auVar272[5] = -((byte)((bVar190 < bVar281) * bVar190 | (bVar190 >= bVar281) * bVar281) ==
                   bVar190);
    auVar272[6] = -((byte)((bVar191 < bVar286) * bVar191 | (bVar191 >= bVar286) * bVar286) ==
                   bVar191);
    auVar272[7] = -((byte)((bVar194 < bVar287) * bVar194 | (bVar194 >= bVar287) * bVar287) ==
                   bVar194);
    auVar272[8] = -((byte)((bVar195 < bVar292) * bVar195 | (bVar195 >= bVar292) * bVar292) ==
                   bVar195);
    auVar272[9] = -((byte)((bVar199 < bVar293) * bVar199 | (bVar199 >= bVar293) * bVar293) ==
                   bVar199);
    auVar272[10] = -((byte)((bVar200 < bVar298) * bVar200 | (bVar200 >= bVar298) * bVar298) ==
                    bVar200);
    auVar272[0xb] =
         -((byte)((bVar203 < bVar299) * bVar203 | (bVar203 >= bVar299) * bVar299) == bVar203);
    auVar272[0xc] =
         -((byte)((bVar204 < bVar304) * bVar204 | (bVar204 >= bVar304) * bVar304) == bVar204);
    auVar272[0xd] =
         -((byte)((bVar207 < bVar305) * bVar207 | (bVar207 >= bVar305) * bVar305) == bVar207);
    auVar272[0xe] =
         -((byte)((bVar208 < bVar310) * bVar208 | (bVar208 >= bVar310) * bVar310) == bVar208);
    auVar272[0xf] =
         -((byte)((bVar213 < bVar311) * bVar213 | (bVar213 >= bVar311) * bVar311) == bVar213);
    auVar217 = psubsb(auVar3 ^ _DAT_005134d0,auVar265 ^ _DAT_005134d0);
    auVar237 = psubsb(auVar5 ^ _DAT_005134d0,auVar4 ^ _DAT_005134d0);
    auVar217 = paddsb(~auVar272 & auVar217,auVar237);
    auVar217 = paddsb(auVar217,auVar237);
    auVar217 = paddsb(auVar217,auVar237);
    auVar237 = paddsb(_DAT_005128f0,auVar217 & auVar178);
    auVar369[0] = -(auVar237[0] < '\0');
    auVar369[1] = -(auVar237[1] < '\0');
    auVar369[2] = -(auVar237[2] < '\0');
    auVar369[3] = -(auVar237[3] < '\0');
    auVar369[4] = -(auVar237[4] < '\0');
    auVar369[5] = -(auVar237[5] < '\0');
    auVar369[6] = -(auVar237[6] < '\0');
    auVar369[7] = -(auVar237[7] < '\0');
    auVar369[8] = -(auVar237[8] < '\0');
    auVar369[9] = -(auVar237[9] < '\0');
    auVar369[10] = -(auVar237[10] < '\0');
    auVar369[0xb] = -(auVar237[0xb] < '\0');
    auVar369[0xc] = -(auVar237[0xc] < '\0');
    auVar369[0xd] = -(auVar237[0xd] < '\0');
    auVar369[0xe] = -(auVar237[0xe] < '\0');
    auVar369[0xf] = -(auVar237[0xf] < '\0');
    auVar217 = paddsb(auVar217 & auVar178,_DAT_005128e0);
    auVar353._0_2_ = auVar237._0_2_ >> 3;
    auVar353._2_2_ = auVar237._2_2_ >> 3;
    auVar353._4_2_ = auVar237._4_2_ >> 3;
    auVar353._6_2_ = auVar237._6_2_ >> 3;
    auVar353._8_2_ = auVar237._8_2_ >> 3;
    auVar353._10_2_ = auVar237._10_2_ >> 3;
    auVar353._12_2_ = auVar237._12_2_ >> 3;
    auVar353._14_2_ = auVar237._14_2_ >> 3;
    auVar178 = ~_DAT_004cc120 & auVar369 | auVar353 & _DAT_004cc120;
    auVar357[0] = -(auVar217[0] < '\0');
    auVar357[1] = -(auVar217[1] < '\0');
    auVar357[2] = -(auVar217[2] < '\0');
    auVar357[3] = -(auVar217[3] < '\0');
    auVar357[4] = -(auVar217[4] < '\0');
    auVar357[5] = -(auVar217[5] < '\0');
    auVar357[6] = -(auVar217[6] < '\0');
    auVar357[7] = -(auVar217[7] < '\0');
    auVar357[8] = -(auVar217[8] < '\0');
    auVar357[9] = -(auVar217[9] < '\0');
    auVar357[10] = -(auVar217[10] < '\0');
    auVar357[0xb] = -(auVar217[0xb] < '\0');
    auVar357[0xc] = -(auVar217[0xc] < '\0');
    auVar357[0xd] = -(auVar217[0xd] < '\0');
    auVar357[0xe] = -(auVar217[0xe] < '\0');
    auVar357[0xf] = -(auVar217[0xf] < '\0');
    auVar263._0_2_ = auVar217._0_2_ >> 3;
    auVar263._2_2_ = auVar217._2_2_ >> 3;
    auVar263._4_2_ = auVar217._4_2_ >> 3;
    auVar263._6_2_ = auVar217._6_2_ >> 3;
    auVar263._8_2_ = auVar217._8_2_ >> 3;
    auVar263._10_2_ = auVar217._10_2_ >> 3;
    auVar263._12_2_ = auVar217._12_2_ >> 3;
    auVar263._14_2_ = auVar217._14_2_ >> 3;
    auVar353 = psubsb(auVar5 ^ _DAT_005134d0,auVar178);
    auVar263 = paddsb(~_DAT_004cc120 & auVar357 | auVar263 & _DAT_004cc120,auVar4 ^ _DAT_005134d0);
    auVar178 = paddsb(auVar178,_DAT_004d5770);
    auVar237._0_2_ = auVar178._0_2_ >> 1;
    auVar237._2_2_ = auVar178._2_2_ >> 1;
    auVar237._4_2_ = auVar178._4_2_ >> 1;
    auVar237._6_2_ = auVar178._6_2_ >> 1;
    auVar237._8_2_ = auVar178._8_2_ >> 1;
    auVar237._10_2_ = auVar178._10_2_ >> 1;
    auVar237._12_2_ = auVar178._12_2_ >> 1;
    auVar237._14_2_ = auVar178._14_2_ >> 1;
    auVar272 = (~_DAT_005140a0 & auVar178 | auVar237 & _DAT_005140a0) & auVar272;
    auVar178 = paddsb(auVar3 ^ _DAT_005134d0,auVar272);
    auVar217 = psubsb(auVar265 ^ _DAT_005134d0,auVar272);
    lVar172 = lVar173 * -2;
    lVar171 = -lVar173;
    auVar353 = auVar353 ^ _DAT_005134d0;
    auVar263 = auVar263 ^ _DAT_005134d0;
    auVar217 = auVar217 ^ _DAT_005134d0;
    if ((((((((((((((((auVar327 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar327 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar327 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar327 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar327 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar327 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar327 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar327 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar327 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar327 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar327 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar327 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar327 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar327 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar327 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar327[0xf])
    {
      *(undefined1 (*) [16])(s + lVar172) = auVar178 ^ _DAT_005134d0;
      *(undefined1 (*) [16])(s + lVar171) = auVar263;
      *(undefined1 (*) [16])s = auVar353;
      *(undefined1 (*) [16])(s + lVar173) = auVar217;
    }
    else {
      auVar237 = *(undefined1 (*) [16])(s + lVar173 * -6);
      auVar272 = *(undefined1 (*) [16])(s + lVar173 * -5);
      auVar357 = *(undefined1 (*) [16])(s + lVar173 * 4);
      auVar369 = *(undefined1 (*) [16])(s + lVar173 * 5);
      auVar7 = *(undefined1 (*) [16])(s + lVar173 * 6);
      auVar218 = psubusb(auVar272,auVar4);
      auVar264 = psubusb(auVar4,auVar272);
      auVar264 = auVar264 | auVar218;
      auVar218 = psubusb(auVar357,auVar5);
      auVar273 = psubusb(auVar5,auVar357);
      auVar273 = auVar273 | auVar218;
      bVar261 = auVar264[0];
      bVar268 = auVar273[0];
      bVar268 = (bVar268 < bVar261) * bVar261 | (bVar268 >= bVar261) * bVar268;
      bVar261 = auVar264[1];
      bVar275 = auVar273[1];
      bVar275 = (bVar275 < bVar261) * bVar261 | (bVar275 >= bVar261) * bVar275;
      bVar261 = auVar264[2];
      bVar276 = auVar273[2];
      bVar276 = (bVar276 < bVar261) * bVar261 | (bVar276 >= bVar261) * bVar276;
      bVar261 = auVar264[3];
      bVar280 = auVar273[3];
      bVar280 = (bVar280 < bVar261) * bVar261 | (bVar280 >= bVar261) * bVar280;
      bVar261 = auVar264[4];
      bVar281 = auVar273[4];
      bVar281 = (bVar281 < bVar261) * bVar261 | (bVar281 >= bVar261) * bVar281;
      bVar261 = auVar264[5];
      bVar286 = auVar273[5];
      bVar286 = (bVar286 < bVar261) * bVar261 | (bVar286 >= bVar261) * bVar286;
      bVar261 = auVar264[6];
      bVar287 = auVar273[6];
      bVar287 = (bVar287 < bVar261) * bVar261 | (bVar287 >= bVar261) * bVar287;
      bVar261 = auVar264[7];
      bVar292 = auVar273[7];
      bVar292 = (bVar292 < bVar261) * bVar261 | (bVar292 >= bVar261) * bVar292;
      bVar261 = auVar264[8];
      bVar293 = auVar273[8];
      bVar293 = (bVar293 < bVar261) * bVar261 | (bVar293 >= bVar261) * bVar293;
      bVar261 = auVar264[9];
      bVar298 = auVar273[9];
      bVar298 = (bVar298 < bVar261) * bVar261 | (bVar298 >= bVar261) * bVar298;
      bVar261 = auVar264[10];
      bVar299 = auVar273[10];
      bVar299 = (bVar299 < bVar261) * bVar261 | (bVar299 >= bVar261) * bVar299;
      bVar261 = auVar264[0xb];
      bVar304 = auVar273[0xb];
      bVar304 = (bVar304 < bVar261) * bVar261 | (bVar304 >= bVar261) * bVar304;
      bVar261 = auVar264[0xc];
      bVar305 = auVar273[0xc];
      bVar305 = (bVar305 < bVar261) * bVar261 | (bVar305 >= bVar261) * bVar305;
      bVar261 = auVar264[0xd];
      bVar310 = auVar273[0xd];
      bVar310 = (bVar310 < bVar261) * bVar261 | (bVar310 >= bVar261) * bVar310;
      bVar261 = auVar264[0xe];
      bVar311 = auVar273[0xe];
      bVar174 = auVar273[0xf];
      bVar311 = (bVar311 < bVar261) * bVar261 | (bVar311 >= bVar261) * bVar311;
      bVar261 = auVar264[0xf];
      bVar174 = (bVar174 < bVar261) * bVar261 | (bVar174 >= bVar261) * bVar174;
      auVar218 = psubusb(auVar237,auVar4);
      auVar264 = psubusb(auVar4,auVar237);
      auVar264 = auVar264 | auVar218;
      auVar218 = psubusb(auVar369,auVar5);
      auVar273 = psubusb(auVar5,auVar369);
      auVar273 = auVar273 | auVar218;
      auVar218 = *(undefined1 (*) [16])(s + -(long)(p * 7));
      bVar261 = auVar264[0];
      bVar180 = auVar273[0];
      bVar180 = (bVar180 < bVar261) * bVar261 | (bVar180 >= bVar261) * bVar180;
      bVar261 = auVar264[1];
      bVar181 = auVar273[1];
      bVar181 = (bVar181 < bVar261) * bVar261 | (bVar181 >= bVar261) * bVar181;
      bVar261 = auVar264[2];
      bVar185 = auVar273[2];
      bVar185 = (bVar185 < bVar261) * bVar261 | (bVar185 >= bVar261) * bVar185;
      bVar261 = auVar264[3];
      bVar186 = auVar273[3];
      bVar186 = (bVar186 < bVar261) * bVar261 | (bVar186 >= bVar261) * bVar186;
      bVar261 = auVar264[4];
      bVar190 = auVar273[4];
      bVar190 = (bVar190 < bVar261) * bVar261 | (bVar190 >= bVar261) * bVar190;
      bVar261 = auVar264[5];
      bVar191 = auVar273[5];
      bVar191 = (bVar191 < bVar261) * bVar261 | (bVar191 >= bVar261) * bVar191;
      bVar261 = auVar264[6];
      bVar194 = auVar273[6];
      bVar194 = (bVar194 < bVar261) * bVar261 | (bVar194 >= bVar261) * bVar194;
      bVar261 = auVar264[7];
      bVar195 = auVar273[7];
      bVar195 = (bVar195 < bVar261) * bVar261 | (bVar195 >= bVar261) * bVar195;
      bVar261 = auVar264[8];
      bVar199 = auVar273[8];
      bVar199 = (bVar199 < bVar261) * bVar261 | (bVar199 >= bVar261) * bVar199;
      bVar261 = auVar264[9];
      bVar200 = auVar273[9];
      bVar200 = (bVar200 < bVar261) * bVar261 | (bVar200 >= bVar261) * bVar200;
      bVar261 = auVar264[10];
      bVar203 = auVar273[10];
      bVar203 = (bVar203 < bVar261) * bVar261 | (bVar203 >= bVar261) * bVar203;
      bVar261 = auVar264[0xb];
      bVar204 = auVar273[0xb];
      bVar204 = (bVar204 < bVar261) * bVar261 | (bVar204 >= bVar261) * bVar204;
      bVar261 = auVar264[0xc];
      bVar207 = auVar273[0xc];
      bVar207 = (bVar207 < bVar261) * bVar261 | (bVar207 >= bVar261) * bVar207;
      bVar261 = auVar264[0xd];
      bVar208 = auVar273[0xd];
      bVar208 = (bVar208 < bVar261) * bVar261 | (bVar208 >= bVar261) * bVar208;
      bVar261 = auVar264[0xe];
      bVar213 = auVar273[0xe];
      bVar350 = auVar273[0xf];
      bVar213 = (bVar213 < bVar261) * bVar261 | (bVar213 >= bVar261) * bVar213;
      bVar261 = auVar264[0xf];
      bVar261 = (bVar350 < bVar261) * bVar261 | (bVar350 >= bVar261) * bVar350;
      bVar180 = (bVar180 < bVar268) * bVar268 | (bVar180 >= bVar268) * bVar180;
      bVar181 = (bVar181 < bVar275) * bVar275 | (bVar181 >= bVar275) * bVar181;
      bVar185 = (bVar185 < bVar276) * bVar276 | (bVar185 >= bVar276) * bVar185;
      bVar186 = (bVar186 < bVar280) * bVar280 | (bVar186 >= bVar280) * bVar186;
      bVar190 = (bVar190 < bVar281) * bVar281 | (bVar190 >= bVar281) * bVar190;
      bVar191 = (bVar191 < bVar286) * bVar286 | (bVar191 >= bVar286) * bVar191;
      bVar194 = (bVar194 < bVar287) * bVar287 | (bVar194 >= bVar287) * bVar194;
      bVar195 = (bVar195 < bVar292) * bVar292 | (bVar195 >= bVar292) * bVar195;
      bVar199 = (bVar199 < bVar293) * bVar293 | (bVar199 >= bVar293) * bVar199;
      bVar200 = (bVar200 < bVar298) * bVar298 | (bVar200 >= bVar298) * bVar200;
      bVar203 = (bVar203 < bVar299) * bVar299 | (bVar203 >= bVar299) * bVar203;
      bVar204 = (bVar204 < bVar304) * bVar304 | (bVar204 >= bVar304) * bVar204;
      bVar207 = (bVar207 < bVar305) * bVar305 | (bVar207 >= bVar305) * bVar207;
      bVar208 = (bVar208 < bVar310) * bVar310 | (bVar208 >= bVar310) * bVar208;
      bVar213 = (bVar213 < bVar311) * bVar311 | (bVar213 >= bVar311) * bVar213;
      bVar350 = (bVar261 < bVar174) * bVar174 | (bVar261 >= bVar174) * bVar261;
      auVar264 = psubusb(auVar218,auVar4);
      auVar273 = psubusb(auVar4,auVar218);
      auVar273 = auVar273 | auVar264;
      auVar264 = psubusb(auVar7,auVar5);
      auVar274 = psubusb(auVar5,auVar7);
      auVar274 = auVar274 | auVar264;
      bVar261 = auVar273[0];
      bVar268 = auVar274[0];
      bVar268 = (bVar268 < bVar261) * bVar261 | (bVar268 >= bVar261) * bVar268;
      bVar261 = auVar273[1];
      bVar275 = auVar274[1];
      bVar275 = (bVar275 < bVar261) * bVar261 | (bVar275 >= bVar261) * bVar275;
      bVar261 = auVar273[2];
      bVar276 = auVar274[2];
      bVar276 = (bVar276 < bVar261) * bVar261 | (bVar276 >= bVar261) * bVar276;
      bVar261 = auVar273[3];
      bVar280 = auVar274[3];
      bVar280 = (bVar280 < bVar261) * bVar261 | (bVar280 >= bVar261) * bVar280;
      bVar261 = auVar273[4];
      bVar281 = auVar274[4];
      bVar281 = (bVar281 < bVar261) * bVar261 | (bVar281 >= bVar261) * bVar281;
      bVar261 = auVar273[5];
      bVar286 = auVar274[5];
      bVar286 = (bVar286 < bVar261) * bVar261 | (bVar286 >= bVar261) * bVar286;
      bVar261 = auVar273[6];
      bVar287 = auVar274[6];
      bVar287 = (bVar287 < bVar261) * bVar261 | (bVar287 >= bVar261) * bVar287;
      bVar261 = auVar273[7];
      bVar292 = auVar274[7];
      bVar292 = (bVar292 < bVar261) * bVar261 | (bVar292 >= bVar261) * bVar292;
      bVar261 = auVar273[8];
      bVar293 = auVar274[8];
      bVar293 = (bVar293 < bVar261) * bVar261 | (bVar293 >= bVar261) * bVar293;
      bVar261 = auVar273[9];
      bVar298 = auVar274[9];
      bVar298 = (bVar298 < bVar261) * bVar261 | (bVar298 >= bVar261) * bVar298;
      bVar261 = auVar273[10];
      bVar299 = auVar274[10];
      bVar299 = (bVar299 < bVar261) * bVar261 | (bVar299 >= bVar261) * bVar299;
      bVar261 = auVar273[0xb];
      bVar304 = auVar274[0xb];
      bVar304 = (bVar304 < bVar261) * bVar261 | (bVar304 >= bVar261) * bVar304;
      bVar261 = auVar273[0xc];
      bVar305 = auVar274[0xc];
      bVar305 = (bVar305 < bVar261) * bVar261 | (bVar305 >= bVar261) * bVar305;
      bVar261 = auVar273[0xd];
      bVar310 = auVar274[0xd];
      bVar310 = (bVar310 < bVar261) * bVar261 | (bVar310 >= bVar261) * bVar310;
      bVar261 = auVar273[0xe];
      bVar311 = auVar274[0xe];
      bVar174 = auVar274[0xf];
      bVar311 = (bVar311 < bVar261) * bVar261 | (bVar311 >= bVar261) * bVar311;
      bVar261 = auVar273[0xf];
      bVar174 = (bVar174 < bVar261) * bVar261 | (bVar174 >= bVar261) * bVar174;
      bVar261 = (bVar268 < bVar180) * bVar180 | (bVar268 >= bVar180) * bVar268;
      bVar268 = (bVar275 < bVar181) * bVar181 | (bVar275 >= bVar181) * bVar275;
      bVar275 = (bVar276 < bVar185) * bVar185 | (bVar276 >= bVar185) * bVar276;
      bVar276 = (bVar280 < bVar186) * bVar186 | (bVar280 >= bVar186) * bVar280;
      bVar280 = (bVar281 < bVar190) * bVar190 | (bVar281 >= bVar190) * bVar281;
      bVar281 = (bVar286 < bVar191) * bVar191 | (bVar286 >= bVar191) * bVar286;
      bVar286 = (bVar287 < bVar194) * bVar194 | (bVar287 >= bVar194) * bVar287;
      bVar287 = (bVar292 < bVar195) * bVar195 | (bVar292 >= bVar195) * bVar292;
      bVar292 = (bVar293 < bVar199) * bVar199 | (bVar293 >= bVar199) * bVar293;
      bVar293 = (bVar298 < bVar200) * bVar200 | (bVar298 >= bVar200) * bVar298;
      bVar298 = (bVar299 < bVar203) * bVar203 | (bVar299 >= bVar203) * bVar299;
      bVar299 = (bVar304 < bVar204) * bVar204 | (bVar304 >= bVar204) * bVar304;
      bVar304 = (bVar305 < bVar207) * bVar207 | (bVar305 >= bVar207) * bVar305;
      bVar305 = (bVar310 < bVar208) * bVar208 | (bVar310 >= bVar208) * bVar310;
      bVar310 = (bVar311 < bVar213) * bVar213 | (bVar311 >= bVar213) * bVar311;
      bVar311 = (bVar174 < bVar350) * bVar350 | (bVar174 >= bVar350) * bVar174;
      local_1c8[1] = -((byte)((bVar268 < bVar236) * bVar268 | (bVar268 >= bVar236) * bVar236) ==
                      bVar268);
      local_1c8[0] = -((byte)((bVar261 < bVar315) * bVar261 | (bVar261 >= bVar315) * bVar315) ==
                      bVar261);
      local_1c8[2] = -((byte)((bVar275 < bVar238) * bVar275 | (bVar275 >= bVar238) * bVar238) ==
                      bVar275);
      local_1c8[3] = -((byte)((bVar276 < bVar239) * bVar276 | (bVar276 >= bVar239) * bVar239) ==
                      bVar276);
      local_1c8[4] = -((byte)((bVar280 < bVar242) * bVar280 | (bVar280 >= bVar242) * bVar242) ==
                      bVar280);
      local_1c8[5] = -((byte)((bVar281 < bVar243) * bVar281 | (bVar281 >= bVar243) * bVar243) ==
                      bVar281);
      local_1c8[6] = -((byte)((bVar286 < bVar246) * bVar286 | (bVar286 >= bVar246) * bVar246) ==
                      bVar286);
      local_1c8[7] = -((byte)((bVar287 < bVar247) * bVar287 | (bVar287 >= bVar247) * bVar247) ==
                      bVar287);
      local_1c8[8] = -((byte)((bVar292 < bVar249) * bVar292 | (bVar292 >= bVar249) * bVar249) ==
                      bVar292);
      local_1c8[9] = -((byte)((bVar293 < bVar250) * bVar293 | (bVar293 >= bVar250) * bVar250) ==
                      bVar293);
      local_1c8[10] =
           -((byte)((bVar298 < bVar252) * bVar298 | (bVar298 >= bVar252) * bVar252) == bVar298);
      local_1c8[0xb] =
           -((byte)((bVar299 < bVar253) * bVar299 | (bVar299 >= bVar253) * bVar253) == bVar299);
      local_1c8[0xc] =
           -((byte)((bVar304 < bVar255) * bVar304 | (bVar304 >= bVar255) * bVar255) == bVar304);
      local_1c8[0xd] =
           -((byte)((bVar305 < bVar256) * bVar305 | (bVar305 >= bVar256) * bVar256) == bVar305);
      local_1c8[0xe] =
           -((byte)((bVar310 < bVar258) * bVar310 | (bVar310 >= bVar258) * bVar258) == bVar310);
      local_1c8[0xf] =
           -((byte)((bVar311 < bVar259) * bVar311 | (bVar311 >= bVar259) * bVar259) == bVar311);
      auVar9[0xd] = 0;
      auVar9._0_13_ = auVar2._0_13_;
      auVar9[0xe] = auVar2[7];
      uVar177 = auVar9._13_2_;
      auVar23[0xc] = auVar2[6];
      auVar23._0_12_ = auVar2._0_12_;
      auVar23._13_2_ = uVar177;
      auVar37[0xb] = 0;
      auVar37._0_11_ = auVar2._0_11_;
      auVar37._12_3_ = auVar23._12_3_;
      auVar51[10] = auVar2[5];
      auVar51._0_10_ = auVar2._0_10_;
      auVar51._11_4_ = auVar37._11_4_;
      auVar65[9] = 0;
      auVar65._0_9_ = auVar2._0_9_;
      auVar65._10_5_ = auVar51._10_5_;
      auVar79[8] = auVar2[4];
      auVar79._0_8_ = auVar2._0_8_;
      auVar79._9_6_ = auVar65._9_6_;
      auVar107._7_8_ = 0;
      auVar107._0_7_ = auVar79._8_7_;
      Var108 = CONCAT81(SUB158(auVar107 << 0x40,7),auVar2[3]);
      auVar143._9_6_ = 0;
      auVar143._0_9_ = Var108;
      auVar109._1_10_ = SUB1510(auVar143 << 0x30,5);
      auVar109[0] = auVar2[2];
      auVar144._11_4_ = 0;
      auVar144._0_11_ = auVar109;
      auVar93[2] = auVar2[1];
      auVar93._0_2_ = auVar2._0_2_;
      auVar93._3_12_ = SUB1512(auVar144 << 0x20,3);
      uVar266 = auVar2._0_2_ & 0xff;
      auVar10[0xd] = 0;
      auVar10._0_13_ = auVar179._0_13_;
      auVar10[0xe] = auVar179[7];
      auVar24[0xc] = auVar179[6];
      auVar24._0_12_ = auVar179._0_12_;
      auVar24._13_2_ = auVar10._13_2_;
      auVar38[0xb] = 0;
      auVar38._0_11_ = auVar179._0_11_;
      auVar38._12_3_ = auVar24._12_3_;
      auVar52[10] = auVar179[5];
      auVar52._0_10_ = auVar179._0_10_;
      auVar52._11_4_ = auVar38._11_4_;
      auVar66[9] = 0;
      auVar66._0_9_ = auVar179._0_9_;
      auVar66._10_5_ = auVar52._10_5_;
      auVar80[8] = auVar179[4];
      auVar80._0_8_ = auVar179._0_8_;
      auVar80._9_6_ = auVar66._9_6_;
      auVar110._7_8_ = 0;
      auVar110._0_7_ = auVar80._8_7_;
      Var111 = CONCAT81(SUB158(auVar110 << 0x40,7),auVar179[3]);
      auVar145._9_6_ = 0;
      auVar145._0_9_ = Var111;
      auVar112._1_10_ = SUB1510(auVar145 << 0x30,5);
      auVar112[0] = auVar179[2];
      auVar146._11_4_ = 0;
      auVar146._0_11_ = auVar112;
      auVar94[2] = auVar179[1];
      auVar94._0_2_ = auVar179._0_2_;
      auVar94._3_12_ = SUB1512(auVar146 << 0x20,3);
      uVar228 = auVar179._0_2_ & 0xff;
      auVar11[0xd] = 0;
      auVar11._0_13_ = auVar3._0_13_;
      auVar11[0xe] = auVar3[7];
      uVar176 = auVar11._13_2_;
      auVar25[0xc] = auVar3[6];
      auVar25._0_12_ = auVar3._0_12_;
      auVar25._13_2_ = uVar176;
      auVar39[0xb] = 0;
      auVar39._0_11_ = auVar3._0_11_;
      auVar39._12_3_ = auVar25._12_3_;
      auVar53[10] = auVar3[5];
      auVar53._0_10_ = auVar3._0_10_;
      auVar53._11_4_ = auVar39._11_4_;
      auVar67[9] = 0;
      auVar67._0_9_ = auVar3._0_9_;
      auVar67._10_5_ = auVar53._10_5_;
      auVar81[8] = auVar3[4];
      auVar81._0_8_ = auVar3._0_8_;
      auVar81._9_6_ = auVar67._9_6_;
      auVar113._7_8_ = 0;
      auVar113._0_7_ = auVar81._8_7_;
      Var114 = CONCAT81(SUB158(auVar113 << 0x40,7),auVar3[3]);
      auVar147._9_6_ = 0;
      auVar147._0_9_ = Var114;
      auVar115._1_10_ = SUB1510(auVar147 << 0x30,5);
      auVar115[0] = auVar3[2];
      auVar148._11_4_ = 0;
      auVar148._0_11_ = auVar115;
      auVar95[2] = auVar3[1];
      auVar95._0_2_ = auVar3._0_2_;
      auVar95._3_12_ = SUB1512(auVar148 << 0x20,3);
      uVar267 = auVar3._0_2_ & 0xff;
      auVar12[0xd] = 0;
      auVar12._0_13_ = auVar4._0_13_;
      auVar12[0xe] = auVar4[7];
      uVar184 = auVar12._13_2_;
      auVar26[0xc] = auVar4[6];
      auVar26._0_12_ = auVar4._0_12_;
      auVar26._13_2_ = uVar184;
      auVar40[0xb] = 0;
      auVar40._0_11_ = auVar4._0_11_;
      auVar40._12_3_ = auVar26._12_3_;
      auVar54[10] = auVar4[5];
      auVar54._0_10_ = auVar4._0_10_;
      auVar54._11_4_ = auVar40._11_4_;
      auVar68[9] = 0;
      auVar68._0_9_ = auVar4._0_9_;
      auVar68._10_5_ = auVar54._10_5_;
      auVar82[8] = auVar4[4];
      auVar82._0_8_ = auVar4._0_8_;
      auVar82._9_6_ = auVar68._9_6_;
      auVar116._7_8_ = 0;
      auVar116._0_7_ = auVar82._8_7_;
      Var117 = CONCAT81(SUB158(auVar116 << 0x40,7),auVar4[3]);
      auVar149._9_6_ = 0;
      auVar149._0_9_ = Var117;
      auVar118._1_10_ = SUB1510(auVar149 << 0x30,5);
      auVar118[0] = auVar4[2];
      auVar150._11_4_ = 0;
      auVar150._0_11_ = auVar118;
      auVar96[2] = auVar4[1];
      auVar96._0_2_ = auVar4._0_2_;
      auVar96._3_12_ = SUB1512(auVar150 << 0x20,3);
      uVar316 = auVar4._0_2_ & 0xff;
      auVar13[0xd] = 0;
      auVar13._0_13_ = auVar5._0_13_;
      auVar13[0xe] = auVar5[7];
      uVar189 = auVar13._13_2_;
      auVar27[0xc] = auVar5[6];
      auVar27._0_12_ = auVar5._0_12_;
      auVar27._13_2_ = uVar189;
      auVar41[0xb] = 0;
      auVar41._0_11_ = auVar5._0_11_;
      auVar41._12_3_ = auVar27._12_3_;
      auVar55[10] = auVar5[5];
      auVar55._0_10_ = auVar5._0_10_;
      auVar55._11_4_ = auVar41._11_4_;
      auVar69[9] = 0;
      auVar69._0_9_ = auVar5._0_9_;
      auVar69._10_5_ = auVar55._10_5_;
      auVar83[8] = auVar5[4];
      auVar83._0_8_ = auVar5._0_8_;
      auVar83._9_6_ = auVar69._9_6_;
      auVar119._7_8_ = 0;
      auVar119._0_7_ = auVar83._8_7_;
      Var120 = CONCAT81(SUB158(auVar119 << 0x40,7),auVar5[3]);
      auVar151._9_6_ = 0;
      auVar151._0_9_ = Var120;
      auVar121._1_10_ = SUB1510(auVar151 << 0x30,5);
      auVar121[0] = auVar5[2];
      auVar152._11_4_ = 0;
      auVar152._0_11_ = auVar121;
      auVar97[2] = auVar5[1];
      auVar97._0_2_ = auVar5._0_2_;
      auVar97._3_12_ = SUB1512(auVar152 << 0x20,3);
      uVar226 = auVar5._0_2_ & 0xff;
      auVar14[0xd] = 0;
      auVar14._0_13_ = auVar265._0_13_;
      auVar14[0xe] = auVar265[7];
      auVar28[0xc] = auVar265[6];
      auVar28._0_12_ = auVar265._0_12_;
      auVar28._13_2_ = auVar14._13_2_;
      auVar42[0xb] = 0;
      auVar42._0_11_ = auVar265._0_11_;
      auVar42._12_3_ = auVar28._12_3_;
      auVar56[10] = auVar265[5];
      auVar56._0_10_ = auVar265._0_10_;
      auVar56._11_4_ = auVar42._11_4_;
      auVar70[9] = 0;
      auVar70._0_9_ = auVar265._0_9_;
      auVar70._10_5_ = auVar56._10_5_;
      auVar84[8] = auVar265[4];
      auVar84._0_8_ = auVar265._0_8_;
      auVar84._9_6_ = auVar70._9_6_;
      auVar122._7_8_ = 0;
      auVar122._0_7_ = auVar84._8_7_;
      Var123 = CONCAT81(SUB158(auVar122 << 0x40,7),auVar265[3]);
      auVar153._9_6_ = 0;
      auVar153._0_9_ = Var123;
      auVar124._1_10_ = SUB1510(auVar153 << 0x30,5);
      auVar124[0] = auVar265[2];
      auVar154._11_4_ = 0;
      auVar154._0_11_ = auVar124;
      auVar98[2] = auVar265[1];
      auVar98._0_2_ = auVar265._0_2_;
      auVar98._3_12_ = SUB1512(auVar154 << 0x20,3);
      uVar325 = auVar265._0_2_ & 0xff;
      auVar15[0xd] = 0;
      auVar15._0_13_ = auVar328._0_13_;
      auVar15[0xe] = auVar328[7];
      auVar29[0xc] = auVar328[6];
      auVar29._0_12_ = auVar328._0_12_;
      auVar29._13_2_ = auVar15._13_2_;
      auVar43[0xb] = 0;
      auVar43._0_11_ = auVar328._0_11_;
      auVar43._12_3_ = auVar29._12_3_;
      auVar57[10] = auVar328[5];
      auVar57._0_10_ = auVar328._0_10_;
      auVar57._11_4_ = auVar43._11_4_;
      auVar71[9] = 0;
      auVar71._0_9_ = auVar328._0_9_;
      auVar71._10_5_ = auVar57._10_5_;
      auVar85[8] = auVar328[4];
      auVar85._0_8_ = auVar328._0_8_;
      auVar85._9_6_ = auVar71._9_6_;
      auVar125._7_8_ = 0;
      auVar125._0_7_ = auVar85._8_7_;
      Var126 = CONCAT81(SUB158(auVar125 << 0x40,7),auVar328[3]);
      auVar155._9_6_ = 0;
      auVar155._0_9_ = Var126;
      auVar127._1_10_ = SUB1510(auVar155 << 0x30,5);
      auVar127[0] = auVar328[2];
      auVar156._11_4_ = 0;
      auVar156._0_11_ = auVar127;
      auVar99[2] = auVar328[1];
      auVar99._0_2_ = auVar328._0_2_;
      auVar99._3_12_ = SUB1512(auVar156 << 0x20,3);
      uVar329 = auVar328._0_2_ & 0xff;
      auVar16[0xd] = 0;
      auVar16._0_13_ = auVar6._0_13_;
      auVar16[0xe] = auVar6[7];
      auVar30[0xc] = auVar6[6];
      auVar30._0_12_ = auVar6._0_12_;
      auVar30._13_2_ = auVar16._13_2_;
      auVar44[0xb] = 0;
      auVar44._0_11_ = auVar6._0_11_;
      auVar44._12_3_ = auVar30._12_3_;
      auVar58[10] = auVar6[5];
      auVar58._0_10_ = auVar6._0_10_;
      auVar58._11_4_ = auVar44._11_4_;
      auVar72[9] = 0;
      auVar72._0_9_ = auVar6._0_9_;
      auVar72._10_5_ = auVar58._10_5_;
      auVar86[8] = auVar6[4];
      auVar86._0_8_ = auVar6._0_8_;
      auVar86._9_6_ = auVar72._9_6_;
      auVar128._7_8_ = 0;
      auVar128._0_7_ = auVar86._8_7_;
      Var129 = CONCAT81(SUB158(auVar128 << 0x40,7),auVar6[3]);
      auVar157._9_6_ = 0;
      auVar157._0_9_ = Var129;
      auVar130._1_10_ = SUB1510(auVar157 << 0x30,5);
      auVar130[0] = auVar6[2];
      auVar158._11_4_ = 0;
      auVar158._0_11_ = auVar130;
      auVar100[2] = auVar6[1];
      auVar100._0_2_ = auVar6._0_2_;
      auVar100._3_12_ = SUB1512(auVar158 << 0x20,3);
      uVar330 = auVar6._0_2_ & 0xff;
      uVar351 = (ushort)auVar2[8];
      bVar247 = auVar2[9];
      bVar249 = auVar2[10];
      bVar250 = auVar2[0xb];
      bVar252 = auVar2[0xc];
      bVar253 = auVar2[0xd];
      bVar255 = auVar2[0xe];
      bVar256 = auVar2[0xf];
      uVar269 = (ushort)auVar179[8];
      uVar366 = (ushort)auVar3[8];
      bVar258 = auVar3[10];
      bVar259 = auVar3[0xb];
      bVar261 = auVar3[0xc];
      bVar268 = auVar3[0xd];
      bVar275 = auVar3[0xe];
      bVar276 = auVar3[0xf];
      uVar323 = (ushort)auVar4[8];
      bVar236 = auVar4[10];
      bVar238 = auVar4[0xb];
      bVar239 = auVar4[0xc];
      bVar242 = auVar4[0xd];
      bVar243 = auVar4[0xe];
      bVar246 = auVar4[0xf];
      uVar262 = (ushort)auVar5[8];
      bVar315 = auVar5[9];
      uVar355 = (ushort)auVar265[8];
      uVar326 = (ushort)auVar328[8];
      uVar214 = (ushort)auVar6[8];
      sStack_226 = auVar94._2_2_;
      sStack_224 = auVar112._0_2_;
      sStack_222 = (short)Var111;
      sStack_220 = auVar80._8_2_;
      sStack_21e = auVar52._10_2_;
      sStack_21c = auVar24._12_2_;
      uVar212 = auVar10._13_2_ >> 8;
      sVar277 = auVar95._2_2_;
      sVar282 = auVar115._0_2_;
      sVar288 = (short)Var114;
      sVar294 = auVar81._8_2_;
      sVar300 = auVar53._10_2_;
      sVar306 = auVar25._12_2_;
      uVar198 = uVar176 >> 8;
      sVar240 = auVar97._2_2_;
      sVar317 = auVar96._2_2_;
      sVar244 = auVar121._0_2_;
      sVar318 = auVar118._0_2_;
      sVar248 = (short)Var120;
      sVar319 = (short)Var117;
      sVar251 = auVar83._8_2_;
      sVar320 = auVar82._8_2_;
      sVar254 = auVar55._10_2_;
      sVar321 = auVar54._10_2_;
      sVar257 = auVar27._12_2_;
      sVar322 = auVar26._12_2_;
      uVar210 = uVar184 >> 8;
      sVar260 = (uVar189 >> 8) + uVar210;
      sVar182 = auVar93._2_2_;
      sVar187 = auVar109._0_2_;
      sVar192 = (short)Var108;
      sVar196 = auVar79._8_2_;
      sVar201 = auVar51._10_2_;
      sVar205 = auVar23._12_2_;
      uVar216 = uVar177 >> 8;
      sVar175 = uVar266 * 2 + 4 + uVar226 + uVar316 + uVar267 + uVar228;
      sVar183 = sVar182 * 2 + 4 + sVar240 + sVar317 + sVar277 + sStack_226;
      sVar188 = sVar187 * 2 + 4 + sVar244 + sVar318 + sVar282 + sStack_224;
      sVar193 = sVar192 * 2 + 4 + sVar248 + sVar319 + sVar288 + sStack_222;
      sVar197 = sVar196 * 2 + 4 + sVar251 + sVar320 + sVar294 + sStack_220;
      sVar202 = sVar201 * 2 + 4 + sVar254 + sVar321 + sVar300 + sStack_21e;
      sVar206 = sVar205 * 2 + 4 + sVar257 + sVar322 + sVar306 + sStack_21c;
      sVar209 = uVar216 * 2 + 4 + sVar260 + uVar198 + uVar212;
      uVar245 = (ushort)bVar247;
      uVar333 = (ushort)bVar249;
      uVar359 = (ushort)bVar250;
      uVar360 = (ushort)bVar252;
      uVar361 = (ushort)bVar253;
      uVar362 = (ushort)bVar255;
      uVar363 = (ushort)bVar256;
      uStack_236 = (ushort)auVar179[9];
      uStack_234 = (ushort)auVar179[10];
      uStack_232 = (ushort)auVar179[0xb];
      uStack_230 = (ushort)auVar179[0xc];
      uStack_22e = (ushort)auVar179[0xd];
      uStack_22c = (ushort)auVar179[0xe];
      uStack_22a = (ushort)auVar179[0xf];
      uVar356 = (ushort)auVar3[9];
      sVar283 = bVar258 + uStack_234;
      sVar289 = bVar259 + uStack_232;
      sVar295 = bVar261 + uStack_230;
      sVar301 = bVar268 + uStack_22e;
      sVar307 = bVar275 + uStack_22c;
      sVar312 = bVar276 + uStack_22a;
      uVar241 = (ushort)auVar4[9];
      sVar220 = bVar315 + uVar241;
      uVar211 = (ushort)auVar5[10];
      uVar222 = (ushort)auVar5[0xb];
      uVar225 = (ushort)auVar5[0xc];
      uVar230 = (ushort)auVar5[0xd];
      uVar235 = (ushort)auVar5[0xe];
      uVar334 = (ushort)auVar5[0xf];
      sVar331 = uVar351 * 2 + 4 + uVar262 + uVar323 + uVar366 + uVar269;
      sVar336 = uVar245 * 2 + 4 + sVar220 + uVar356 + uStack_236;
      sVar338 = bVar249 + uVar333 + 4 + uVar211 + bVar236 + sVar283;
      sVar340 = bVar250 + uVar359 + 4 + uVar222 + bVar238 + sVar289;
      sVar342 = bVar252 + uVar360 + 4 + uVar225 + bVar239 + sVar295;
      sVar344 = bVar253 + uVar361 + 4 + uVar230 + bVar242 + sVar301;
      sVar346 = bVar255 + uVar362 + 4 + uVar235 + bVar243 + sVar307;
      sVar348 = bVar256 + uVar363 + 4 + uVar334 + bVar246 + sVar312;
      uVar215 = (ushort)(uVar228 + uVar266 + sVar175) >> 3;
      uVar221 = (ushort)(sStack_226 + sVar182 + sVar183) >> 3;
      uVar223 = (ushort)(sStack_224 + sVar187 + sVar188) >> 3;
      uVar224 = (ushort)(sStack_222 + sVar192 + sVar193) >> 3;
      uVar227 = (ushort)(sStack_220 + sVar196 + sVar197) >> 3;
      uVar229 = (ushort)(sStack_21e + sVar201 + sVar202) >> 3;
      uVar231 = (ushort)(sStack_21c + sVar205 + sVar206) >> 3;
      uVar233 = (ushort)(uVar212 + uVar216 + sVar209) >> 3;
      uVar270 = (ushort)(uVar269 + uVar351 + sVar331) >> 3;
      uVar278 = (ushort)(uStack_236 + uVar245 + sVar336) >> 3;
      uVar284 = (ushort)(uStack_234 + uVar333 + sVar338) >> 3;
      uVar290 = (ushort)(uStack_232 + uVar359 + sVar340) >> 3;
      uVar296 = (ushort)(uStack_230 + uVar360 + sVar342) >> 3;
      uVar302 = (ushort)(uStack_22e + uVar361 + sVar344) >> 3;
      uVar308 = (ushort)(uStack_22c + uVar362 + sVar346) >> 3;
      uVar313 = (ushort)(uStack_22a + uVar363 + sVar348) >> 3;
      auVar273[1] = (uVar221 != 0) * (uVar221 < 0x100) * (char)uVar221 - (0xff < uVar221);
      auVar273[0] = (uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215);
      auVar273[2] = (uVar223 != 0) * (uVar223 < 0x100) * (char)uVar223 - (0xff < uVar223);
      auVar273[3] = (uVar224 != 0) * (uVar224 < 0x100) * (char)uVar224 - (0xff < uVar224);
      auVar273[4] = (uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 - (0xff < uVar227);
      auVar273[5] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
      auVar273[6] = (uVar231 != 0) * (uVar231 < 0x100) * (char)uVar231 - (0xff < uVar231);
      auVar273[7] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
      auVar273[8] = (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270);
      auVar273[9] = (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278);
      auVar273[10] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
      auVar273[0xb] = (uVar290 != 0) * (uVar290 < 0x100) * (char)uVar290 - (0xff < uVar290);
      auVar273[0xc] = (uVar296 != 0) * (uVar296 < 0x100) * (char)uVar296 - (0xff < uVar296);
      auVar273[0xd] = (uVar302 != 0) * (uVar302 < 0x100) * (char)uVar302 - (0xff < uVar302);
      auVar273[0xe] = (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308);
      auVar273[0xf] = (uVar313 != 0) * (uVar313 < 0x100) * (char)uVar313 - (0xff < uVar313);
      auVar273 = ~auVar327 & auVar179 | auVar273 & auVar327;
      sStack_2a6 = auVar98._2_2_;
      sStack_2a4 = auVar124._0_2_;
      sStack_2a2 = (short)Var123;
      sStack_2a0 = auVar84._8_2_;
      sStack_29e = auVar56._10_2_;
      sStack_29c = auVar28._12_2_;
      uVar215 = auVar14._13_2_ >> 8;
      uVar223 = sVar175 + uVar325 + uVar267;
      uVar224 = sVar183 + sStack_2a6 + sVar277;
      uVar227 = sVar188 + sStack_2a4 + sVar282;
      uVar229 = sVar193 + sStack_2a2 + sVar288;
      uVar231 = sVar197 + sStack_2a0 + sVar294;
      uVar233 = sVar202 + sStack_29e + sVar300;
      uVar270 = sVar206 + sStack_29c + sVar306;
      uVar278 = sVar209 + uVar215 + uVar198;
      uStack_2b6 = (ushort)auVar265[9];
      uStack_2b4 = (ushort)auVar265[10];
      uStack_2b2 = (ushort)auVar265[0xb];
      uStack_2b0 = (ushort)auVar265[0xc];
      uStack_2ae = (ushort)auVar265[0xd];
      uStack_2ac = (ushort)auVar265[0xe];
      uStack_2aa = (ushort)auVar265[0xf];
      uVar332 = sVar331 + uVar355 + uVar366;
      uVar337 = sVar336 + uStack_2b6 + uVar356;
      uVar339 = sVar338 + uStack_2b4 + bVar258;
      uVar341 = sVar340 + uStack_2b2 + bVar259;
      uVar343 = sVar342 + uStack_2b0 + bVar261;
      uVar345 = sVar344 + uStack_2ae + bVar268;
      uVar347 = sVar346 + uStack_2ac + bVar275;
      uVar349 = sVar348 + uStack_2aa + bVar276;
      sStack_246 = auVar99._2_2_;
      sStack_244 = auVar127._0_2_;
      sStack_242 = (short)Var126;
      sStack_240 = auVar85._8_2_;
      sStack_23e = auVar57._10_2_;
      sStack_23c = auVar29._12_2_;
      uVar221 = auVar15._13_2_ >> 8;
      uVar284 = (uVar316 - (uVar267 + uVar266)) + uVar329 + uVar223;
      uVar290 = (sVar317 - (sVar277 + sVar182)) + sStack_246 + uVar224;
      uVar296 = (sVar318 - (sVar282 + sVar187)) + sStack_244 + uVar227;
      uVar302 = (sVar319 - (sVar288 + sVar192)) + sStack_242 + uVar229;
      uVar308 = (sVar320 - (sVar294 + sVar196)) + sStack_240 + uVar231;
      uVar313 = (sVar321 - (sVar300 + sVar201)) + sStack_23e + uVar233;
      uVar232 = (sVar322 - (sVar306 + sVar205)) + sStack_23c + uVar270;
      uVar234 = (uVar210 - (uVar198 + uVar216)) + uVar221 + uVar278;
      uVar223 = uVar223 >> 3;
      uVar224 = uVar224 >> 3;
      uVar227 = uVar227 >> 3;
      uVar229 = uVar229 >> 3;
      uVar231 = uVar231 >> 3;
      uVar233 = uVar233 >> 3;
      uVar270 = uVar270 >> 3;
      uVar278 = uVar278 >> 3;
      uStack_1b6 = (ushort)auVar328[9];
      uStack_1b4 = (ushort)auVar328[10];
      uStack_1b2 = (ushort)auVar328[0xb];
      uStack_1b0 = (ushort)auVar328[0xc];
      uStack_1ae = (ushort)auVar328[0xd];
      uStack_1ac = (ushort)auVar328[0xe];
      uStack_1aa = (ushort)auVar328[0xf];
      uVar271 = (uVar323 - (uVar366 + uVar351)) + uVar326 + uVar332;
      uVar279 = (uVar241 - (uVar356 + uVar245)) + uStack_1b6 + uVar337;
      uVar285 = ((ushort)bVar236 - (bVar258 + uVar333)) + uStack_1b4 + uVar339;
      uVar291 = ((ushort)bVar238 - (bVar259 + uVar359)) + uStack_1b2 + uVar341;
      uVar297 = ((ushort)bVar239 - (bVar261 + uVar360)) + uStack_1b0 + uVar343;
      uVar303 = ((ushort)bVar242 - (bVar268 + uVar361)) + uStack_1ae + uVar345;
      uVar309 = ((ushort)bVar243 - (bVar275 + uVar362)) + uStack_1ac + uVar347;
      uVar314 = ((ushort)bVar246 - (bVar276 + uVar363)) + uStack_1aa + uVar349;
      uVar332 = uVar332 >> 3;
      uVar337 = uVar337 >> 3;
      uVar339 = uVar339 >> 3;
      uVar341 = uVar341 >> 3;
      uVar343 = uVar343 >> 3;
      uVar345 = uVar345 >> 3;
      uVar347 = uVar347 >> 3;
      uVar349 = uVar349 >> 3;
      auVar179[1] = (uVar224 != 0) * (uVar224 < 0x100) * (char)uVar224 - (0xff < uVar224);
      auVar179[0] = (uVar223 != 0) * (uVar223 < 0x100) * (char)uVar223 - (0xff < uVar223);
      auVar179[2] = (uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 - (0xff < uVar227);
      auVar179[3] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
      auVar179[4] = (uVar231 != 0) * (uVar231 < 0x100) * (char)uVar231 - (0xff < uVar231);
      auVar179[5] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
      auVar179[6] = (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270);
      auVar179[7] = (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278);
      auVar179[8] = (uVar332 != 0) * (uVar332 < 0x100) * (char)uVar332 - (0xff < uVar332);
      auVar179[9] = (uVar337 != 0) * (uVar337 < 0x100) * (char)uVar337 - (0xff < uVar337);
      auVar179[10] = (uVar339 != 0) * (uVar339 < 0x100) * (char)uVar339 - (0xff < uVar339);
      auVar179[0xb] = (uVar341 != 0) * (uVar341 < 0x100) * (char)uVar341 - (0xff < uVar341);
      auVar179[0xc] = (uVar343 != 0) * (uVar343 < 0x100) * (char)uVar343 - (0xff < uVar343);
      auVar179[0xd] = (uVar345 != 0) * (uVar345 < 0x100) * (char)uVar345 - (0xff < uVar345);
      auVar179[0xe] = (uVar347 != 0) * (uVar347 < 0x100) * (char)uVar347 - (0xff < uVar347);
      auVar179[0xf] = (uVar349 != 0) * (uVar349 < 0x100) * (char)uVar349 - (0xff < uVar349);
      auVar335 = ~auVar327 & (auVar178 ^ _DAT_005134d0) | auVar179 & auVar327;
      uVar189 = uVar189 >> 8;
      sStack_c6 = auVar100._2_2_;
      sStack_c4 = auVar130._0_2_;
      sStack_c2 = (short)Var129;
      sStack_c0 = auVar86._8_2_;
      sStack_be = auVar58._10_2_;
      sStack_bc = auVar30._12_2_;
      uVar223 = auVar16._13_2_ >> 8;
      uVar224 = (uVar226 - (uVar316 + uVar266)) + uVar330 + uVar284;
      uVar227 = (sVar240 - (sVar317 + sVar182)) + sStack_c6 + uVar290;
      uVar229 = (sVar244 - (sVar318 + sVar187)) + sStack_c4 + uVar296;
      uVar231 = (sVar248 - (sVar319 + sVar192)) + sStack_c2 + uVar302;
      uVar233 = (sVar251 - (sVar320 + sVar196)) + sStack_c0 + uVar308;
      uVar270 = (sVar254 - (sVar321 + sVar201)) + sStack_be + uVar313;
      uVar278 = (sVar257 - (sVar322 + sVar205)) + sStack_bc + uVar232;
      uVar210 = (uVar189 - (uVar210 + uVar216)) + uVar223 + uVar234;
      uVar284 = uVar284 >> 3;
      uVar290 = uVar290 >> 3;
      uVar296 = uVar296 >> 3;
      uVar302 = uVar302 >> 3;
      uVar308 = uVar308 >> 3;
      uVar313 = uVar313 >> 3;
      uVar232 = uVar232 >> 3;
      uVar234 = uVar234 >> 3;
      uStack_d6 = (ushort)auVar6[9];
      uStack_d4 = (ushort)auVar6[10];
      uStack_d2 = (ushort)auVar6[0xb];
      uStack_d0 = (ushort)auVar6[0xc];
      uStack_ce = (ushort)auVar6[0xd];
      uStack_cc = (ushort)auVar6[0xe];
      uStack_ca = (ushort)auVar6[0xf];
      uVar332 = (uVar262 - (uVar323 + uVar351)) + uVar214 + uVar271;
      uVar241 = ((ushort)bVar315 - (uVar241 + uVar245)) + uStack_d6 + uVar279;
      uVar245 = (uVar211 - (bVar236 + uVar333)) + uStack_d4 + uVar285;
      uVar337 = (uVar222 - (bVar238 + uVar359)) + uStack_d2 + uVar291;
      uVar339 = (uVar225 - (bVar239 + uVar360)) + uStack_d0 + uVar297;
      uVar341 = (uVar230 - (bVar242 + uVar361)) + uStack_ce + uVar303;
      uVar343 = (uVar235 - (bVar243 + uVar362)) + uStack_cc + uVar309;
      uVar345 = (uVar334 - (bVar246 + uVar363)) + uStack_ca + uVar314;
      uVar271 = uVar271 >> 3;
      uVar279 = uVar279 >> 3;
      uVar285 = uVar285 >> 3;
      uVar291 = uVar291 >> 3;
      uVar297 = uVar297 >> 3;
      uVar303 = uVar303 >> 3;
      uVar309 = uVar309 >> 3;
      uVar314 = uVar314 >> 3;
      auVar274[1] = (uVar290 != 0) * (uVar290 < 0x100) * (char)uVar290 - (0xff < uVar290);
      auVar274[0] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
      auVar274[2] = (uVar296 != 0) * (uVar296 < 0x100) * (char)uVar296 - (0xff < uVar296);
      auVar274[3] = (uVar302 != 0) * (uVar302 < 0x100) * (char)uVar302 - (0xff < uVar302);
      auVar274[4] = (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308);
      auVar274[5] = (uVar313 != 0) * (uVar313 < 0x100) * (char)uVar313 - (0xff < uVar313);
      auVar274[6] = (uVar232 != 0) * (uVar232 < 0x100) * (char)uVar232 - (0xff < uVar232);
      auVar274[7] = (uVar234 != 0) * (uVar234 < 0x100) * (char)uVar234 - (0xff < uVar234);
      auVar274[8] = (uVar271 != 0) * (uVar271 < 0x100) * (char)uVar271 - (0xff < uVar271);
      auVar274[9] = (uVar279 != 0) * (uVar279 < 0x100) * (char)uVar279 - (0xff < uVar279);
      auVar274[10] = (uVar285 != 0) * (uVar285 < 0x100) * (char)uVar285 - (0xff < uVar285);
      auVar274[0xb] = (uVar291 != 0) * (uVar291 < 0x100) * (char)uVar291 - (0xff < uVar291);
      auVar274[0xc] = (uVar297 != 0) * (uVar297 < 0x100) * (char)uVar297 - (0xff < uVar297);
      auVar274[0xd] = (uVar303 != 0) * (uVar303 < 0x100) * (char)uVar303 - (0xff < uVar303);
      auVar274[0xe] = (uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 - (0xff < uVar309);
      auVar274[0xf] = (uVar314 != 0) * (uVar314 < 0x100) * (char)uVar314 - (0xff < uVar314);
      auVar263 = ~auVar327 & auVar263 | auVar274 & auVar327;
      uVar216 = (uVar325 - (uVar226 + uVar228)) + uVar330 + uVar224;
      uVar284 = (sStack_2a6 - (sVar240 + sStack_226)) + sStack_c6 + uVar227;
      uVar290 = (sStack_2a4 - (sVar244 + sStack_224)) + sStack_c4 + uVar229;
      uVar296 = (sStack_2a2 - (sVar248 + sStack_222)) + sStack_c2 + uVar231;
      uVar302 = (sStack_2a0 - (sVar251 + sStack_220)) + sStack_c0 + uVar233;
      uVar308 = (sStack_29e - (sVar254 + sStack_21e)) + sStack_be + uVar270;
      uVar313 = (sStack_29c - (sVar257 + sStack_21c)) + sStack_bc + uVar278;
      uVar232 = (uVar215 - (uVar189 + uVar212)) + uVar223 + uVar210;
      uVar224 = uVar224 >> 3;
      uVar227 = uVar227 >> 3;
      uVar229 = uVar229 >> 3;
      uVar231 = uVar231 >> 3;
      uVar233 = uVar233 >> 3;
      uVar270 = uVar270 >> 3;
      uVar278 = uVar278 >> 3;
      uVar210 = uVar210 >> 3;
      uVar234 = (uVar355 - (uVar262 + uVar269)) + uVar214 + uVar332;
      uVar271 = (uStack_2b6 - (bVar315 + uStack_236)) + uStack_d6 + uVar241;
      uVar279 = (uStack_2b4 - (uVar211 + uStack_234)) + uStack_d4 + uVar245;
      uVar285 = (uStack_2b2 - (uVar222 + uStack_232)) + uStack_d2 + uVar337;
      uVar291 = (uStack_2b0 - (uVar225 + uStack_230)) + uStack_d0 + uVar339;
      uVar297 = (uStack_2ae - (uVar230 + uStack_22e)) + uStack_ce + uVar341;
      uVar303 = (uStack_2ac - (uVar235 + uStack_22c)) + uStack_cc + uVar343;
      uVar309 = (uStack_2aa - (uVar334 + uStack_22a)) + uStack_ca + uVar345;
      uVar332 = uVar332 >> 3;
      uVar241 = uVar241 >> 3;
      uVar245 = uVar245 >> 3;
      uVar337 = uVar337 >> 3;
      uVar339 = uVar339 >> 3;
      uVar341 = uVar341 >> 3;
      uVar343 = uVar343 >> 3;
      uVar345 = uVar345 >> 3;
      auVar265[1] = (uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 - (0xff < uVar227);
      auVar265[0] = (uVar224 != 0) * (uVar224 < 0x100) * (char)uVar224 - (0xff < uVar224);
      auVar265[2] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
      auVar265[3] = (uVar231 != 0) * (uVar231 < 0x100) * (char)uVar231 - (0xff < uVar231);
      auVar265[4] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
      auVar265[5] = (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270);
      auVar265[6] = (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278);
      auVar265[7] = (uVar210 != 0) * (uVar210 < 0x100) * (char)uVar210 - (0xff < uVar210);
      auVar265[8] = (uVar332 != 0) * (uVar332 < 0x100) * (char)uVar332 - (0xff < uVar332);
      auVar265[9] = (uVar241 != 0) * (uVar241 < 0x100) * (char)uVar241 - (0xff < uVar241);
      auVar265[10] = (uVar245 != 0) * (uVar245 < 0x100) * (char)uVar245 - (0xff < uVar245);
      auVar265[0xb] = (uVar337 != 0) * (uVar337 < 0x100) * (char)uVar337 - (0xff < uVar337);
      auVar265[0xc] = (uVar339 != 0) * (uVar339 < 0x100) * (char)uVar339 - (0xff < uVar339);
      auVar265[0xd] = (uVar341 != 0) * (uVar341 < 0x100) * (char)uVar341 - (0xff < uVar341);
      auVar265[0xe] = (uVar343 != 0) * (uVar343 < 0x100) * (char)uVar343 - (0xff < uVar343);
      auVar265[0xf] = (uVar345 != 0) * (uVar345 < 0x100) * (char)uVar345 - (0xff < uVar345);
      auVar265 = ~auVar327 & auVar353 | auVar265 & auVar327;
      uVar210 = uVar216 >> 3;
      uVar224 = uVar284 >> 3;
      uVar227 = uVar290 >> 3;
      uVar229 = uVar296 >> 3;
      uVar231 = uVar302 >> 3;
      uVar233 = uVar308 >> 3;
      uVar270 = uVar313 >> 3;
      uVar278 = uVar232 >> 3;
      uVar332 = uVar234 >> 3;
      uVar241 = uVar271 >> 3;
      uVar245 = uVar279 >> 3;
      uVar337 = uVar285 >> 3;
      uVar339 = uVar291 >> 3;
      uVar341 = uVar297 >> 3;
      uVar343 = uVar303 >> 3;
      uVar345 = uVar309 >> 3;
      auVar219[1] = (uVar224 != 0) * (uVar224 < 0x100) * (char)uVar224 - (0xff < uVar224);
      auVar219[0] = (uVar210 != 0) * (uVar210 < 0x100) * (char)uVar210 - (0xff < uVar210);
      auVar219[2] = (uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 - (0xff < uVar227);
      auVar219[3] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
      auVar219[4] = (uVar231 != 0) * (uVar231 < 0x100) * (char)uVar231 - (0xff < uVar231);
      auVar219[5] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
      auVar219[6] = (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270);
      auVar219[7] = (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278);
      auVar219[8] = (uVar332 != 0) * (uVar332 < 0x100) * (char)uVar332 - (0xff < uVar332);
      auVar219[9] = (uVar241 != 0) * (uVar241 < 0x100) * (char)uVar241 - (0xff < uVar241);
      auVar219[10] = (uVar245 != 0) * (uVar245 < 0x100) * (char)uVar245 - (0xff < uVar245);
      auVar219[0xb] = (uVar337 != 0) * (uVar337 < 0x100) * (char)uVar337 - (0xff < uVar337);
      auVar219[0xc] = (uVar339 != 0) * (uVar339 < 0x100) * (char)uVar339 - (0xff < uVar339);
      auVar219[0xd] = (uVar341 != 0) * (uVar341 < 0x100) * (char)uVar341 - (0xff < uVar341);
      auVar219[0xe] = (uVar343 != 0) * (uVar343 < 0x100) * (char)uVar343 - (0xff < uVar343);
      auVar219[0xf] = (uVar345 != 0) * (uVar345 < 0x100) * (char)uVar345 - (0xff < uVar345);
      auVar178 = ~auVar327 & auVar217 | auVar219 & auVar327;
      uVar210 = (ushort)((uVar329 - (uVar325 + uVar267)) + uVar330 + uVar216) >> 3;
      uVar216 = (ushort)((sStack_246 - (sStack_2a6 + sVar277)) + sStack_c6 + uVar284) >> 3;
      uVar224 = (ushort)((sStack_244 - (sStack_2a4 + sVar282)) + sStack_c4 + uVar290) >> 3;
      uVar227 = (ushort)((sStack_242 - (sStack_2a2 + sVar288)) + sStack_c2 + uVar296) >> 3;
      uVar229 = (ushort)((sStack_240 - (sStack_2a0 + sVar294)) + sStack_c0 + uVar302) >> 3;
      uVar231 = (ushort)((sStack_23e - (sStack_29e + sVar300)) + sStack_be + uVar308) >> 3;
      uVar233 = (ushort)((sStack_23c - (sStack_29c + sVar306)) + sStack_bc + uVar313) >> 3;
      uVar270 = (ushort)((uVar221 - (uVar215 + uVar198)) + uVar223 + uVar232) >> 3;
      uVar278 = (ushort)((uVar326 - (uVar355 + uVar366)) + uVar214 + uVar234) >> 3;
      uVar284 = (ushort)((uStack_1b6 - (uStack_2b6 + uVar356)) + uStack_d6 + uVar271) >> 3;
      uVar290 = (ushort)((uStack_1b4 - (uStack_2b4 + bVar258)) + uStack_d4 + uVar279) >> 3;
      uVar296 = (ushort)((uStack_1b2 - (uStack_2b2 + bVar259)) + uStack_d2 + uVar285) >> 3;
      uVar302 = (ushort)((uStack_1b0 - (uStack_2b0 + bVar261)) + uStack_d0 + uVar291) >> 3;
      uVar308 = (ushort)((uStack_1ae - (uStack_2ae + bVar268)) + uStack_ce + uVar297) >> 3;
      uVar313 = (ushort)((uStack_1ac - (uStack_2ac + bVar275)) + uStack_cc + uVar303) >> 3;
      uVar232 = (ushort)((uStack_1aa - (uStack_2aa + bVar276)) + uStack_ca + uVar309) >> 3;
      auVar264[1] = (uVar216 != 0) * (uVar216 < 0x100) * (char)uVar216 - (0xff < uVar216);
      auVar264[0] = (uVar210 != 0) * (uVar210 < 0x100) * (char)uVar210 - (0xff < uVar210);
      auVar264[2] = (uVar224 != 0) * (uVar224 < 0x100) * (char)uVar224 - (0xff < uVar224);
      auVar264[3] = (uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 - (0xff < uVar227);
      auVar264[4] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
      auVar264[5] = (uVar231 != 0) * (uVar231 < 0x100) * (char)uVar231 - (0xff < uVar231);
      auVar264[6] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
      auVar264[7] = (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270);
      auVar264[8] = (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278);
      auVar264[9] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
      auVar264[10] = (uVar290 != 0) * (uVar290 < 0x100) * (char)uVar290 - (0xff < uVar290);
      auVar264[0xb] = (uVar296 != 0) * (uVar296 < 0x100) * (char)uVar296 - (0xff < uVar296);
      auVar264[0xc] = (uVar302 != 0) * (uVar302 < 0x100) * (char)uVar302 - (0xff < uVar302);
      auVar264[0xd] = (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308);
      auVar264[0xe] = (uVar313 != 0) * (uVar313 < 0x100) * (char)uVar313 - (0xff < uVar313);
      auVar264[0xf] = (uVar232 != 0) * (uVar232 < 0x100) * (char)uVar232 - (0xff < uVar232);
      local_1c8 = local_1c8 & auVar327;
      auVar328 = ~auVar327 & auVar328 | auVar264 & auVar327;
      auVar179 = psllw(local_1c8,7);
      if ((((((((((((((((auVar179 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar179 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar179 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar179 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar179 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar179 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar179 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar179 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar179 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar179 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar179 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar179 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar179 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar179 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar179 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar179[0xf]
         ) {
        local_178 = auVar273._0_8_;
        uStack_170 = auVar273._8_8_;
        *(undefined8 *)(s + lVar173 * -3) = local_178;
        *(undefined8 *)(s + lVar173 * -3 + 8) = uStack_170;
        local_188 = auVar335._0_8_;
        uStack_180 = auVar335._8_8_;
        *(undefined8 *)(s + lVar172) = local_188;
        *(undefined8 *)(s + lVar172 + 8) = uStack_180;
        *(undefined1 (*) [16])(s + lVar171) = auVar263;
        *(undefined1 (*) [16])s = auVar265;
        local_198 = auVar178._0_8_;
        uStack_190 = auVar178._8_8_;
        *(undefined8 *)(s + lVar173) = local_198;
        *(undefined8 *)(s + lVar173 + 8) = uStack_190;
        local_218 = auVar328._0_8_;
        uStack_210 = auVar328._8_8_;
        *(undefined8 *)(s + lVar173 * 2) = local_218;
        *(undefined8 *)(s + lVar173 * 2 + 8) = uStack_210;
      }
      else {
        auVar17[0xd] = 0;
        auVar17._0_13_ = auVar218._0_13_;
        auVar17[0xe] = auVar218[7];
        uVar210 = auVar17._13_2_;
        auVar31[0xc] = auVar218[6];
        auVar31._0_12_ = auVar218._0_12_;
        auVar31._13_2_ = uVar210;
        auVar45[0xb] = 0;
        auVar45._0_11_ = auVar218._0_11_;
        auVar45._12_3_ = auVar31._12_3_;
        auVar59[10] = auVar218[5];
        auVar59._0_10_ = auVar218._0_10_;
        auVar59._11_4_ = auVar45._11_4_;
        auVar73[9] = 0;
        auVar73._0_9_ = auVar218._0_9_;
        auVar73._10_5_ = auVar59._10_5_;
        auVar87[8] = auVar218[4];
        auVar87._0_8_ = auVar218._0_8_;
        auVar87._9_6_ = auVar73._9_6_;
        auVar131._7_8_ = 0;
        auVar131._0_7_ = auVar87._8_7_;
        Var108 = CONCAT81(SUB158(auVar131 << 0x40,7),auVar218[3]);
        auVar159._9_6_ = 0;
        auVar159._0_9_ = Var108;
        auVar132._1_10_ = SUB1510(auVar159 << 0x30,5);
        auVar132[0] = auVar218[2];
        auVar160._11_4_ = 0;
        auVar160._0_11_ = auVar132;
        auVar101[2] = auVar218[1];
        auVar101._0_2_ = auVar218._0_2_;
        auVar101._3_12_ = SUB1512(auVar160 << 0x20,3);
        auVar358._0_2_ = auVar218._0_2_ & 0xff;
        auVar358._2_13_ = auVar101._2_13_;
        auVar358[0xf] = 0;
        auVar18[0xd] = 0;
        auVar18._0_13_ = auVar237._0_13_;
        auVar18[0xe] = auVar237[7];
        uVar216 = auVar18._13_2_;
        auVar32[0xc] = auVar237[6];
        auVar32._0_12_ = auVar237._0_12_;
        auVar32._13_2_ = uVar216;
        auVar46[0xb] = 0;
        auVar46._0_11_ = auVar237._0_11_;
        auVar46._12_3_ = auVar32._12_3_;
        auVar60[10] = auVar237[5];
        auVar60._0_10_ = auVar237._0_10_;
        auVar60._11_4_ = auVar46._11_4_;
        auVar74[9] = 0;
        auVar74._0_9_ = auVar237._0_9_;
        auVar74._10_5_ = auVar60._10_5_;
        auVar88[8] = auVar237[4];
        auVar88._0_8_ = auVar237._0_8_;
        auVar88._9_6_ = auVar74._9_6_;
        auVar133._7_8_ = 0;
        auVar133._0_7_ = auVar88._8_7_;
        Var111 = CONCAT81(SUB158(auVar133 << 0x40,7),auVar237[3]);
        auVar161._9_6_ = 0;
        auVar161._0_9_ = Var111;
        auVar134._1_10_ = SUB1510(auVar161 << 0x30,5);
        auVar134[0] = auVar237[2];
        auVar162._11_4_ = 0;
        auVar162._0_11_ = auVar134;
        auVar102[2] = auVar237[1];
        auVar102._0_2_ = auVar237._0_2_;
        auVar102._3_12_ = SUB1512(auVar162 << 0x20,3);
        uVar333 = auVar237._0_2_ & 0xff;
        auVar19[0xd] = 0;
        auVar19._0_13_ = auVar272._0_13_;
        auVar19[0xe] = auVar272[7];
        uVar224 = auVar19._13_2_;
        auVar33[0xc] = auVar272[6];
        auVar33._0_12_ = auVar272._0_12_;
        auVar33._13_2_ = uVar224;
        auVar47[0xb] = 0;
        auVar47._0_11_ = auVar272._0_11_;
        auVar47._12_3_ = auVar33._12_3_;
        auVar61[10] = auVar272[5];
        auVar61._0_10_ = auVar272._0_10_;
        auVar61._11_4_ = auVar47._11_4_;
        auVar75[9] = 0;
        auVar75._0_9_ = auVar272._0_9_;
        auVar75._10_5_ = auVar61._10_5_;
        auVar89[8] = auVar272[4];
        auVar89._0_8_ = auVar272._0_8_;
        auVar89._9_6_ = auVar75._9_6_;
        auVar135._7_8_ = 0;
        auVar135._0_7_ = auVar89._8_7_;
        Var114 = CONCAT81(SUB158(auVar135 << 0x40,7),auVar272[3]);
        auVar163._9_6_ = 0;
        auVar163._0_9_ = Var114;
        auVar136._1_10_ = SUB1510(auVar163 << 0x30,5);
        auVar136[0] = auVar272[2];
        auVar164._11_4_ = 0;
        auVar164._0_11_ = auVar136;
        auVar103[2] = auVar272[1];
        auVar103._0_2_ = auVar272._0_2_;
        auVar103._3_12_ = SUB1512(auVar164 << 0x20,3);
        uVar367 = auVar272._0_2_ & 0xff;
        auVar20[0xd] = 0;
        auVar20._0_13_ = auVar357._0_13_;
        auVar20[0xe] = auVar357[7];
        auVar34[0xc] = auVar357[6];
        auVar34._0_12_ = auVar357._0_12_;
        auVar34._13_2_ = auVar20._13_2_;
        auVar48[0xb] = 0;
        auVar48._0_11_ = auVar357._0_11_;
        auVar48._12_3_ = auVar34._12_3_;
        auVar62[10] = auVar357[5];
        auVar62._0_10_ = auVar357._0_10_;
        auVar62._11_4_ = auVar48._11_4_;
        auVar76[9] = 0;
        auVar76._0_9_ = auVar357._0_9_;
        auVar76._10_5_ = auVar62._10_5_;
        auVar90[8] = auVar357[4];
        auVar90._0_8_ = auVar357._0_8_;
        auVar90._9_6_ = auVar76._9_6_;
        auVar137._7_8_ = 0;
        auVar137._0_7_ = auVar90._8_7_;
        Var117 = CONCAT81(SUB158(auVar137 << 0x40,7),auVar357[3]);
        auVar165._9_6_ = 0;
        auVar165._0_9_ = Var117;
        auVar138._1_10_ = SUB1510(auVar165 << 0x30,5);
        auVar138[0] = auVar357[2];
        auVar166._11_4_ = 0;
        auVar166._0_11_ = auVar138;
        auVar104[2] = auVar357[1];
        auVar104._0_2_ = auVar357._0_2_;
        auVar104._3_12_ = SUB1512(auVar166 << 0x20,3);
        uVar347 = auVar357._0_2_ & 0xff;
        auVar21[0xd] = 0;
        auVar21._0_13_ = auVar369._0_13_;
        auVar21[0xe] = auVar369[7];
        auVar35[0xc] = auVar369[6];
        auVar35._0_12_ = auVar369._0_12_;
        auVar35._13_2_ = auVar21._13_2_;
        auVar49[0xb] = 0;
        auVar49._0_11_ = auVar369._0_11_;
        auVar49._12_3_ = auVar35._12_3_;
        auVar63[10] = auVar369[5];
        auVar63._0_10_ = auVar369._0_10_;
        auVar63._11_4_ = auVar49._11_4_;
        auVar77[9] = 0;
        auVar77._0_9_ = auVar369._0_9_;
        auVar77._10_5_ = auVar63._10_5_;
        auVar91[8] = auVar369[4];
        auVar91._0_8_ = auVar369._0_8_;
        auVar91._9_6_ = auVar77._9_6_;
        auVar139._7_8_ = 0;
        auVar139._0_7_ = auVar91._8_7_;
        Var120 = CONCAT81(SUB158(auVar139 << 0x40,7),auVar369[3]);
        auVar167._9_6_ = 0;
        auVar167._0_9_ = Var120;
        auVar140._1_10_ = SUB1510(auVar167 << 0x30,5);
        auVar140[0] = auVar369[2];
        auVar168._11_4_ = 0;
        auVar168._0_11_ = auVar140;
        auVar105[2] = auVar369[1];
        auVar105._0_2_ = auVar369._0_2_;
        auVar105._3_12_ = SUB1512(auVar168 << 0x20,3);
        uVar343 = auVar369._0_2_ & 0xff;
        auVar22[0xd] = 0;
        auVar22._0_13_ = auVar7._0_13_;
        auVar22[0xe] = auVar7[7];
        auVar36[0xc] = auVar7[6];
        auVar36._0_12_ = auVar7._0_12_;
        auVar36._13_2_ = auVar22._13_2_;
        auVar50[0xb] = 0;
        auVar50._0_11_ = auVar7._0_11_;
        auVar50._12_3_ = auVar36._12_3_;
        auVar64[10] = auVar7[5];
        auVar64._0_10_ = auVar7._0_10_;
        auVar64._11_4_ = auVar50._11_4_;
        auVar78[9] = 0;
        auVar78._0_9_ = auVar7._0_9_;
        auVar78._10_5_ = auVar64._10_5_;
        auVar92[8] = auVar7[4];
        auVar92._0_8_ = auVar7._0_8_;
        auVar92._9_6_ = auVar78._9_6_;
        auVar141._7_8_ = 0;
        auVar141._0_7_ = auVar92._8_7_;
        Var123 = CONCAT81(SUB158(auVar141 << 0x40,7),auVar7[3]);
        auVar169._9_6_ = 0;
        auVar169._0_9_ = Var123;
        auVar142._1_10_ = SUB1510(auVar169 << 0x30,5);
        auVar142[0] = auVar7[2];
        auVar170._11_4_ = 0;
        auVar170._0_11_ = auVar142;
        auVar106[2] = auVar7[1];
        auVar106._0_2_ = auVar7._0_2_;
        auVar106._3_12_ = SUB1512(auVar170 << 0x20,3);
        uVar345 = auVar7._0_2_ & 0xff;
        auVar324._0_2_ = CONCAT11(0,auVar218[8]);
        bVar304 = auVar218[9];
        auVar324[2] = bVar304;
        auVar324[3] = 0;
        bVar305 = auVar218[10];
        auVar324[4] = bVar305;
        auVar324[5] = 0;
        bVar310 = auVar218[0xb];
        auVar324[6] = bVar310;
        auVar324[7] = 0;
        bVar311 = auVar218[0xc];
        auVar324[8] = bVar311;
        auVar324[9] = 0;
        bVar174 = auVar218[0xd];
        auVar324[10] = bVar174;
        auVar324[0xb] = 0;
        bVar180 = auVar218[0xe];
        auVar324[0xc] = bVar180;
        auVar324[0xd] = 0;
        bVar181 = auVar218[0xf];
        auVar324[0xe] = bVar181;
        auVar324[0xf] = 0;
        uVar314 = (ushort)auVar237[8];
        bVar281 = auVar237[9];
        bVar286 = auVar237[10];
        bVar287 = auVar237[0xb];
        bVar292 = auVar237[0xc];
        bVar293 = auVar237[0xd];
        bVar298 = auVar237[0xe];
        bVar299 = auVar237[0xf];
        uVar352 = (ushort)auVar272[8];
        bVar203 = auVar272[9];
        bVar204 = auVar272[10];
        bVar207 = auVar272[0xb];
        bVar208 = auVar272[0xc];
        bVar213 = auVar272[0xd];
        bVar350 = auVar272[0xe];
        bVar354 = auVar272[0xf];
        bVar185 = auVar357[8];
        bVar186 = auVar357[9];
        bVar190 = auVar357[10];
        bVar191 = auVar357[0xb];
        bVar194 = auVar357[0xc];
        bVar195 = auVar357[0xd];
        bVar199 = auVar357[0xe];
        bVar200 = auVar357[0xf];
        bVar280 = auVar369[8];
        uVar349 = (ushort)auVar7[8];
        uVar177 = uVar177 >> 8;
        sVar183 = auVar102._2_2_;
        sVar346 = auVar103._2_2_;
        sVar188 = auVar134._0_2_;
        sVar348 = auVar136._0_2_;
        sVar193 = (short)Var111;
        sVar372 = (short)Var114;
        sVar197 = auVar88._8_2_;
        sVar374 = auVar89._8_2_;
        sVar202 = auVar60._10_2_;
        sVar376 = auVar61._10_2_;
        sVar206 = auVar32._12_2_;
        sVar378 = auVar33._12_2_;
        auVar179 = psllw(auVar358,3);
        sVar331 = auVar101._2_2_;
        sVar336 = auVar132._0_2_;
        sVar338 = (short)Var108;
        sVar340 = auVar87._8_2_;
        sVar342 = auVar59._10_2_;
        sVar344 = auVar31._12_2_;
        uVar227 = uVar210 >> 8;
        uVar232 = (auVar179._0_2_ - auVar358._0_2_) + 8 +
                  uVar267 + uVar228 + uVar266 + uVar226 + uVar316 + (uVar367 + uVar333) * 2;
        uVar234 = (auVar179._2_2_ - sVar331) + 8 +
                  sVar277 + sStack_226 + sVar182 + sVar240 + sVar317 + (sVar346 + sVar183) * 2;
        uVar332 = (auVar179._4_2_ - sVar336) + 8 +
                  sVar282 + sStack_224 + sVar187 + sVar244 + sVar318 + (sVar348 + sVar188) * 2;
        uVar241 = (auVar179._6_2_ - sVar338) + 8 +
                  sVar288 + sStack_222 + sVar192 + sVar248 + sVar319 + (sVar372 + sVar193) * 2;
        uVar245 = (auVar179._8_2_ - sVar340) + 8 +
                  sVar294 + sStack_220 + sVar196 + sVar251 + sVar320 + (sVar374 + sVar197) * 2;
        uVar337 = (auVar179._10_2_ - sVar342) + 8 +
                  sVar300 + sStack_21e + sVar201 + sVar254 + sVar321 + (sVar376 + sVar202) * 2;
        uVar339 = (auVar179._12_2_ - sVar344) + 8 +
                  sVar306 + sStack_21c + sVar205 + sVar257 + sVar322 + (sVar378 + sVar206) * 2;
        uVar341 = (auVar179._14_2_ - uVar227) + 8 +
                  uVar198 + uVar212 + uVar177 + sVar260 + ((uVar224 >> 8) + (uVar216 >> 8)) * 2;
        uStack_266 = (ushort)bVar247;
        uStack_264 = (ushort)bVar249;
        uStack_262 = (ushort)bVar250;
        uStack_260 = (ushort)bVar252;
        uStack_25e = (ushort)bVar253;
        uStack_25c = (ushort)bVar255;
        uStack_25a = (ushort)bVar256;
        auVar179 = psllw(auVar324,3);
        uVar271 = (ushort)bVar304;
        uVar279 = (ushort)bVar305;
        uVar285 = (ushort)bVar310;
        uVar291 = (ushort)bVar311;
        uVar297 = (ushort)bVar174;
        uVar303 = (ushort)bVar180;
        uVar309 = (ushort)bVar181;
        uVar229 = (auVar179._0_2_ - auVar324._0_2_) + 8 +
                  uVar366 + uVar269 + uVar351 + uVar262 + uVar323 + (uVar352 + uVar314) * 2;
        uVar231 = (auVar179._2_2_ - uVar271) + 8 +
                  uVar356 + uStack_236 + uStack_266 + sVar220 +
                  ((ushort)bVar203 + (ushort)bVar281) * 2;
        uVar233 = (auVar179._4_2_ - uVar279) + 8 +
                  sVar283 + uStack_264 + uVar211 + bVar236 + ((ushort)bVar204 + (ushort)bVar286) * 2
        ;
        uVar270 = (auVar179._6_2_ - uVar285) + 8 +
                  sVar289 + uStack_262 + uVar222 + bVar238 + ((ushort)bVar207 + (ushort)bVar287) * 2
        ;
        uVar278 = (auVar179._8_2_ - uVar291) + 8 +
                  sVar295 + uStack_260 + uVar225 + bVar239 + ((ushort)bVar208 + (ushort)bVar292) * 2
        ;
        uVar284 = (auVar179._10_2_ - uVar297) + 8 +
                  sVar301 + uStack_25e + uVar230 + bVar242 + ((ushort)bVar213 + (ushort)bVar293) * 2
        ;
        uVar290 = (auVar179._12_2_ - uVar303) + 8 +
                  sVar307 + uStack_25c + uVar235 + bVar243 + ((ushort)bVar350 + (ushort)bVar298) * 2
        ;
        uVar211 = (auVar179._14_2_ - uVar309) + 8 +
                  sVar312 + uStack_25a + uVar334 + bVar246 + ((ushort)bVar354 + (ushort)bVar299) * 2
        ;
        sVar209 = (short)Var117;
        uVar198 = auVar20._13_2_ >> 8;
        uStack_156 = (ushort)auVar4[9];
        uStack_154 = (ushort)bVar236;
        uStack_152 = (ushort)bVar238;
        uStack_150 = (ushort)bVar239;
        uStack_14e = (ushort)bVar242;
        uStack_14c = (ushort)bVar243;
        uStack_14a = (ushort)bVar246;
        uVar368 = uVar325 + uVar266 + auVar358._0_2_ * -2 + uVar232;
        uVar370 = sStack_2a6 + sVar182 + sVar331 * -2 + uVar234;
        uVar371 = sStack_2a4 + sVar187 + sVar336 * -2 + uVar332;
        uVar373 = sStack_2a2 + sVar192 + sVar338 * -2 + uVar241;
        uVar375 = sStack_2a0 + sVar196 + sVar340 * -2 + uVar245;
        uVar377 = sStack_29e + sVar201 + sVar342 * -2 + uVar337;
        uVar379 = sStack_29c + sVar205 + sVar344 * -2 + uVar339;
        uVar380 = uVar215 + uVar177 + uVar227 * -2 + uVar341;
        uVar232 = uVar232 >> 4;
        uVar234 = uVar234 >> 4;
        uVar332 = uVar332 >> 4;
        uVar241 = uVar241 >> 4;
        uVar245 = uVar245 >> 4;
        uVar337 = uVar337 >> 4;
        uVar339 = uVar339 >> 4;
        uVar341 = uVar341 >> 4;
        uVar296 = uVar355 + uVar351 + auVar324._0_2_ * -2 + uVar229;
        uVar222 = uStack_2b6 + uStack_266 + uVar271 * -2 + uVar231;
        uVar302 = ((uStack_2b4 + uStack_264) - (bVar305 + uVar279)) + uVar233;
        uVar225 = ((uStack_2b2 + uStack_262) - (bVar310 + uVar285)) + uVar270;
        uVar308 = ((uStack_2b0 + uStack_260) - (bVar311 + uVar291)) + uVar278;
        uVar230 = ((uStack_2ae + uStack_25e) - (bVar174 + uVar297)) + uVar284;
        uVar313 = ((uStack_2ac + uStack_25c) - (bVar180 + uVar303)) + uVar290;
        uVar235 = ((uStack_2aa + uStack_25a) - (bVar181 + uVar309)) + uVar211;
        uVar229 = uVar229 >> 4;
        uVar231 = uVar231 >> 4;
        uVar233 = uVar233 >> 4;
        uVar270 = uVar270 >> 4;
        uVar278 = uVar278 >> 4;
        uVar284 = uVar284 >> 4;
        uVar290 = uVar290 >> 4;
        uVar211 = uVar211 >> 4;
        local_138 = auVar237[0];
        pbVar1 = s + lVar173 * -6;
        *pbVar1 = ~local_1c8[0] & local_138 |
                  (uVar232 != 0) * (uVar232 < 0x100) * (char)uVar232 - (0xff < uVar232) &
                  local_1c8[0];
        pbVar1[1] = ~local_1c8[1] & auVar237[1] |
                    (uVar234 != 0) * (uVar234 < 0x100) * (char)uVar234 - (0xff < uVar234) &
                    local_1c8[1];
        pbVar1[2] = ~local_1c8[2] & auVar237[2] |
                    (uVar332 != 0) * (uVar332 < 0x100) * (char)uVar332 - (0xff < uVar332) &
                    local_1c8[2];
        pbVar1[3] = ~local_1c8[3] & auVar237[3] |
                    (uVar241 != 0) * (uVar241 < 0x100) * (char)uVar241 - (0xff < uVar241) &
                    local_1c8[3];
        pbVar1[4] = ~local_1c8[4] & auVar237[4] |
                    (uVar245 != 0) * (uVar245 < 0x100) * (char)uVar245 - (0xff < uVar245) &
                    local_1c8[4];
        pbVar1[5] = ~local_1c8[5] & auVar237[5] |
                    (uVar337 != 0) * (uVar337 < 0x100) * (char)uVar337 - (0xff < uVar337) &
                    local_1c8[5];
        pbVar1[6] = ~local_1c8[6] & auVar237[6] |
                    (uVar339 != 0) * (uVar339 < 0x100) * (char)uVar339 - (0xff < uVar339) &
                    local_1c8[6];
        pbVar1[7] = ~local_1c8[7] & auVar237[7] |
                    (uVar341 != 0) * (uVar341 < 0x100) * (char)uVar341 - (0xff < uVar341) &
                    local_1c8[7];
        pbVar1[8] = ~local_1c8[8] & auVar237[8] |
                    (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229) &
                    local_1c8[8];
        pbVar1[9] = ~local_1c8[9] & bVar281 |
                    (uVar231 != 0) * (uVar231 < 0x100) * (char)uVar231 - (0xff < uVar231) &
                    local_1c8[9];
        pbVar1[10] = ~local_1c8[10] & bVar286 |
                     (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233) &
                     local_1c8[10];
        pbVar1[0xb] = ~local_1c8[0xb] & bVar287 |
                      (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270) &
                      local_1c8[0xb];
        pbVar1[0xc] = ~local_1c8[0xc] & bVar292 |
                      (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278) &
                      local_1c8[0xc];
        pbVar1[0xd] = ~local_1c8[0xd] & bVar293 |
                      (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284) &
                      local_1c8[0xd];
        pbVar1[0xe] = ~local_1c8[0xe] & bVar298 |
                      (uVar290 != 0) * (uVar290 < 0x100) * (char)uVar290 - (0xff < uVar290) &
                      local_1c8[0xe];
        pbVar1[0xf] = ~local_1c8[0xf] & bVar299 |
                      (uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 - (0xff < uVar211) &
                      local_1c8[0xf];
        sStack_276 = auVar105._2_2_;
        sStack_274 = auVar140._0_2_;
        sStack_272 = (short)Var120;
        sStack_270 = auVar91._8_2_;
        sStack_26e = auVar63._10_2_;
        sStack_26c = auVar35._12_2_;
        uVar229 = auVar21._13_2_ >> 8;
        uStack_1a6 = (ushort)bVar281;
        uStack_1a4 = (ushort)bVar286;
        uStack_1a2 = (ushort)bVar287;
        uStack_1a0 = (ushort)bVar292;
        uStack_19e = (ushort)bVar293;
        uStack_19c = (ushort)bVar298;
        uStack_19a = (ushort)bVar299;
        uStack_26 = (ushort)bVar315;
        uStack_24 = (ushort)auVar5[10];
        uStack_22 = (ushort)auVar5[0xb];
        uStack_20 = (ushort)auVar5[0xc];
        uStack_1e = (ushort)auVar5[0xd];
        uStack_1c = (ushort)auVar5[0xe];
        uStack_1a = (ushort)auVar5[0xf];
        uStack_2c6 = (ushort)auVar369[9];
        uStack_2c4 = (ushort)auVar369[10];
        uStack_2c2 = (ushort)auVar369[0xb];
        uStack_2c0 = (ushort)auVar369[0xc];
        uStack_2be = (ushort)auVar369[0xd];
        uStack_2bc = (ushort)auVar369[0xe];
        uStack_2ba = (ushort)auVar369[0xf];
        uVar356 = ((uVar329 + uVar228) - (uVar333 + auVar358._0_2_)) + uVar368;
        uVar359 = ((sStack_246 + sStack_226) - (sVar183 + sVar331)) + uVar370;
        uVar360 = ((sStack_244 + sStack_224) - (sVar188 + sVar336)) + uVar371;
        uVar361 = ((sStack_242 + sStack_222) - (sVar193 + sVar338)) + uVar373;
        uVar362 = ((sStack_240 + sStack_220) - (sVar197 + sVar340)) + uVar375;
        uVar363 = ((sStack_23e + sStack_21e) - (sVar202 + sVar342)) + uVar377;
        uVar364 = ((sStack_23c + sStack_21c) - (sVar206 + sVar344)) + uVar379;
        uVar365 = ((uVar221 + uVar212) - ((uVar216 >> 8) + uVar227)) + uVar380;
        uVar368 = uVar368 >> 4;
        uVar370 = uVar370 >> 4;
        uVar371 = uVar371 >> 4;
        uVar373 = uVar373 >> 4;
        uVar375 = uVar375 >> 4;
        uVar377 = uVar377 >> 4;
        uVar379 = uVar379 >> 4;
        uVar380 = uVar380 >> 4;
        uVar334 = ((uVar326 + uVar269) - (uVar314 + auVar324._0_2_)) + uVar296;
        uVar234 = ((uStack_1b6 + uStack_236) - (uStack_1a6 + uVar271)) + uVar222;
        uVar332 = ((uStack_1b4 + uStack_234) - (uStack_1a4 + uVar279)) + uVar302;
        uVar241 = ((uStack_1b2 + uStack_232) - (uStack_1a2 + uVar285)) + uVar225;
        uVar245 = ((uStack_1b0 + uStack_230) - (uStack_1a0 + uVar291)) + uVar308;
        uVar337 = ((uStack_1ae + uStack_22e) - (uStack_19e + uVar297)) + uVar230;
        uVar339 = ((uStack_1ac + uStack_22c) - (uStack_19c + uVar303)) + uVar313;
        uVar341 = ((uStack_1aa + uStack_22a) - (uStack_19a + uVar309)) + uVar235;
        uVar296 = uVar296 >> 4;
        uVar222 = uVar222 >> 4;
        uVar302 = uVar302 >> 4;
        uVar225 = uVar225 >> 4;
        uVar308 = uVar308 >> 4;
        uVar230 = uVar230 >> 4;
        uVar313 = uVar313 >> 4;
        uVar235 = uVar235 >> 4;
        local_128 = auVar272[0];
        pbVar1 = s + lVar173 * -5;
        *pbVar1 = ~local_1c8[0] & local_128 |
                  (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368) &
                  local_1c8[0];
        pbVar1[1] = ~local_1c8[1] & auVar272[1] |
                    (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370) &
                    local_1c8[1];
        pbVar1[2] = ~local_1c8[2] & auVar272[2] |
                    (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371) &
                    local_1c8[2];
        pbVar1[3] = ~local_1c8[3] & auVar272[3] |
                    (uVar373 != 0) * (uVar373 < 0x100) * (char)uVar373 - (0xff < uVar373) &
                    local_1c8[3];
        pbVar1[4] = ~local_1c8[4] & auVar272[4] |
                    (uVar375 != 0) * (uVar375 < 0x100) * (char)uVar375 - (0xff < uVar375) &
                    local_1c8[4];
        pbVar1[5] = ~local_1c8[5] & auVar272[5] |
                    (uVar377 != 0) * (uVar377 < 0x100) * (char)uVar377 - (0xff < uVar377) &
                    local_1c8[5];
        pbVar1[6] = ~local_1c8[6] & auVar272[6] |
                    (uVar379 != 0) * (uVar379 < 0x100) * (char)uVar379 - (0xff < uVar379) &
                    local_1c8[6];
        pbVar1[7] = ~local_1c8[7] & auVar272[7] |
                    (uVar380 != 0) * (uVar380 < 0x100) * (char)uVar380 - (0xff < uVar380) &
                    local_1c8[7];
        pbVar1[8] = ~local_1c8[8] & auVar272[8] |
                    (uVar296 != 0) * (uVar296 < 0x100) * (char)uVar296 - (0xff < uVar296) &
                    local_1c8[8];
        pbVar1[9] = ~local_1c8[9] & bVar203 |
                    (uVar222 != 0) * (uVar222 < 0x100) * (char)uVar222 - (0xff < uVar222) &
                    local_1c8[9];
        pbVar1[10] = ~local_1c8[10] & bVar204 |
                     (uVar302 != 0) * (uVar302 < 0x100) * (char)uVar302 - (0xff < uVar302) &
                     local_1c8[10];
        pbVar1[0xb] = ~local_1c8[0xb] & bVar207 |
                      (uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225) &
                      local_1c8[0xb];
        pbVar1[0xc] = ~local_1c8[0xc] & bVar208 |
                      (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308) &
                      local_1c8[0xc];
        pbVar1[0xd] = ~local_1c8[0xd] & bVar213 |
                      (uVar230 != 0) * (uVar230 < 0x100) * (char)uVar230 - (0xff < uVar230) &
                      local_1c8[0xd];
        pbVar1[0xe] = ~local_1c8[0xe] & bVar350 |
                      (uVar313 != 0) * (uVar313 < 0x100) * (char)uVar313 - (0xff < uVar313) &
                      local_1c8[0xe];
        pbVar1[0xf] = ~local_1c8[0xf] & bVar354 |
                      (uVar235 != 0) * (uVar235 < 0x100) * (char)uVar235 - (0xff < uVar235) &
                      local_1c8[0xf];
        sVar175 = uVar223 + (uVar176 >> 8);
        sStack_56 = auVar106._2_2_;
        sStack_54 = auVar142._0_2_;
        sStack_52 = (short)Var123;
        sStack_50 = auVar92._8_2_;
        sStack_4e = auVar64._10_2_;
        sStack_4c = auVar36._12_2_;
        uVar231 = auVar22._13_2_ >> 8;
        uStack_66 = (ushort)bVar203;
        uStack_64 = (ushort)bVar204;
        uStack_62 = (ushort)bVar207;
        uStack_60 = (ushort)bVar208;
        uStack_5e = (ushort)bVar213;
        uStack_5c = (ushort)bVar350;
        uStack_5a = (ushort)bVar354;
        uStack_206 = (ushort)auVar3[9];
        uStack_204 = (ushort)bVar258;
        uStack_202 = (ushort)bVar259;
        uStack_200 = (ushort)bVar261;
        uStack_1fe = (ushort)bVar268;
        uStack_1fc = (ushort)bVar275;
        uStack_1fa = (ushort)bVar276;
        uStack_1d6 = (ushort)bVar304;
        uStack_1d4 = (ushort)bVar305;
        uStack_1d2 = (ushort)bVar310;
        uStack_1d0 = (ushort)bVar311;
        uStack_1ce = (ushort)bVar174;
        uStack_1cc = (ushort)bVar180;
        uStack_1ca = (ushort)bVar181;
        uStack_256 = (ushort)auVar7[9];
        uStack_254 = (ushort)auVar7[10];
        uStack_252 = (ushort)auVar7[0xb];
        uStack_250 = (ushort)auVar7[0xc];
        uStack_24e = (ushort)auVar7[0xd];
        uStack_24c = (ushort)auVar7[0xe];
        uStack_24a = (ushort)auVar7[0xf];
        uVar233 = ((uVar330 + uVar267) - (uVar367 + auVar358._0_2_)) + uVar356;
        uVar270 = ((sStack_c6 + sVar277) - (sVar346 + sVar331)) + uVar359;
        uVar278 = ((sStack_c4 + sVar282) - (sVar348 + sVar336)) + uVar360;
        uVar284 = ((sStack_c2 + sVar288) - (sVar372 + sVar338)) + uVar361;
        uVar290 = ((sStack_c0 + sVar294) - (sVar374 + sVar340)) + uVar362;
        uVar211 = ((sStack_be + sVar300) - (sVar376 + sVar342)) + uVar363;
        uVar296 = ((sStack_bc + sVar306) - (sVar378 + sVar344)) + uVar364;
        uVar227 = (sVar175 - ((uVar224 >> 8) + uVar227)) + uVar365;
        uVar356 = uVar356 >> 4;
        uVar359 = uVar359 >> 4;
        uVar360 = uVar360 >> 4;
        uVar361 = uVar361 >> 4;
        uVar362 = uVar362 >> 4;
        uVar363 = uVar363 >> 4;
        uVar364 = uVar364 >> 4;
        uVar365 = uVar365 >> 4;
        uVar222 = ((uVar214 + uVar366) - (uVar352 + auVar324._0_2_)) + uVar334;
        uVar302 = ((uStack_d6 + uStack_206) - (uStack_66 + uStack_1d6)) + uVar234;
        uVar225 = ((uStack_d4 + uStack_204) - (uStack_64 + uStack_1d4)) + uVar332;
        uVar308 = ((uStack_d2 + uStack_202) - (uStack_62 + uStack_1d2)) + uVar241;
        uVar230 = ((uStack_d0 + uStack_200) - (uStack_60 + uStack_1d0)) + uVar245;
        uVar313 = ((uStack_ce + uStack_1fe) - (uStack_5e + uStack_1ce)) + uVar337;
        uVar235 = ((uStack_cc + uStack_1fc) - (uStack_5c + uStack_1cc)) + uVar339;
        uVar232 = ((uStack_ca + uStack_1fa) - (uStack_5a + uStack_1ca)) + uVar341;
        uVar334 = uVar334 >> 4;
        uVar234 = uVar234 >> 4;
        uVar332 = uVar332 >> 4;
        uVar241 = uVar241 >> 4;
        uVar245 = uVar245 >> 4;
        uVar337 = uVar337 >> 4;
        uVar339 = uVar339 >> 4;
        uVar341 = uVar341 >> 4;
        local_b8 = auVar2[0];
        pbVar1 = s + lVar173 * -4;
        *pbVar1 = ~local_1c8[0] & local_b8 |
                  (uVar356 != 0) * (uVar356 < 0x100) * (char)uVar356 - (0xff < uVar356) &
                  local_1c8[0];
        pbVar1[1] = ~local_1c8[1] & auVar2[1] |
                    (uVar359 != 0) * (uVar359 < 0x100) * (char)uVar359 - (0xff < uVar359) &
                    local_1c8[1];
        pbVar1[2] = ~local_1c8[2] & auVar2[2] |
                    (uVar360 != 0) * (uVar360 < 0x100) * (char)uVar360 - (0xff < uVar360) &
                    local_1c8[2];
        pbVar1[3] = ~local_1c8[3] & auVar2[3] |
                    (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361) &
                    local_1c8[3];
        pbVar1[4] = ~local_1c8[4] & auVar2[4] |
                    (uVar362 != 0) * (uVar362 < 0x100) * (char)uVar362 - (0xff < uVar362) &
                    local_1c8[4];
        pbVar1[5] = ~local_1c8[5] & auVar2[5] |
                    (uVar363 != 0) * (uVar363 < 0x100) * (char)uVar363 - (0xff < uVar363) &
                    local_1c8[5];
        pbVar1[6] = ~local_1c8[6] & auVar2[6] |
                    (uVar364 != 0) * (uVar364 < 0x100) * (char)uVar364 - (0xff < uVar364) &
                    local_1c8[6];
        pbVar1[7] = ~local_1c8[7] & auVar2[7] |
                    (uVar365 != 0) * (uVar365 < 0x100) * (char)uVar365 - (0xff < uVar365) &
                    local_1c8[7];
        pbVar1[8] = ~local_1c8[8] & auVar2[8] |
                    (uVar334 != 0) * (uVar334 < 0x100) * (char)uVar334 - (0xff < uVar334) &
                    local_1c8[8];
        pbVar1[9] = ~local_1c8[9] & bVar247 |
                    (uVar234 != 0) * (uVar234 < 0x100) * (char)uVar234 - (0xff < uVar234) &
                    local_1c8[9];
        pbVar1[10] = ~local_1c8[10] & bVar249 |
                     (uVar332 != 0) * (uVar332 < 0x100) * (char)uVar332 - (0xff < uVar332) &
                     local_1c8[10];
        pbVar1[0xb] = ~local_1c8[0xb] & bVar250 |
                      (uVar241 != 0) * (uVar241 < 0x100) * (char)uVar241 - (0xff < uVar241) &
                      local_1c8[0xb];
        pbVar1[0xc] = ~local_1c8[0xc] & bVar252 |
                      (uVar245 != 0) * (uVar245 < 0x100) * (char)uVar245 - (0xff < uVar245) &
                      local_1c8[0xc];
        pbVar1[0xd] = ~local_1c8[0xd] & bVar253 |
                      (uVar337 != 0) * (uVar337 < 0x100) * (char)uVar337 - (0xff < uVar337) &
                      local_1c8[0xd];
        pbVar1[0xe] = ~local_1c8[0xe] & bVar255 |
                      (uVar339 != 0) * (uVar339 < 0x100) * (char)uVar339 - (0xff < uVar339) &
                      local_1c8[0xe];
        pbVar1[0xf] = ~local_1c8[0xf] & bVar256 |
                      (uVar341 != 0) * (uVar341 < 0x100) * (char)uVar341 - (0xff < uVar341) &
                      local_1c8[0xf];
        uVar210 = uVar210 >> 8;
        uVar334 = ((uVar316 + uVar347) - (uVar266 + auVar358._0_2_)) + uVar233;
        uVar234 = ((sVar317 + auVar104._2_2_) - (sVar182 + sVar331)) + uVar270;
        uVar332 = ((sVar318 + auVar138._0_2_) - (sVar187 + sVar336)) + uVar278;
        uVar241 = ((sVar319 + sVar209) - (sVar192 + sVar338)) + uVar284;
        uVar245 = ((sVar320 + auVar90._8_2_) - (sVar196 + sVar340)) + uVar290;
        uVar337 = ((sVar321 + auVar62._10_2_) - (sVar201 + sVar342)) + uVar211;
        uVar339 = ((sVar322 + auVar34._12_2_) - (sVar205 + sVar344)) + uVar296;
        uVar341 = (((uVar184 >> 8) + uVar198) - (uVar177 + uVar210)) + uVar227;
        uVar233 = uVar233 >> 4;
        uVar270 = uVar270 >> 4;
        uVar278 = uVar278 >> 4;
        uVar284 = uVar284 >> 4;
        uVar290 = uVar290 >> 4;
        uVar211 = uVar211 >> 4;
        uVar296 = uVar296 >> 4;
        uVar227 = uVar227 >> 4;
        uVar271 = ((uVar323 + bVar185) - (uVar351 + auVar324._0_2_)) + uVar222;
        uVar279 = ((uStack_156 + bVar186) - (uStack_266 + uStack_1d6)) + uVar302;
        uVar285 = ((uStack_154 + bVar190) - (uStack_264 + uStack_1d4)) + uVar225;
        uVar291 = ((uStack_152 + bVar191) - (uStack_262 + uStack_1d2)) + uVar308;
        uVar297 = ((uStack_150 + bVar194) - (uStack_260 + uStack_1d0)) + uVar230;
        uVar303 = ((uStack_14e + bVar195) - (uStack_25e + uStack_1ce)) + uVar313;
        uVar309 = ((uStack_14c + bVar199) - (uStack_25c + uStack_1cc)) + uVar235;
        uVar356 = ((uStack_14a + bVar200) - (uStack_25a + uStack_1ca)) + uVar232;
        uVar222 = uVar222 >> 4;
        uVar302 = uVar302 >> 4;
        uVar225 = uVar225 >> 4;
        uVar308 = uVar308 >> 4;
        uVar230 = uVar230 >> 4;
        uVar313 = uVar313 >> 4;
        uVar235 = uVar235 >> 4;
        uVar232 = uVar232 >> 4;
        local_178._0_1_ = auVar273[0];
        local_178._1_1_ = auVar273[1];
        local_178._2_1_ = auVar273[2];
        local_178._3_1_ = auVar273[3];
        local_178._4_1_ = auVar273[4];
        local_178._5_1_ = auVar273[5];
        local_178._6_1_ = auVar273[6];
        local_178._7_1_ = auVar273[7];
        uStack_170._0_1_ = auVar273[8];
        uStack_170._1_1_ = auVar273[9];
        uStack_170._2_1_ = auVar273[10];
        uStack_170._3_1_ = auVar273[0xb];
        uStack_170._4_1_ = auVar273[0xc];
        uStack_170._5_1_ = auVar273[0xd];
        uStack_170._6_1_ = auVar273[0xe];
        uStack_170._7_1_ = auVar273[0xf];
        pbVar1 = s + lVar173 * -3;
        *pbVar1 = ~local_1c8[0] & (byte)local_178 |
                  (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233) &
                  local_1c8[0];
        pbVar1[1] = ~local_1c8[1] & local_178._1_1_ |
                    (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270) &
                    local_1c8[1];
        pbVar1[2] = ~local_1c8[2] & local_178._2_1_ |
                    (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278) &
                    local_1c8[2];
        pbVar1[3] = ~local_1c8[3] & local_178._3_1_ |
                    (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284) &
                    local_1c8[3];
        pbVar1[4] = ~local_1c8[4] & local_178._4_1_ |
                    (uVar290 != 0) * (uVar290 < 0x100) * (char)uVar290 - (0xff < uVar290) &
                    local_1c8[4];
        pbVar1[5] = ~local_1c8[5] & local_178._5_1_ |
                    (uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 - (0xff < uVar211) &
                    local_1c8[5];
        pbVar1[6] = ~local_1c8[6] & local_178._6_1_ |
                    (uVar296 != 0) * (uVar296 < 0x100) * (char)uVar296 - (0xff < uVar296) &
                    local_1c8[6];
        pbVar1[7] = ~local_1c8[7] & local_178._7_1_ |
                    (uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 - (0xff < uVar227) &
                    local_1c8[7];
        pbVar1[8] = ~local_1c8[8] & (byte)uStack_170 |
                    (uVar222 != 0) * (uVar222 < 0x100) * (char)uVar222 - (0xff < uVar222) &
                    local_1c8[8];
        pbVar1[9] = ~local_1c8[9] & uStack_170._1_1_ |
                    (uVar302 != 0) * (uVar302 < 0x100) * (char)uVar302 - (0xff < uVar302) &
                    local_1c8[9];
        pbVar1[10] = ~local_1c8[10] & uStack_170._2_1_ |
                     (uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225) &
                     local_1c8[10];
        pbVar1[0xb] = ~local_1c8[0xb] & uStack_170._3_1_ |
                      (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308) &
                      local_1c8[0xb];
        pbVar1[0xc] = ~local_1c8[0xc] & uStack_170._4_1_ |
                      (uVar230 != 0) * (uVar230 < 0x100) * (char)uVar230 - (0xff < uVar230) &
                      local_1c8[0xc];
        pbVar1[0xd] = ~local_1c8[0xd] & uStack_170._5_1_ |
                      (uVar313 != 0) * (uVar313 < 0x100) * (char)uVar313 - (0xff < uVar313) &
                      local_1c8[0xd];
        pbVar1[0xe] = ~local_1c8[0xe] & uStack_170._6_1_ |
                      (uVar235 != 0) * (uVar235 < 0x100) * (char)uVar235 - (0xff < uVar235) &
                      local_1c8[0xe];
        pbVar1[0xf] = ~local_1c8[0xf] & uStack_170._7_1_ |
                      (uVar232 != 0) * (uVar232 < 0x100) * (char)uVar232 - (0xff < uVar232) &
                      local_1c8[0xf];
        uVar225 = ((uVar226 + uVar343) - (uVar228 + auVar358._0_2_)) + uVar334;
        uVar230 = ((sVar240 + sStack_276) - (sStack_226 + sVar331)) + uVar234;
        uVar235 = ((sVar244 + sStack_274) - (sStack_224 + sVar336)) + uVar332;
        uVar359 = ((sVar248 + sStack_272) - (sStack_222 + sVar338)) + uVar241;
        uVar360 = ((sVar251 + sStack_270) - (sStack_220 + sVar340)) + uVar245;
        uVar361 = ((sVar254 + sStack_26e) - (sStack_21e + sVar342)) + uVar337;
        uVar362 = ((sVar257 + sStack_26c) - (sStack_21c + sVar344)) + uVar339;
        uVar363 = ((uVar189 + uVar229) - (uVar212 + uVar210)) + uVar341;
        uVar334 = uVar334 >> 4;
        uVar234 = uVar234 >> 4;
        uVar332 = uVar332 >> 4;
        uVar241 = uVar241 >> 4;
        uVar245 = uVar245 >> 4;
        uVar337 = uVar337 >> 4;
        uVar339 = uVar339 >> 4;
        uVar341 = uVar341 >> 4;
        uVar227 = ((uVar262 + bVar280) - (uVar269 + auVar324._0_2_)) + uVar271;
        uVar233 = ((uStack_26 + uStack_2c6) - (uStack_236 + uStack_1d6)) + uVar279;
        uVar270 = ((uStack_24 + uStack_2c4) - (uStack_234 + uStack_1d4)) + uVar285;
        uVar278 = ((uStack_22 + uStack_2c2) - (uStack_232 + uStack_1d2)) + uVar291;
        uVar284 = ((uStack_20 + uStack_2c0) - (uStack_230 + uStack_1d0)) + uVar297;
        uVar290 = ((uStack_1e + uStack_2be) - (uStack_22e + uStack_1ce)) + uVar303;
        uVar211 = ((uStack_1c + uStack_2bc) - (uStack_22c + uStack_1cc)) + uVar309;
        uVar222 = ((uStack_1a + uStack_2ba) - (uStack_22a + uStack_1ca)) + uVar356;
        uVar271 = uVar271 >> 4;
        uVar279 = uVar279 >> 4;
        uVar285 = uVar285 >> 4;
        uVar291 = uVar291 >> 4;
        uVar297 = uVar297 >> 4;
        uVar303 = uVar303 >> 4;
        uVar309 = uVar309 >> 4;
        uVar356 = uVar356 >> 4;
        local_188._0_1_ = auVar335[0];
        local_188._1_1_ = auVar335[1];
        local_188._2_1_ = auVar335[2];
        local_188._3_1_ = auVar335[3];
        local_188._4_1_ = auVar335[4];
        local_188._5_1_ = auVar335[5];
        local_188._6_1_ = auVar335[6];
        local_188._7_1_ = auVar335[7];
        uStack_180._0_1_ = auVar335[8];
        uStack_180._1_1_ = auVar335[9];
        uStack_180._2_1_ = auVar335[10];
        uStack_180._3_1_ = auVar335[0xb];
        uStack_180._4_1_ = auVar335[0xc];
        uStack_180._5_1_ = auVar335[0xd];
        uStack_180._6_1_ = auVar335[0xe];
        uStack_180._7_1_ = auVar335[0xf];
        pbVar1 = s + lVar172;
        *pbVar1 = ~local_1c8[0] & (byte)local_188 |
                  (uVar334 != 0) * (uVar334 < 0x100) * (char)uVar334 - (0xff < uVar334) &
                  local_1c8[0];
        pbVar1[1] = ~local_1c8[1] & local_188._1_1_ |
                    (uVar234 != 0) * (uVar234 < 0x100) * (char)uVar234 - (0xff < uVar234) &
                    local_1c8[1];
        pbVar1[2] = ~local_1c8[2] & local_188._2_1_ |
                    (uVar332 != 0) * (uVar332 < 0x100) * (char)uVar332 - (0xff < uVar332) &
                    local_1c8[2];
        pbVar1[3] = ~local_1c8[3] & local_188._3_1_ |
                    (uVar241 != 0) * (uVar241 < 0x100) * (char)uVar241 - (0xff < uVar241) &
                    local_1c8[3];
        pbVar1[4] = ~local_1c8[4] & local_188._4_1_ |
                    (uVar245 != 0) * (uVar245 < 0x100) * (char)uVar245 - (0xff < uVar245) &
                    local_1c8[4];
        pbVar1[5] = ~local_1c8[5] & local_188._5_1_ |
                    (uVar337 != 0) * (uVar337 < 0x100) * (char)uVar337 - (0xff < uVar337) &
                    local_1c8[5];
        pbVar1[6] = ~local_1c8[6] & local_188._6_1_ |
                    (uVar339 != 0) * (uVar339 < 0x100) * (char)uVar339 - (0xff < uVar339) &
                    local_1c8[6];
        pbVar1[7] = ~local_1c8[7] & local_188._7_1_ |
                    (uVar341 != 0) * (uVar341 < 0x100) * (char)uVar341 - (0xff < uVar341) &
                    local_1c8[7];
        pbVar1[8] = ~local_1c8[8] & (byte)uStack_180 |
                    (uVar271 != 0) * (uVar271 < 0x100) * (char)uVar271 - (0xff < uVar271) &
                    local_1c8[8];
        pbVar1[9] = ~local_1c8[9] & uStack_180._1_1_ |
                    (uVar279 != 0) * (uVar279 < 0x100) * (char)uVar279 - (0xff < uVar279) &
                    local_1c8[9];
        pbVar1[10] = ~local_1c8[10] & uStack_180._2_1_ |
                     (uVar285 != 0) * (uVar285 < 0x100) * (char)uVar285 - (0xff < uVar285) &
                     local_1c8[10];
        pbVar1[0xb] = ~local_1c8[0xb] & uStack_180._3_1_ |
                      (uVar291 != 0) * (uVar291 < 0x100) * (char)uVar291 - (0xff < uVar291) &
                      local_1c8[0xb];
        pbVar1[0xc] = ~local_1c8[0xc] & uStack_180._4_1_ |
                      (uVar297 != 0) * (uVar297 < 0x100) * (char)uVar297 - (0xff < uVar297) &
                      local_1c8[0xc];
        pbVar1[0xd] = ~local_1c8[0xd] & uStack_180._5_1_ |
                      (uVar303 != 0) * (uVar303 < 0x100) * (char)uVar303 - (0xff < uVar303) &
                      local_1c8[0xd];
        pbVar1[0xe] = ~local_1c8[0xe] & uStack_180._6_1_ |
                      (uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 - (0xff < uVar309) &
                      local_1c8[0xe];
        pbVar1[0xf] = ~local_1c8[0xf] & uStack_180._7_1_ |
                      (uVar356 != 0) * (uVar356 < 0x100) * (char)uVar356 - (0xff < uVar356) &
                      local_1c8[0xf];
        uVar296 = ((uVar325 + uVar345) - (auVar358._0_2_ + uVar267)) + uVar225;
        uVar302 = ((sStack_2a6 + sStack_56) - (sVar331 + sVar277)) + uVar230;
        uVar308 = ((sStack_2a4 + sStack_54) - (sVar336 + sVar282)) + uVar235;
        uVar313 = ((sStack_2a2 + sStack_52) - (sVar338 + sVar288)) + uVar359;
        uVar232 = ((sStack_2a0 + sStack_50) - (sVar340 + sVar294)) + uVar360;
        uVar234 = ((sStack_29e + sStack_4e) - (sVar342 + sVar300)) + uVar361;
        uVar241 = ((sStack_29c + sStack_4c) - (sVar344 + sVar306)) + uVar362;
        uVar337 = ((uVar215 + uVar231) - (uVar210 + (uVar176 >> 8))) + uVar363;
        uVar225 = uVar225 >> 4;
        uVar230 = uVar230 >> 4;
        uVar235 = uVar235 >> 4;
        uVar359 = uVar359 >> 4;
        uVar360 = uVar360 >> 4;
        uVar361 = uVar361 >> 4;
        uVar362 = uVar362 >> 4;
        uVar363 = uVar363 >> 4;
        uVar271 = ((uVar355 + uVar349) - (auVar324._0_2_ + uVar366)) + uVar227;
        uVar279 = ((uStack_2b6 + uStack_256) - (uStack_1d6 + uStack_206)) + uVar233;
        uVar285 = ((uStack_2b4 + uStack_254) - (uStack_1d4 + uStack_204)) + uVar270;
        uVar291 = ((uStack_2b2 + uStack_252) - (uStack_1d2 + uStack_202)) + uVar278;
        uVar297 = ((uStack_2b0 + uStack_250) - (uStack_1d0 + uStack_200)) + uVar284;
        uVar303 = ((uStack_2ae + uStack_24e) - (uStack_1ce + uStack_1fe)) + uVar290;
        uVar309 = ((uStack_2ac + uStack_24c) - (uStack_1cc + uStack_1fc)) + uVar211;
        uVar356 = ((uStack_2aa + uStack_24a) - (uStack_1ca + uStack_1fa)) + uVar222;
        uVar227 = uVar227 >> 4;
        uVar233 = uVar233 >> 4;
        uVar270 = uVar270 >> 4;
        uVar278 = uVar278 >> 4;
        uVar284 = uVar284 >> 4;
        uVar290 = uVar290 >> 4;
        uVar211 = uVar211 >> 4;
        uVar222 = uVar222 >> 4;
        local_48 = auVar263[0];
        bStack_47 = auVar263[1];
        bStack_46 = auVar263[2];
        bStack_45 = auVar263[3];
        bStack_44 = auVar263[4];
        bStack_43 = auVar263[5];
        bStack_42 = auVar263[6];
        bStack_41 = auVar263[7];
        bStack_40 = auVar263[8];
        bStack_3f = auVar263[9];
        bStack_3e = auVar263[10];
        bStack_3d = auVar263[0xb];
        bStack_3c = auVar263[0xc];
        bStack_3b = auVar263[0xd];
        bStack_3a = auVar263[0xe];
        bStack_39 = auVar263[0xf];
        pbVar1 = s + lVar171;
        *pbVar1 = ~local_1c8[0] & local_48 |
                  (uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225) &
                  local_1c8[0];
        pbVar1[1] = ~local_1c8[1] & bStack_47 |
                    (uVar230 != 0) * (uVar230 < 0x100) * (char)uVar230 - (0xff < uVar230) &
                    local_1c8[1];
        pbVar1[2] = ~local_1c8[2] & bStack_46 |
                    (uVar235 != 0) * (uVar235 < 0x100) * (char)uVar235 - (0xff < uVar235) &
                    local_1c8[2];
        pbVar1[3] = ~local_1c8[3] & bStack_45 |
                    (uVar359 != 0) * (uVar359 < 0x100) * (char)uVar359 - (0xff < uVar359) &
                    local_1c8[3];
        pbVar1[4] = ~local_1c8[4] & bStack_44 |
                    (uVar360 != 0) * (uVar360 < 0x100) * (char)uVar360 - (0xff < uVar360) &
                    local_1c8[4];
        pbVar1[5] = ~local_1c8[5] & bStack_43 |
                    (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361) &
                    local_1c8[5];
        pbVar1[6] = ~local_1c8[6] & bStack_42 |
                    (uVar362 != 0) * (uVar362 < 0x100) * (char)uVar362 - (0xff < uVar362) &
                    local_1c8[6];
        pbVar1[7] = ~local_1c8[7] & bStack_41 |
                    (uVar363 != 0) * (uVar363 < 0x100) * (char)uVar363 - (0xff < uVar363) &
                    local_1c8[7];
        pbVar1[8] = ~local_1c8[8] & bStack_40 |
                    (uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 - (0xff < uVar227) &
                    local_1c8[8];
        pbVar1[9] = ~local_1c8[9] & bStack_3f |
                    (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233) &
                    local_1c8[9];
        pbVar1[10] = ~local_1c8[10] & bStack_3e |
                     (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270) &
                     local_1c8[10];
        pbVar1[0xb] = ~local_1c8[0xb] & bStack_3d |
                      (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278) &
                      local_1c8[0xb];
        pbVar1[0xc] = ~local_1c8[0xc] & bStack_3c |
                      (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284) &
                      local_1c8[0xc];
        pbVar1[0xd] = ~local_1c8[0xd] & bStack_3b |
                      (uVar290 != 0) * (uVar290 < 0x100) * (char)uVar290 - (0xff < uVar290) &
                      local_1c8[0xd];
        pbVar1[0xe] = ~local_1c8[0xe] & bStack_3a |
                      (uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 - (0xff < uVar211) &
                      local_1c8[0xe];
        pbVar1[0xf] = ~local_1c8[0xf] & bStack_39 |
                      (uVar222 != 0) * (uVar222 < 0x100) * (char)uVar222 - (0xff < uVar222) &
                      local_1c8[0xf];
        uVar176 = uVar296 >> 4;
        uVar210 = uVar302 >> 4;
        uVar227 = uVar308 >> 4;
        uVar233 = uVar313 >> 4;
        uVar270 = uVar232 >> 4;
        uVar278 = uVar234 >> 4;
        uVar284 = uVar241 >> 4;
        uVar290 = uVar337 >> 4;
        uVar211 = uVar271 >> 4;
        uVar222 = uVar279 >> 4;
        uVar225 = uVar285 >> 4;
        uVar230 = uVar291 >> 4;
        uVar235 = uVar297 >> 4;
        uVar334 = uVar303 >> 4;
        uVar332 = uVar309 >> 4;
        uVar245 = uVar356 >> 4;
        local_1e8 = auVar265[0];
        bStack_1e7 = auVar265[1];
        bStack_1e6 = auVar265[2];
        bStack_1e5 = auVar265[3];
        bStack_1e4 = auVar265[4];
        bStack_1e3 = auVar265[5];
        bStack_1e2 = auVar265[6];
        bStack_1e1 = auVar265[7];
        bStack_1e0 = auVar265[8];
        bStack_1df = auVar265[9];
        bStack_1de = auVar265[10];
        bStack_1dd = auVar265[0xb];
        bStack_1dc = auVar265[0xc];
        bStack_1db = auVar265[0xd];
        bStack_1da = auVar265[0xe];
        bStack_1d9 = auVar265[0xf];
        *s = ~local_1c8[0] & local_1e8 |
             (uVar176 != 0) * (uVar176 < 0x100) * (char)uVar176 - (0xff < uVar176) & local_1c8[0];
        s[1] = ~local_1c8[1] & bStack_1e7 |
               (uVar210 != 0) * (uVar210 < 0x100) * (char)uVar210 - (0xff < uVar210) & local_1c8[1];
        s[2] = ~local_1c8[2] & bStack_1e6 |
               (uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 - (0xff < uVar227) & local_1c8[2];
        s[3] = ~local_1c8[3] & bStack_1e5 |
               (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233) & local_1c8[3];
        s[4] = ~local_1c8[4] & bStack_1e4 |
               (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270) & local_1c8[4];
        s[5] = ~local_1c8[5] & bStack_1e3 |
               (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278) & local_1c8[5];
        s[6] = ~local_1c8[6] & bStack_1e2 |
               (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284) & local_1c8[6];
        s[7] = ~local_1c8[7] & bStack_1e1 |
               (uVar290 != 0) * (uVar290 < 0x100) * (char)uVar290 - (0xff < uVar290) & local_1c8[7];
        s[8] = ~local_1c8[8] & bStack_1e0 |
               (uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 - (0xff < uVar211) & local_1c8[8];
        s[9] = ~local_1c8[9] & bStack_1df |
               (uVar222 != 0) * (uVar222 < 0x100) * (char)uVar222 - (0xff < uVar222) & local_1c8[9];
        s[10] = ~local_1c8[10] & bStack_1de |
                (uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225) &
                local_1c8[10];
        s[0xb] = ~local_1c8[0xb] & bStack_1dd |
                 (uVar230 != 0) * (uVar230 < 0x100) * (char)uVar230 - (0xff < uVar230) &
                 local_1c8[0xb];
        s[0xc] = ~local_1c8[0xc] & bStack_1dc |
                 (uVar235 != 0) * (uVar235 < 0x100) * (char)uVar235 - (0xff < uVar235) &
                 local_1c8[0xc];
        s[0xd] = ~local_1c8[0xd] & bStack_1db |
                 (uVar334 != 0) * (uVar334 < 0x100) * (char)uVar334 - (0xff < uVar334) &
                 local_1c8[0xd];
        s[0xe] = ~local_1c8[0xe] & bStack_1da |
                 (uVar332 != 0) * (uVar332 < 0x100) * (char)uVar332 - (0xff < uVar332) &
                 local_1c8[0xe];
        s[0xf] = ~local_1c8[0xf] & bStack_1d9 |
                 (uVar245 != 0) * (uVar245 < 0x100) * (char)uVar245 - (0xff < uVar245) &
                 local_1c8[0xf];
        uVar296 = (uVar329 - (uVar333 + uVar316)) + uVar345 + uVar296;
        uVar302 = (sStack_246 - (sVar183 + sVar317)) + sStack_56 + uVar302;
        uVar308 = (sStack_244 - (sVar188 + sVar318)) + sStack_54 + uVar308;
        uVar313 = (sStack_242 - (sVar193 + sVar319)) + sStack_52 + uVar313;
        uVar232 = (sStack_240 - (sVar197 + sVar320)) + sStack_50 + uVar232;
        uVar234 = (sStack_23e - (sVar202 + sVar321)) + sStack_4e + uVar234;
        uVar241 = (sStack_23c - (sVar206 + sVar322)) + sStack_4c + uVar241;
        uVar337 = (uVar221 - ((uVar216 >> 8) + (uVar184 >> 8))) + uVar231 + uVar337;
        uVar271 = (uVar326 - (uVar314 + uVar323)) + uVar349 + uVar271;
        uVar279 = (uStack_1b6 - (uStack_1a6 + uStack_156)) + uStack_256 + uVar279;
        uVar285 = (uStack_1b4 - (uStack_1a4 + uStack_154)) + uStack_254 + uVar285;
        uVar291 = (uStack_1b2 - (uStack_1a2 + uStack_152)) + uStack_252 + uVar291;
        uVar297 = (uStack_1b0 - (uStack_1a0 + uStack_150)) + uStack_250 + uVar297;
        uVar303 = (uStack_1ae - (uStack_19e + uStack_14e)) + uStack_24e + uVar303;
        uVar309 = (uStack_1ac - (uStack_19c + uStack_14c)) + uStack_24c + uVar309;
        uVar356 = (uStack_1aa - (uStack_19a + uStack_14a)) + uStack_24a + uVar356;
        uVar176 = uVar296 >> 4;
        uVar184 = uVar302 >> 4;
        uVar210 = uVar308 >> 4;
        uVar216 = uVar313 >> 4;
        uVar227 = uVar232 >> 4;
        uVar233 = uVar234 >> 4;
        uVar270 = uVar241 >> 4;
        uVar278 = uVar337 >> 4;
        uVar284 = uVar271 >> 4;
        uVar290 = uVar279 >> 4;
        uVar211 = uVar285 >> 4;
        uVar222 = uVar291 >> 4;
        uVar225 = uVar297 >> 4;
        uVar230 = uVar303 >> 4;
        uVar235 = uVar309 >> 4;
        uVar334 = uVar356 >> 4;
        local_198._0_1_ = auVar178[0];
        local_198._1_1_ = auVar178[1];
        local_198._2_1_ = auVar178[2];
        local_198._3_1_ = auVar178[3];
        local_198._4_1_ = auVar178[4];
        local_198._5_1_ = auVar178[5];
        local_198._6_1_ = auVar178[6];
        local_198._7_1_ = auVar178[7];
        uStack_190._0_1_ = auVar178[8];
        uStack_190._1_1_ = auVar178[9];
        uStack_190._2_1_ = auVar178[10];
        uStack_190._3_1_ = auVar178[0xb];
        uStack_190._4_1_ = auVar178[0xc];
        uStack_190._5_1_ = auVar178[0xd];
        uStack_190._6_1_ = auVar178[0xe];
        uStack_190._7_1_ = auVar178[0xf];
        pbVar1 = s + lVar173;
        *pbVar1 = ~local_1c8[0] & (byte)local_198 |
                  (uVar176 != 0) * (uVar176 < 0x100) * (char)uVar176 - (0xff < uVar176) &
                  local_1c8[0];
        pbVar1[1] = ~local_1c8[1] & local_198._1_1_ |
                    (uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184) &
                    local_1c8[1];
        pbVar1[2] = ~local_1c8[2] & local_198._2_1_ |
                    (uVar210 != 0) * (uVar210 < 0x100) * (char)uVar210 - (0xff < uVar210) &
                    local_1c8[2];
        pbVar1[3] = ~local_1c8[3] & local_198._3_1_ |
                    (uVar216 != 0) * (uVar216 < 0x100) * (char)uVar216 - (0xff < uVar216) &
                    local_1c8[3];
        pbVar1[4] = ~local_1c8[4] & local_198._4_1_ |
                    (uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 - (0xff < uVar227) &
                    local_1c8[4];
        pbVar1[5] = ~local_1c8[5] & local_198._5_1_ |
                    (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233) &
                    local_1c8[5];
        pbVar1[6] = ~local_1c8[6] & local_198._6_1_ |
                    (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270) &
                    local_1c8[6];
        pbVar1[7] = ~local_1c8[7] & local_198._7_1_ |
                    (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278) &
                    local_1c8[7];
        pbVar1[8] = ~local_1c8[8] & (byte)uStack_190 |
                    (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284) &
                    local_1c8[8];
        pbVar1[9] = ~local_1c8[9] & uStack_190._1_1_ |
                    (uVar290 != 0) * (uVar290 < 0x100) * (char)uVar290 - (0xff < uVar290) &
                    local_1c8[9];
        pbVar1[10] = ~local_1c8[10] & uStack_190._2_1_ |
                     (uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 - (0xff < uVar211) &
                     local_1c8[10];
        pbVar1[0xb] = ~local_1c8[0xb] & uStack_190._3_1_ |
                      (uVar222 != 0) * (uVar222 < 0x100) * (char)uVar222 - (0xff < uVar222) &
                      local_1c8[0xb];
        pbVar1[0xc] = ~local_1c8[0xc] & uStack_190._4_1_ |
                      (uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225) &
                      local_1c8[0xc];
        pbVar1[0xd] = ~local_1c8[0xd] & uStack_190._5_1_ |
                      (uVar230 != 0) * (uVar230 < 0x100) * (char)uVar230 - (0xff < uVar230) &
                      local_1c8[0xd];
        pbVar1[0xe] = ~local_1c8[0xe] & uStack_190._6_1_ |
                      (uVar235 != 0) * (uVar235 < 0x100) * (char)uVar235 - (0xff < uVar235) &
                      local_1c8[0xe];
        pbVar1[0xf] = ~local_1c8[0xf] & uStack_190._7_1_ |
                      (uVar334 != 0) * (uVar334 < 0x100) * (char)uVar334 - (0xff < uVar334) &
                      local_1c8[0xf];
        uVar296 = (uVar330 - (uVar367 + uVar226)) + uVar345 + uVar296;
        uVar302 = (sStack_c6 - (sVar346 + sVar240)) + sStack_56 + uVar302;
        uVar308 = (sStack_c4 - (sVar348 + sVar244)) + sStack_54 + uVar308;
        uVar313 = (sStack_c2 - (sVar372 + sVar248)) + sStack_52 + uVar313;
        uVar232 = (sStack_c0 - (sVar374 + sVar251)) + sStack_50 + uVar232;
        uVar234 = (sStack_be - (sVar376 + sVar254)) + sStack_4e + uVar234;
        uVar241 = (sStack_bc - (sVar378 + sVar257)) + sStack_4c + uVar241;
        uVar337 = (uVar223 - ((uVar224 >> 8) + uVar189)) + uVar231 + uVar337;
        uVar271 = (uVar214 - (uVar352 + uVar262)) + uVar349 + uVar271;
        uVar279 = (uStack_d6 - (uStack_66 + uStack_26)) + uStack_256 + uVar279;
        uVar285 = (uStack_d4 - (uStack_64 + uStack_24)) + uStack_254 + uVar285;
        uVar291 = (uStack_d2 - (uStack_62 + uStack_22)) + uStack_252 + uVar291;
        uVar297 = (uStack_d0 - (uStack_60 + uStack_20)) + uStack_250 + uVar297;
        uVar303 = (uStack_ce - (uStack_5e + uStack_1e)) + uStack_24e + uVar303;
        uVar309 = (uStack_cc - (uStack_5c + uStack_1c)) + uStack_24c + uVar309;
        uVar356 = (uStack_ca - (uStack_5a + uStack_1a)) + uStack_24a + uVar356;
        uVar176 = uVar296 >> 4;
        uVar184 = uVar302 >> 4;
        uVar189 = uVar308 >> 4;
        uVar210 = uVar313 >> 4;
        uVar216 = uVar232 >> 4;
        uVar223 = uVar234 >> 4;
        uVar224 = uVar241 >> 4;
        uVar227 = uVar337 >> 4;
        uVar233 = uVar271 >> 4;
        uVar270 = uVar279 >> 4;
        uVar278 = uVar285 >> 4;
        uVar226 = uVar291 >> 4;
        uVar284 = uVar297 >> 4;
        uVar290 = uVar303 >> 4;
        uVar211 = uVar309 >> 4;
        uVar222 = uVar356 >> 4;
        local_218._0_1_ = auVar328[0];
        local_218._1_1_ = auVar328[1];
        local_218._2_1_ = auVar328[2];
        local_218._3_1_ = auVar328[3];
        local_218._4_1_ = auVar328[4];
        local_218._5_1_ = auVar328[5];
        local_218._6_1_ = auVar328[6];
        local_218._7_1_ = auVar328[7];
        uStack_210._0_1_ = auVar328[8];
        uStack_210._1_1_ = auVar328[9];
        uStack_210._2_1_ = auVar328[10];
        uStack_210._3_1_ = auVar328[0xb];
        uStack_210._4_1_ = auVar328[0xc];
        uStack_210._5_1_ = auVar328[0xd];
        uStack_210._6_1_ = auVar328[0xe];
        uStack_210._7_1_ = auVar328[0xf];
        pbVar1 = s + lVar173 * 2;
        *pbVar1 = ~local_1c8[0] & (byte)local_218 |
                  (uVar176 != 0) * (uVar176 < 0x100) * (char)uVar176 - (0xff < uVar176) &
                  local_1c8[0];
        pbVar1[1] = ~local_1c8[1] & local_218._1_1_ |
                    (uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184) &
                    local_1c8[1];
        pbVar1[2] = ~local_1c8[2] & local_218._2_1_ |
                    (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 - (0xff < uVar189) &
                    local_1c8[2];
        pbVar1[3] = ~local_1c8[3] & local_218._3_1_ |
                    (uVar210 != 0) * (uVar210 < 0x100) * (char)uVar210 - (0xff < uVar210) &
                    local_1c8[3];
        pbVar1[4] = ~local_1c8[4] & local_218._4_1_ |
                    (uVar216 != 0) * (uVar216 < 0x100) * (char)uVar216 - (0xff < uVar216) &
                    local_1c8[4];
        pbVar1[5] = ~local_1c8[5] & local_218._5_1_ |
                    (uVar223 != 0) * (uVar223 < 0x100) * (char)uVar223 - (0xff < uVar223) &
                    local_1c8[5];
        pbVar1[6] = ~local_1c8[6] & local_218._6_1_ |
                    (uVar224 != 0) * (uVar224 < 0x100) * (char)uVar224 - (0xff < uVar224) &
                    local_1c8[6];
        pbVar1[7] = ~local_1c8[7] & local_218._7_1_ |
                    (uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 - (0xff < uVar227) &
                    local_1c8[7];
        pbVar1[8] = ~local_1c8[8] & (byte)uStack_210 |
                    (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233) &
                    local_1c8[8];
        pbVar1[9] = ~local_1c8[9] & uStack_210._1_1_ |
                    (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270) &
                    local_1c8[9];
        pbVar1[10] = ~local_1c8[10] & uStack_210._2_1_ |
                     (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278) &
                     local_1c8[10];
        pbVar1[0xb] = ~local_1c8[0xb] & uStack_210._3_1_ |
                      (uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226) &
                      local_1c8[0xb];
        pbVar1[0xc] = ~local_1c8[0xc] & uStack_210._4_1_ |
                      (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284) &
                      local_1c8[0xc];
        pbVar1[0xd] = ~local_1c8[0xd] & uStack_210._5_1_ |
                      (uVar290 != 0) * (uVar290 < 0x100) * (char)uVar290 - (0xff < uVar290) &
                      local_1c8[0xd];
        pbVar1[0xe] = ~local_1c8[0xe] & uStack_210._6_1_ |
                      (uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 - (0xff < uVar211) &
                      local_1c8[0xe];
        pbVar1[0xf] = ~local_1c8[0xf] & uStack_210._7_1_ |
                      (uVar222 != 0) * (uVar222 < 0x100) * (char)uVar222 - (0xff < uVar222) &
                      local_1c8[0xf];
        uVar296 = (uVar347 - (uVar325 + uVar266)) + uVar345 + uVar296;
        uVar302 = (auVar104._2_2_ - (sStack_2a6 + sVar182)) + sStack_56 + uVar302;
        uVar308 = (auVar138._0_2_ - (sStack_2a4 + sVar187)) + sStack_54 + uVar308;
        uVar313 = (sVar209 - (sStack_2a2 + sVar192)) + sStack_52 + uVar313;
        uVar232 = (auVar90._8_2_ - (sStack_2a0 + sVar196)) + sStack_50 + uVar232;
        uVar234 = (auVar62._10_2_ - (sStack_29e + sVar201)) + sStack_4e + uVar234;
        uVar241 = (auVar34._12_2_ - (sStack_29c + sVar205)) + sStack_4c + uVar241;
        uVar337 = (uVar198 - (uVar215 + uVar177)) + uVar231 + uVar337;
        uVar271 = ((ushort)bVar185 - (uVar355 + uVar351)) + uVar349 + uVar271;
        uVar279 = ((ushort)bVar186 - (uStack_2b6 + uStack_266)) + uStack_256 + uVar279;
        uVar285 = ((ushort)bVar190 - (uStack_2b4 + uStack_264)) + uStack_254 + uVar285;
        uVar291 = ((ushort)bVar191 - (uStack_2b2 + uStack_262)) + uStack_252 + uVar291;
        uVar297 = ((ushort)bVar194 - (uStack_2b0 + uStack_260)) + uStack_250 + uVar297;
        uVar303 = ((ushort)bVar195 - (uStack_2ae + uStack_25e)) + uStack_24e + uVar303;
        uVar309 = ((ushort)bVar199 - (uStack_2ac + uStack_25c)) + uStack_24c + uVar309;
        uVar356 = ((ushort)bVar200 - (uStack_2aa + uStack_25a)) + uStack_24a + uVar356;
        uVar215 = (uVar343 - (uVar329 + uVar228)) + uVar345 + uVar296;
        uVar223 = (sStack_276 - (sStack_246 + sStack_226)) + sStack_56 + uVar302;
        uVar227 = (sStack_274 - (sStack_244 + sStack_224)) + sStack_54 + uVar308;
        uVar233 = (sStack_272 - (sStack_242 + sStack_222)) + sStack_52 + uVar313;
        uVar278 = (sStack_270 - (sStack_240 + sStack_220)) + sStack_50 + uVar232;
        uVar226 = (sStack_26e - (sStack_23e + sStack_21e)) + sStack_4e + uVar234;
        uVar290 = (sStack_26c - (sStack_23c + sStack_21c)) + sStack_4c + uVar241;
        uVar222 = (uVar229 - (uVar221 + uVar212)) + uVar231 + uVar337;
        uVar296 = uVar296 >> 4;
        uVar302 = uVar302 >> 4;
        uVar308 = uVar308 >> 4;
        uVar313 = uVar313 >> 4;
        uVar232 = uVar232 >> 4;
        uVar234 = uVar234 >> 4;
        uVar241 = uVar241 >> 4;
        uVar337 = uVar337 >> 4;
        uVar225 = ((ushort)bVar280 - (uVar326 + uVar269)) + uVar349 + uVar271;
        uVar230 = (uStack_2c6 - (uStack_1b6 + uStack_236)) + uStack_256 + uVar279;
        uVar235 = (uStack_2c4 - (uStack_1b4 + uStack_234)) + uStack_254 + uVar285;
        uVar334 = (uStack_2c2 - (uStack_1b2 + uStack_232)) + uStack_252 + uVar291;
        uVar332 = (uStack_2c0 - (uStack_1b0 + uStack_230)) + uStack_250 + uVar297;
        uVar245 = (uStack_2be - (uStack_1ae + uStack_22e)) + uStack_24e + uVar303;
        uVar339 = (uStack_2bc - (uStack_1ac + uStack_22c)) + uStack_24c + uVar309;
        uVar341 = (uStack_2ba - (uStack_1aa + uStack_22a)) + uStack_24a + uVar356;
        uVar271 = uVar271 >> 4;
        uVar279 = uVar279 >> 4;
        uVar285 = uVar285 >> 4;
        uVar291 = uVar291 >> 4;
        uVar297 = uVar297 >> 4;
        uVar303 = uVar303 >> 4;
        uVar309 = uVar309 >> 4;
        uVar356 = uVar356 >> 4;
        local_a8 = auVar6[0];
        pbVar1 = s + lVar173 * 3;
        *pbVar1 = ~local_1c8[0] & local_a8 |
                  (uVar296 != 0) * (uVar296 < 0x100) * (char)uVar296 - (0xff < uVar296) &
                  local_1c8[0];
        pbVar1[1] = ~local_1c8[1] & auVar6[1] |
                    (uVar302 != 0) * (uVar302 < 0x100) * (char)uVar302 - (0xff < uVar302) &
                    local_1c8[1];
        pbVar1[2] = ~local_1c8[2] & auVar6[2] |
                    (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308) &
                    local_1c8[2];
        pbVar1[3] = ~local_1c8[3] & auVar6[3] |
                    (uVar313 != 0) * (uVar313 < 0x100) * (char)uVar313 - (0xff < uVar313) &
                    local_1c8[3];
        pbVar1[4] = ~local_1c8[4] & auVar6[4] |
                    (uVar232 != 0) * (uVar232 < 0x100) * (char)uVar232 - (0xff < uVar232) &
                    local_1c8[4];
        pbVar1[5] = ~local_1c8[5] & auVar6[5] |
                    (uVar234 != 0) * (uVar234 < 0x100) * (char)uVar234 - (0xff < uVar234) &
                    local_1c8[5];
        pbVar1[6] = ~local_1c8[6] & auVar6[6] |
                    (uVar241 != 0) * (uVar241 < 0x100) * (char)uVar241 - (0xff < uVar241) &
                    local_1c8[6];
        pbVar1[7] = ~local_1c8[7] & auVar6[7] |
                    (uVar337 != 0) * (uVar337 < 0x100) * (char)uVar337 - (0xff < uVar337) &
                    local_1c8[7];
        pbVar1[8] = ~local_1c8[8] & auVar6[8] |
                    (uVar271 != 0) * (uVar271 < 0x100) * (char)uVar271 - (0xff < uVar271) &
                    local_1c8[8];
        pbVar1[9] = ~local_1c8[9] & auVar6[9] |
                    (uVar279 != 0) * (uVar279 < 0x100) * (char)uVar279 - (0xff < uVar279) &
                    local_1c8[9];
        pbVar1[10] = ~local_1c8[10] & auVar6[10] |
                     (uVar285 != 0) * (uVar285 < 0x100) * (char)uVar285 - (0xff < uVar285) &
                     local_1c8[10];
        pbVar1[0xb] = ~local_1c8[0xb] & auVar6[0xb] |
                      (uVar291 != 0) * (uVar291 < 0x100) * (char)uVar291 - (0xff < uVar291) &
                      local_1c8[0xb];
        pbVar1[0xc] = ~local_1c8[0xc] & auVar6[0xc] |
                      (uVar297 != 0) * (uVar297 < 0x100) * (char)uVar297 - (0xff < uVar297) &
                      local_1c8[0xc];
        pbVar1[0xd] = ~local_1c8[0xd] & auVar6[0xd] |
                      (uVar303 != 0) * (uVar303 < 0x100) * (char)uVar303 - (0xff < uVar303) &
                      local_1c8[0xd];
        pbVar1[0xe] = ~local_1c8[0xe] & auVar6[0xe] |
                      (uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 - (0xff < uVar309) &
                      local_1c8[0xe];
        pbVar1[0xf] = ~local_1c8[0xf] & auVar6[0xf] |
                      (uVar356 != 0) * (uVar356 < 0x100) * (char)uVar356 - (0xff < uVar356) &
                      local_1c8[0xf];
        uVar177 = uVar215 >> 4;
        uVar176 = uVar223 >> 4;
        uVar184 = uVar227 >> 4;
        uVar189 = uVar233 >> 4;
        uVar198 = uVar278 >> 4;
        uVar210 = uVar226 >> 4;
        uVar216 = uVar290 >> 4;
        uVar212 = uVar222 >> 4;
        uVar221 = uVar225 >> 4;
        uVar224 = uVar230 >> 4;
        uVar229 = uVar235 >> 4;
        uVar270 = uVar334 >> 4;
        uVar228 = uVar332 >> 4;
        uVar284 = uVar245 >> 4;
        uVar211 = uVar339 >> 4;
        uVar296 = uVar341 >> 4;
        local_108 = auVar357[0];
        pbVar1 = s + lVar173 * 4;
        *pbVar1 = ~local_1c8[0] & local_108 |
                  (uVar177 != 0) * (uVar177 < 0x100) * (char)uVar177 - (0xff < uVar177) &
                  local_1c8[0];
        pbVar1[1] = ~local_1c8[1] & auVar357[1] |
                    (uVar176 != 0) * (uVar176 < 0x100) * (char)uVar176 - (0xff < uVar176) &
                    local_1c8[1];
        pbVar1[2] = ~local_1c8[2] & auVar357[2] |
                    (uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184) &
                    local_1c8[2];
        pbVar1[3] = ~local_1c8[3] & auVar357[3] |
                    (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 - (0xff < uVar189) &
                    local_1c8[3];
        pbVar1[4] = ~local_1c8[4] & auVar357[4] |
                    (uVar198 != 0) * (uVar198 < 0x100) * (char)uVar198 - (0xff < uVar198) &
                    local_1c8[4];
        pbVar1[5] = ~local_1c8[5] & auVar357[5] |
                    (uVar210 != 0) * (uVar210 < 0x100) * (char)uVar210 - (0xff < uVar210) &
                    local_1c8[5];
        pbVar1[6] = ~local_1c8[6] & auVar357[6] |
                    (uVar216 != 0) * (uVar216 < 0x100) * (char)uVar216 - (0xff < uVar216) &
                    local_1c8[6];
        pbVar1[7] = ~local_1c8[7] & auVar357[7] |
                    (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212) &
                    local_1c8[7];
        pbVar1[8] = ~local_1c8[8] & bVar185 |
                    (uVar221 != 0) * (uVar221 < 0x100) * (char)uVar221 - (0xff < uVar221) &
                    local_1c8[8];
        pbVar1[9] = ~local_1c8[9] & bVar186 |
                    (uVar224 != 0) * (uVar224 < 0x100) * (char)uVar224 - (0xff < uVar224) &
                    local_1c8[9];
        pbVar1[10] = ~local_1c8[10] & bVar190 |
                     (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229) &
                     local_1c8[10];
        pbVar1[0xb] = ~local_1c8[0xb] & bVar191 |
                      (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270) &
                      local_1c8[0xb];
        pbVar1[0xc] = ~local_1c8[0xc] & bVar194 |
                      (uVar228 != 0) * (uVar228 < 0x100) * (char)uVar228 - (0xff < uVar228) &
                      local_1c8[0xc];
        pbVar1[0xd] = ~local_1c8[0xd] & bVar195 |
                      (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284) &
                      local_1c8[0xd];
        pbVar1[0xe] = ~local_1c8[0xe] & bVar199 |
                      (uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 - (0xff < uVar211) &
                      local_1c8[0xe];
        pbVar1[0xf] = ~local_1c8[0xf] & bVar200 |
                      (uVar296 != 0) * (uVar296 < 0x100) * (char)uVar296 - (0xff < uVar296) &
                      local_1c8[0xf];
        uVar215 = (ushort)((uVar345 * 2 - (uVar330 + uVar267)) + uVar215) >> 4;
        uVar221 = (ushort)((sStack_56 * 2 - (sStack_c6 + sVar277)) + uVar223) >> 4;
        uVar223 = (ushort)((sStack_54 * 2 - (sStack_c4 + sVar282)) + uVar227) >> 4;
        uVar224 = (ushort)((sStack_52 * 2 - (sStack_c2 + sVar288)) + uVar233) >> 4;
        uVar227 = (ushort)((sStack_50 * 2 - (sStack_c0 + sVar294)) + uVar278) >> 4;
        uVar229 = (ushort)((sStack_4e * 2 - (sStack_be + sVar300)) + uVar226) >> 4;
        uVar233 = (ushort)((sStack_4c * 2 - (sStack_bc + sVar306)) + uVar290) >> 4;
        uVar231 = (ushort)((uVar231 * 2 - sVar175) + uVar222) >> 4;
        uVar177 = (ushort)((uVar349 * 2 - (uVar214 + uVar366)) + uVar225) >> 4;
        uVar176 = (ushort)((uStack_256 * 2 - (uStack_d6 + uStack_206)) + uVar230) >> 4;
        uVar184 = (ushort)((uStack_254 * 2 - (uStack_d4 + uStack_204)) + uVar235) >> 4;
        uVar189 = (ushort)((uStack_252 * 2 - (uStack_d2 + uStack_202)) + uVar334) >> 4;
        uVar198 = (ushort)((uStack_250 * 2 - (uStack_d0 + uStack_200)) + uVar332) >> 4;
        uVar210 = (ushort)((uStack_24e * 2 - (uStack_ce + uStack_1fe)) + uVar245) >> 4;
        uVar216 = (ushort)((uStack_24c * 2 - (uStack_cc + uStack_1fc)) + uVar339) >> 4;
        uVar212 = (ushort)((uStack_24a * 2 - (uStack_ca + uStack_1fa)) + uVar341) >> 4;
        local_f8 = auVar369[0];
        pbVar1 = s + lVar173 * 5;
        *pbVar1 = ~local_1c8[0] & local_f8 |
                  (uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215) &
                  local_1c8[0];
        pbVar1[1] = ~local_1c8[1] & auVar369[1] |
                    (uVar221 != 0) * (uVar221 < 0x100) * (char)uVar221 - (0xff < uVar221) &
                    local_1c8[1];
        pbVar1[2] = ~local_1c8[2] & auVar369[2] |
                    (uVar223 != 0) * (uVar223 < 0x100) * (char)uVar223 - (0xff < uVar223) &
                    local_1c8[2];
        pbVar1[3] = ~local_1c8[3] & auVar369[3] |
                    (uVar224 != 0) * (uVar224 < 0x100) * (char)uVar224 - (0xff < uVar224) &
                    local_1c8[3];
        pbVar1[4] = ~local_1c8[4] & auVar369[4] |
                    (uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 - (0xff < uVar227) &
                    local_1c8[4];
        pbVar1[5] = ~local_1c8[5] & auVar369[5] |
                    (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229) &
                    local_1c8[5];
        pbVar1[6] = ~local_1c8[6] & auVar369[6] |
                    (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233) &
                    local_1c8[6];
        pbVar1[7] = ~local_1c8[7] & auVar369[7] |
                    (uVar231 != 0) * (uVar231 < 0x100) * (char)uVar231 - (0xff < uVar231) &
                    local_1c8[7];
        pbVar1[8] = ~local_1c8[8] & bVar280 |
                    (uVar177 != 0) * (uVar177 < 0x100) * (char)uVar177 - (0xff < uVar177) &
                    local_1c8[8];
        pbVar1[9] = ~local_1c8[9] & auVar369[9] |
                    (uVar176 != 0) * (uVar176 < 0x100) * (char)uVar176 - (0xff < uVar176) &
                    local_1c8[9];
        pbVar1[10] = ~local_1c8[10] & auVar369[10] |
                     (uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184) &
                     local_1c8[10];
        pbVar1[0xb] = ~local_1c8[0xb] & auVar369[0xb] |
                      (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 - (0xff < uVar189) &
                      local_1c8[0xb];
        pbVar1[0xc] = ~local_1c8[0xc] & auVar369[0xc] |
                      (uVar198 != 0) * (uVar198 < 0x100) * (char)uVar198 - (0xff < uVar198) &
                      local_1c8[0xc];
        pbVar1[0xd] = ~local_1c8[0xd] & auVar369[0xd] |
                      (uVar210 != 0) * (uVar210 < 0x100) * (char)uVar210 - (0xff < uVar210) &
                      local_1c8[0xd];
        pbVar1[0xe] = ~local_1c8[0xe] & auVar369[0xe] |
                      (uVar216 != 0) * (uVar216 < 0x100) * (char)uVar216 - (0xff < uVar216) &
                      local_1c8[0xe];
        pbVar1[0xf] = ~local_1c8[0xf] & auVar369[0xf] |
                      (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212) &
                      local_1c8[0xf];
      }
    }
  }
  return;
}

Assistant:

void aom_lpf_horizontal_14_quad_sse2(unsigned char *s, int p,
                                     const unsigned char *_blimit0,
                                     const unsigned char *_limit0,
                                     const unsigned char *_thresh0) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi8(1);
  const __m128i blimit_v = _mm_load_si128((const __m128i *)_blimit0);
  const __m128i limit_v = _mm_load_si128((const __m128i *)_limit0);
  const __m128i thresh_v = _mm_load_si128((const __m128i *)_thresh0);
  __m128i mask, hev, flat, flat2;
  __m128i p6, p5;
  __m128i p4, p3, p2, p1, p0, q0, q1, q2, q3, q4;
  __m128i q6, q5;

  __m128i op2, op1, op0, oq0, oq1, oq2;

  __m128i max_abs_p1p0q1q0;

  p6 = _mm_loadu_si128((__m128i *)(s - 7 * p));
  p5 = _mm_loadu_si128((__m128i *)(s - 6 * p));
  p4 = _mm_loadu_si128((__m128i *)(s - 5 * p));
  p3 = _mm_loadu_si128((__m128i *)(s - 4 * p));
  p2 = _mm_loadu_si128((__m128i *)(s - 3 * p));
  p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  q0 = _mm_loadu_si128((__m128i *)(s - 0 * p));
  q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  q2 = _mm_loadu_si128((__m128i *)(s + 2 * p));
  q3 = _mm_loadu_si128((__m128i *)(s + 3 * p));
  q4 = _mm_loadu_si128((__m128i *)(s + 4 * p));
  q5 = _mm_loadu_si128((__m128i *)(s + 5 * p));
  q6 = _mm_loadu_si128((__m128i *)(s + 6 * p));

  {
    const __m128i abs_p1p0 = abs_diff(p1, p0);
    const __m128i abs_q1q0 = abs_diff(q1, q0);
    const __m128i fe = _mm_set1_epi8((int8_t)0xfe);
    const __m128i ff = _mm_cmpeq_epi8(zero, zero);
    __m128i abs_p0q0 = abs_diff(p0, q0);
    __m128i abs_p1q1 = abs_diff(p1, q1);
    __m128i work;
    max_abs_p1p0q1q0 = _mm_max_epu8(abs_p1p0, abs_q1q0);

    abs_p0q0 = _mm_adds_epu8(abs_p0q0, abs_p0q0);
    abs_p1q1 = _mm_srli_epi16(_mm_and_si128(abs_p1q1, fe), 1);
    mask = _mm_subs_epu8(_mm_adds_epu8(abs_p0q0, abs_p1q1), blimit_v);
    mask = _mm_xor_si128(_mm_cmpeq_epi8(mask, zero), ff);
    // mask |= (abs(p0 - q0) * 2 + abs(p1 - q1) / 2  > blimit) * -1;
    mask = _mm_max_epu8(max_abs_p1p0q1q0, mask);
    // mask |= (abs(p1 - p0) > limit) * -1;
    // mask |= (abs(q1 - q0) > limit) * -1;
    work = _mm_max_epu8(abs_diff(p2, p1), abs_diff(p3, p2));
    mask = _mm_max_epu8(work, mask);
    work = _mm_max_epu8(abs_diff(q2, q1), abs_diff(q3, q2));
    mask = _mm_max_epu8(work, mask);
    mask = _mm_subs_epu8(mask, limit_v);
    mask = _mm_cmpeq_epi8(mask, zero);
  }

  if (0xffff == _mm_movemask_epi8(_mm_cmpeq_epi8(mask, zero))) return;

  {
    __m128i work;
    work = _mm_max_epu8(abs_diff(p2, p0), abs_diff(q2, q0));
    flat = _mm_max_epu8(work, max_abs_p1p0q1q0);
    work = _mm_max_epu8(abs_diff(p3, p0), abs_diff(q3, q0));
    flat = _mm_max_epu8(work, flat);
    work = _mm_max_epu8(abs_diff(p4, p0), abs_diff(q4, q0));
    flat = _mm_subs_epu8(flat, one);
    flat = _mm_cmpeq_epi8(flat, zero);
    flat = _mm_and_si128(flat, mask);
    flat2 = _mm_max_epu8(abs_diff(p5, p0), abs_diff(q5, q0));
    flat2 = _mm_max_epu8(work, flat2);
    work = _mm_max_epu8(abs_diff(p6, p0), abs_diff(q6, q0));
    flat2 = _mm_max_epu8(work, flat2);
    flat2 = _mm_subs_epu8(flat2, one);
    flat2 = _mm_cmpeq_epi8(flat2, zero);
    flat2 = _mm_and_si128(flat2, flat);  // flat2 & flat & mask
  }

  // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
  // filter4
  {
    const __m128i t4 = _mm_set1_epi8(4);
    const __m128i t3 = _mm_set1_epi8(3);
    const __m128i t80 = _mm_set1_epi8((int8_t)0x80);
    const __m128i te0 = _mm_set1_epi8((int8_t)0xe0);
    const __m128i t1f = _mm_set1_epi8(0x1f);
    const __m128i t1 = _mm_set1_epi8(0x1);
    const __m128i t7f = _mm_set1_epi8(0x7f);
    const __m128i ff = _mm_cmpeq_epi8(t4, t4);

    __m128i filt;
    __m128i work_a;
    __m128i filter1, filter2;

    op1 = _mm_xor_si128(p1, t80);
    op0 = _mm_xor_si128(p0, t80);
    oq0 = _mm_xor_si128(q0, t80);
    oq1 = _mm_xor_si128(q1, t80);

    hev = _mm_subs_epu8(max_abs_p1p0q1q0, thresh_v);
    hev = _mm_xor_si128(_mm_cmpeq_epi8(hev, zero), ff);
    filt = _mm_and_si128(_mm_subs_epi8(op1, oq1), hev);

    work_a = _mm_subs_epi8(oq0, op0);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_and_si128(filt, mask);
    filter1 = _mm_adds_epi8(filt, t4);
    filter2 = _mm_adds_epi8(filt, t3);

    work_a = _mm_cmpgt_epi8(zero, filter1);
    filter1 = _mm_srli_epi16(filter1, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter1 = _mm_and_si128(filter1, t1f);
    filter1 = _mm_or_si128(filter1, work_a);
    oq0 = _mm_xor_si128(_mm_subs_epi8(oq0, filter1), t80);

    work_a = _mm_cmpgt_epi8(zero, filter2);
    filter2 = _mm_srli_epi16(filter2, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter2 = _mm_and_si128(filter2, t1f);
    filter2 = _mm_or_si128(filter2, work_a);
    op0 = _mm_xor_si128(_mm_adds_epi8(op0, filter2), t80);

    filt = _mm_adds_epi8(filter1, t1);
    work_a = _mm_cmpgt_epi8(zero, filt);
    filt = _mm_srli_epi16(filt, 1);
    work_a = _mm_and_si128(work_a, t80);
    filt = _mm_and_si128(filt, t7f);
    filt = _mm_or_si128(filt, work_a);
    filt = _mm_andnot_si128(hev, filt);
    op1 = _mm_xor_si128(_mm_adds_epi8(op1, filt), t80);
    oq1 = _mm_xor_si128(_mm_subs_epi8(oq1, filt), t80);

    // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
    // filter8
    if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat, zero))) {
      const __m128i four = _mm_set1_epi16(4);
      const __m128i p3_lo = _mm_unpacklo_epi8(p3, zero);
      const __m128i p2_lo = _mm_unpacklo_epi8(p2, zero);
      const __m128i p1_lo = _mm_unpacklo_epi8(p1, zero);
      const __m128i p0_lo = _mm_unpacklo_epi8(p0, zero);
      const __m128i q0_lo = _mm_unpacklo_epi8(q0, zero);
      const __m128i q1_lo = _mm_unpacklo_epi8(q1, zero);
      const __m128i q2_lo = _mm_unpacklo_epi8(q2, zero);
      const __m128i q3_lo = _mm_unpacklo_epi8(q3, zero);

      const __m128i p3_hi = _mm_unpackhi_epi8(p3, zero);
      const __m128i p2_hi = _mm_unpackhi_epi8(p2, zero);
      const __m128i p1_hi = _mm_unpackhi_epi8(p1, zero);
      const __m128i p0_hi = _mm_unpackhi_epi8(p0, zero);
      const __m128i q0_hi = _mm_unpackhi_epi8(q0, zero);
      const __m128i q1_hi = _mm_unpackhi_epi8(q1, zero);
      const __m128i q2_hi = _mm_unpackhi_epi8(q2, zero);
      const __m128i q3_hi = _mm_unpackhi_epi8(q3, zero);
      __m128i f8_lo, f8_hi;

      f8_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, four),
                            _mm_add_epi16(p3_lo, p2_lo));
      f8_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, f8_lo),
                            _mm_add_epi16(p2_lo, p1_lo));
      f8_lo = _mm_add_epi16(_mm_add_epi16(p0_lo, q0_lo), f8_lo);

      f8_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, four),
                            _mm_add_epi16(p3_hi, p2_hi));
      f8_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, f8_hi),
                            _mm_add_epi16(p2_hi, p1_hi));
      f8_hi = _mm_add_epi16(_mm_add_epi16(p0_hi, q0_hi), f8_hi);

      op2 = filter8_mask(&flat, &p2, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q1_lo, &p1_lo, &p2_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q1_hi, &p1_hi, &p2_hi, &p3_hi);
      op1 = filter8_mask(&flat, &op1, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q2_lo, &p0_lo, &p1_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q2_hi, &p0_hi, &p1_hi, &p3_hi);
      op0 = filter8_mask(&flat, &op0, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q0_lo, &p0_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q0_hi, &p0_hi, &p3_hi);
      oq0 = filter8_mask(&flat, &oq0, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q1_lo, &q0_lo, &p2_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q1_hi, &q0_hi, &p2_hi);
      oq1 = filter8_mask(&flat, &oq1, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q2_lo, &q1_lo, &p1_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q2_hi, &q1_hi, &p1_hi);
      oq2 = filter8_mask(&flat, &q2, &f8_lo, &f8_hi);

      // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
      // wide flat calculations
      if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat2, zero))) {
        const __m128i eight = _mm_set1_epi16(8);
        const __m128i p6_lo = _mm_unpacklo_epi8(p6, zero);
        const __m128i p5_lo = _mm_unpacklo_epi8(p5, zero);
        const __m128i p4_lo = _mm_unpacklo_epi8(p4, zero);
        const __m128i q4_lo = _mm_unpacklo_epi8(q4, zero);
        const __m128i q5_lo = _mm_unpacklo_epi8(q5, zero);
        const __m128i q6_lo = _mm_unpacklo_epi8(q6, zero);

        const __m128i p6_hi = _mm_unpackhi_epi8(p6, zero);
        const __m128i p5_hi = _mm_unpackhi_epi8(p5, zero);
        const __m128i p4_hi = _mm_unpackhi_epi8(p4, zero);
        const __m128i q4_hi = _mm_unpackhi_epi8(q4, zero);
        const __m128i q5_hi = _mm_unpackhi_epi8(q5, zero);
        const __m128i q6_hi = _mm_unpackhi_epi8(q6, zero);

        __m128i f_lo;
        __m128i f_hi;

        f_lo = _mm_sub_epi16(_mm_slli_epi16(p6_lo, 3), p6_lo);
        f_lo = _mm_add_epi16(_mm_slli_epi16(p5_lo, 1), f_lo);
        f_lo = _mm_add_epi16(_mm_slli_epi16(p4_lo, 1), f_lo);
        f_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, f_lo),
                             _mm_add_epi16(p2_lo, p1_lo));
        f_lo = _mm_add_epi16(_mm_add_epi16(p0_lo, q0_lo), f_lo);
        f_lo = _mm_add_epi16(f_lo, eight);

        f_hi = _mm_sub_epi16(_mm_slli_epi16(p6_hi, 3), p6_hi);
        f_hi = _mm_add_epi16(_mm_slli_epi16(p5_hi, 1), f_hi);
        f_hi = _mm_add_epi16(_mm_slli_epi16(p4_hi, 1), f_hi);
        f_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, f_hi),
                             _mm_add_epi16(p2_hi, p1_hi));
        f_hi = _mm_add_epi16(_mm_add_epi16(p0_hi, q0_hi), f_hi);
        f_hi = _mm_add_epi16(f_hi, eight);

        p5 = filter16_mask(&flat2, &p5, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 6 * p), p5);

        f_lo = filter_add2_sub2(&f_lo, &q1_lo, &p3_lo, &p6_lo, &p6_lo);
        f_hi = filter_add2_sub2(&f_hi, &q1_hi, &p3_hi, &p6_hi, &p6_hi);
        p4 = filter16_mask(&flat2, &p4, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 5 * p), p4);

        f_lo = filter_add2_sub2(&f_lo, &q2_lo, &p2_lo, &p6_lo, &p5_lo);
        f_hi = filter_add2_sub2(&f_hi, &q2_hi, &p2_hi, &p6_hi, &p5_hi);
        p3 = filter16_mask(&flat2, &p3, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 4 * p), p3);

        f_lo = filter_add2_sub2(&f_lo, &q3_lo, &p1_lo, &p6_lo, &p4_lo);
        f_hi = filter_add2_sub2(&f_hi, &q3_hi, &p1_hi, &p6_hi, &p4_hi);
        op2 = filter16_mask(&flat2, &op2, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 3 * p), op2);

        f_lo = filter_add2_sub2(&f_lo, &q4_lo, &p0_lo, &p6_lo, &p3_lo);
        f_hi = filter_add2_sub2(&f_hi, &q4_hi, &p0_hi, &p6_hi, &p3_hi);
        op1 = filter16_mask(&flat2, &op1, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 2 * p), op1);

        f_lo = filter_add2_sub2(&f_lo, &q5_lo, &q0_lo, &p6_lo, &p2_lo);
        f_hi = filter_add2_sub2(&f_hi, &q5_hi, &q0_hi, &p6_hi, &p2_hi);
        op0 = filter16_mask(&flat2, &op0, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 1 * p), op0);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q1_lo, &p6_lo, &p1_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q1_hi, &p6_hi, &p1_hi);
        oq0 = filter16_mask(&flat2, &oq0, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q2_lo, &p5_lo, &p0_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q2_hi, &p5_hi, &p0_hi);
        oq1 = filter16_mask(&flat2, &oq1, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q3_lo, &p4_lo, &q0_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q3_hi, &p4_hi, &q0_hi);
        oq2 = filter16_mask(&flat2, &oq2, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 2 * p), oq2);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q4_lo, &p3_lo, &q1_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q4_hi, &p3_hi, &q1_hi);
        q3 = filter16_mask(&flat2, &q3, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 3 * p), q3);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q5_lo, &p2_lo, &q2_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q5_hi, &p2_hi, &q2_hi);
        q4 = filter16_mask(&flat2, &q4, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 4 * p), q4);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q6_lo, &p1_lo, &q3_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q6_hi, &p1_hi, &q3_hi);
        q5 = filter16_mask(&flat2, &q5, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 5 * p), q5);
      } else {
        _mm_storeu_si128((__m128i *)(s - 3 * p), op2);
        _mm_storeu_si128((__m128i *)(s - 2 * p), op1);
        _mm_storeu_si128((__m128i *)(s - 1 * p), op0);
        _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);
        _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);
        _mm_storeu_si128((__m128i *)(s + 2 * p), oq2);
      }
    } else {
      _mm_storeu_si128((__m128i *)(s - 2 * p), op1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), op0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);
    }
  }
}